

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [12];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  uint uVar94;
  uint uVar95;
  uint uVar96;
  long lVar97;
  undefined4 uVar98;
  undefined8 unaff_R13;
  long lVar99;
  bool bVar100;
  float fVar101;
  float fVar129;
  __m128 a;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar102;
  undefined1 auVar109 [16];
  float fVar103;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar167 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar106 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar156;
  float fVar157;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar142 [32];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar159;
  undefined1 auVar131 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar160;
  undefined1 auVar145 [32];
  float fVar158;
  float fVar161;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar183;
  float fVar184;
  float fVar187;
  float fVar188;
  float fVar190;
  undefined1 auVar172 [32];
  float fVar191;
  undefined1 auVar173 [32];
  undefined1 auVar165 [16];
  undefined1 auVar174 [32];
  undefined1 auVar166 [16];
  float fVar185;
  undefined1 auVar175 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar186;
  float fVar189;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar169 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar192;
  float fVar219;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar223;
  float fVar245;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [28];
  float fVar244;
  float fVar246;
  float fVar247;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar248;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar249;
  float fVar268;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar265;
  float fVar266;
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar256 [32];
  float fVar267;
  float fVar269;
  float fVar271;
  float fVar273;
  float fVar275;
  undefined1 auVar257 [32];
  float fVar276;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar277;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [28];
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar293;
  float fVar296;
  undefined1 auVar286 [32];
  float fVar297;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  float fVar298;
  float fVar310;
  float fVar311;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar312;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar316;
  undefined1 auVar317 [16];
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar327;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  undefined1 auVar331 [28];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar340;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  float fVar359;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [64];
  float fVar375;
  float fVar376;
  float fVar383;
  float fVar385;
  float fVar387;
  float fVar389;
  float fVar391;
  float fVar393;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar384;
  float fVar386;
  float fVar388;
  float fVar390;
  float fVar392;
  float fVar394;
  float fVar395;
  undefined1 auVar381 [32];
  undefined1 auVar382 [64];
  float fVar396;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar410;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [64];
  float fVar411;
  float fVar415;
  float fVar416;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar417 [16];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b8c;
  float local_b80;
  RTCFilterFunctionNArguments local_b38;
  int local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 auStack_af0 [16];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined8 local_a30;
  float local_a28;
  float local_a24;
  undefined4 local_a20;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  uint local_a10;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar20 = prim[1];
  uVar91 = (ulong)(byte)PVar20;
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar280 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 10)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 10)));
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 10)));
  lVar99 = uVar91 * 0x25;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 10)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x11 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x11 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 10)));
  auStack_830 = auVar280;
  _local_840 = auVar200;
  auVar200 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar99 + 6));
  auVar209._16_16_ = auVar108;
  auVar209._0_16_ = auVar30;
  fVar192 = *(float *)(prim + lVar99 + 0x12);
  auVar299._0_4_ = fVar192 * auVar200._0_4_;
  auVar299._4_4_ = fVar192 * auVar200._4_4_;
  auVar299._8_4_ = fVar192 * auVar200._8_4_;
  auVar299._12_4_ = fVar192 * auVar200._12_4_;
  auVar417._0_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar417._4_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar417._8_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar417._12_4_ = fVar192 * (ray->super_RayK<1>).dir.field_0.m128[3];
  _local_860 = vcvtdq2ps_avx(auVar209);
  auVar210._16_16_ = auVar197;
  auVar210._0_16_ = auVar167;
  auVar116 = vcvtdq2ps_avx(auVar210);
  auVar412._16_16_ = auVar113;
  auVar412._0_16_ = auVar31;
  auVar235._16_16_ = auVar32;
  auVar235._0_16_ = auVar110;
  _local_9e0 = vcvtdq2ps_avx(auVar235);
  auVar236._16_16_ = auVar34;
  auVar236._0_16_ = auVar33;
  auVar147 = vcvtdq2ps_avx(auVar236);
  auVar318._16_16_ = auVar36;
  auVar318._0_16_ = auVar35;
  auVar284._16_16_ = auVar38;
  auVar284._0_16_ = auVar37;
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar280 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 10)));
  auVar172._16_16_ = auVar280;
  auVar172._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar417,auVar417,0x55);
  auVar280 = vshufps_avx(auVar417,auVar417,0xaa);
  fVar220 = auVar280._0_4_;
  fVar221 = auVar280._4_4_;
  fVar222 = auVar280._8_4_;
  fVar223 = auVar280._12_4_;
  fVar218 = auVar200._0_4_;
  fVar129 = auVar200._4_4_;
  fVar219 = auVar200._8_4_;
  fVar103 = auVar200._12_4_;
  auVar110 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar99 + 0x16)) * *(float *)(prim + lVar99 + 0x1a)));
  _local_9c0 = ZEXT1632(auVar110);
  auVar27 = vcvtdq2ps_avx(_local_840);
  auVar28 = vcvtdq2ps_avx(auVar412);
  auVar175 = vcvtdq2ps_avx(auVar318);
  auVar29 = vcvtdq2ps_avx(auVar284);
  auVar349 = vcvtdq2ps_avx(auVar172);
  auVar200 = vshufps_avx(auVar417,auVar417,0);
  fVar192 = auVar200._0_4_;
  fVar101 = auVar200._4_4_;
  fVar217 = auVar200._8_4_;
  fVar102 = auVar200._12_4_;
  auVar418._0_4_ = auVar27._0_4_ * fVar192 + fVar218 * local_860._0_4_ + fVar220 * auVar116._0_4_;
  auVar418._4_4_ = auVar27._4_4_ * fVar101 + fVar129 * local_860._4_4_ + fVar221 * auVar116._4_4_;
  auVar418._8_4_ = auVar27._8_4_ * fVar217 + fVar219 * local_860._8_4_ + fVar222 * auVar116._8_4_;
  auVar418._12_4_ =
       auVar27._12_4_ * fVar102 + fVar103 * local_860._12_4_ + fVar223 * auVar116._12_4_;
  auVar418._16_4_ =
       auVar27._16_4_ * fVar192 + fVar218 * local_860._16_4_ + fVar220 * auVar116._16_4_;
  auVar418._20_4_ =
       auVar27._20_4_ * fVar101 + fVar129 * local_860._20_4_ + fVar221 * auVar116._20_4_;
  auVar418._24_4_ =
       auVar27._24_4_ * fVar217 + fVar219 * local_860._24_4_ + fVar222 * auVar116._24_4_;
  auVar418._28_4_ = fVar103 + 0.0;
  auVar413._0_4_ = auVar28._0_4_ * fVar192 + fVar220 * auVar147._0_4_ + fVar218 * local_9e0._0_4_;
  auVar413._4_4_ = auVar28._4_4_ * fVar101 + fVar221 * auVar147._4_4_ + fVar129 * local_9e0._4_4_;
  auVar413._8_4_ = auVar28._8_4_ * fVar217 + fVar222 * auVar147._8_4_ + fVar219 * local_9e0._8_4_;
  auVar413._12_4_ =
       auVar28._12_4_ * fVar102 + fVar223 * auVar147._12_4_ + fVar103 * local_9e0._12_4_;
  auVar413._16_4_ =
       auVar28._16_4_ * fVar192 + fVar220 * auVar147._16_4_ + fVar218 * local_9e0._16_4_;
  auVar413._20_4_ =
       auVar28._20_4_ * fVar101 + fVar221 * auVar147._20_4_ + fVar129 * local_9e0._20_4_;
  auVar413._24_4_ =
       auVar28._24_4_ * fVar217 + fVar222 * auVar147._24_4_ + fVar219 * local_9e0._24_4_;
  auVar413._28_4_ = local_860._28_4_ + 0.0 + 0.0;
  auVar397._0_4_ = fVar218 * auVar29._0_4_ + fVar220 * auVar349._0_4_ + fVar192 * auVar175._0_4_;
  auVar397._4_4_ = fVar129 * auVar29._4_4_ + fVar221 * auVar349._4_4_ + fVar101 * auVar175._4_4_;
  auVar397._8_4_ = fVar219 * auVar29._8_4_ + fVar222 * auVar349._8_4_ + fVar217 * auVar175._8_4_;
  auVar397._12_4_ = fVar103 * auVar29._12_4_ + fVar223 * auVar349._12_4_ + fVar102 * auVar175._12_4_
  ;
  auVar397._16_4_ = fVar218 * auVar29._16_4_ + fVar220 * auVar349._16_4_ + fVar192 * auVar175._16_4_
  ;
  auVar397._20_4_ = fVar129 * auVar29._20_4_ + fVar221 * auVar349._20_4_ + fVar101 * auVar175._20_4_
  ;
  auVar397._24_4_ = fVar219 * auVar29._24_4_ + fVar222 * auVar349._24_4_ + fVar217 * auVar175._24_4_
  ;
  auVar397._28_4_ = fVar103 + auVar36._12_4_ + 0.0;
  auVar200 = vshufps_avx(auVar299,auVar299,0x55);
  auVar280 = vshufps_avx(auVar299,auVar299,0xaa);
  fVar220 = auVar280._0_4_;
  fVar221 = auVar280._4_4_;
  fVar222 = auVar280._8_4_;
  fVar223 = auVar280._12_4_;
  fVar218 = auVar200._0_4_;
  fVar129 = auVar200._4_4_;
  fVar219 = auVar200._8_4_;
  fVar103 = auVar200._12_4_;
  fVar191 = auVar349._28_4_ + auVar116._28_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar200 = vpmovsxwd_avx(auVar200);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *(ulong *)(prim + uVar91 * 7 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar280);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 0xe);
  auVar108 = vpmovsxwd_avx(auVar108);
  auVar167 = vshufps_avx(auVar299,auVar299,0);
  fVar192 = auVar167._0_4_;
  fVar101 = auVar167._4_4_;
  fVar217 = auVar167._8_4_;
  fVar102 = auVar167._12_4_;
  auVar142._0_4_ = auVar27._0_4_ * fVar192 + fVar218 * local_860._0_4_ + fVar220 * auVar116._0_4_;
  auVar142._4_4_ = auVar27._4_4_ * fVar101 + fVar129 * local_860._4_4_ + fVar221 * auVar116._4_4_;
  auVar142._8_4_ = auVar27._8_4_ * fVar217 + fVar219 * local_860._8_4_ + fVar222 * auVar116._8_4_;
  auVar142._12_4_ =
       auVar27._12_4_ * fVar102 + fVar103 * local_860._12_4_ + fVar223 * auVar116._12_4_;
  auVar142._16_4_ =
       auVar27._16_4_ * fVar192 + fVar218 * local_860._16_4_ + fVar220 * auVar116._16_4_;
  auVar142._20_4_ =
       auVar27._20_4_ * fVar101 + fVar129 * local_860._20_4_ + fVar221 * auVar116._20_4_;
  auVar142._24_4_ =
       auVar27._24_4_ * fVar217 + fVar219 * local_860._24_4_ + fVar222 * auVar116._24_4_;
  auVar142._28_4_ = fVar103 + fVar191;
  auVar114._0_4_ = auVar28._0_4_ * fVar192 + fVar218 * local_9e0._0_4_ + fVar220 * auVar147._0_4_;
  auVar114._4_4_ = auVar28._4_4_ * fVar101 + fVar129 * local_9e0._4_4_ + fVar221 * auVar147._4_4_;
  auVar114._8_4_ = auVar28._8_4_ * fVar217 + fVar219 * local_9e0._8_4_ + fVar222 * auVar147._8_4_;
  auVar114._12_4_ =
       auVar28._12_4_ * fVar102 + fVar103 * local_9e0._12_4_ + fVar223 * auVar147._12_4_;
  auVar114._16_4_ =
       auVar28._16_4_ * fVar192 + fVar218 * local_9e0._16_4_ + fVar220 * auVar147._16_4_;
  auVar114._20_4_ =
       auVar28._20_4_ * fVar101 + fVar129 * local_9e0._20_4_ + fVar221 * auVar147._20_4_;
  auVar114._24_4_ =
       auVar28._24_4_ * fVar217 + fVar219 * local_9e0._24_4_ + fVar222 * auVar147._24_4_;
  auVar114._28_4_ = fVar103 + auVar116._28_4_ + auVar147._28_4_;
  auVar256._8_4_ = 0x7fffffff;
  auVar256._0_8_ = 0x7fffffff7fffffff;
  auVar256._12_4_ = 0x7fffffff;
  auVar256._16_4_ = 0x7fffffff;
  auVar256._20_4_ = 0x7fffffff;
  auVar256._24_4_ = 0x7fffffff;
  auVar256._28_4_ = 0x7fffffff;
  auVar360._8_4_ = 0x219392ef;
  auVar360._0_8_ = 0x219392ef219392ef;
  auVar360._12_4_ = 0x219392ef;
  auVar360._16_4_ = 0x219392ef;
  auVar360._20_4_ = 0x219392ef;
  auVar360._24_4_ = 0x219392ef;
  auVar360._28_4_ = 0x219392ef;
  auVar116 = vandps_avx(auVar418,auVar256);
  auVar116 = vcmpps_avx(auVar116,auVar360,1);
  auVar147 = vblendvps_avx(auVar418,auVar360,auVar116);
  auVar116 = vandps_avx(auVar413,auVar256);
  auVar116 = vcmpps_avx(auVar116,auVar360,1);
  auVar27 = vblendvps_avx(auVar413,auVar360,auVar116);
  auVar116 = vandps_avx(auVar397,auVar256);
  auVar116 = vcmpps_avx(auVar116,auVar360,1);
  auVar116 = vblendvps_avx(auVar397,auVar360,auVar116);
  auVar173._0_4_ = fVar192 * auVar175._0_4_ + auVar29._0_4_ * fVar218 + fVar220 * auVar349._0_4_;
  auVar173._4_4_ = fVar101 * auVar175._4_4_ + auVar29._4_4_ * fVar129 + fVar221 * auVar349._4_4_;
  auVar173._8_4_ = fVar217 * auVar175._8_4_ + auVar29._8_4_ * fVar219 + fVar222 * auVar349._8_4_;
  auVar173._12_4_ = fVar102 * auVar175._12_4_ + auVar29._12_4_ * fVar103 + fVar223 * auVar349._12_4_
  ;
  auVar173._16_4_ = fVar192 * auVar175._16_4_ + auVar29._16_4_ * fVar218 + fVar220 * auVar349._16_4_
  ;
  auVar173._20_4_ = fVar101 * auVar175._20_4_ + auVar29._20_4_ * fVar129 + fVar221 * auVar349._20_4_
  ;
  auVar173._24_4_ = fVar217 * auVar175._24_4_ + auVar29._24_4_ * fVar219 + fVar222 * auVar349._24_4_
  ;
  auVar173._28_4_ = fVar191 + fVar103 + fVar223;
  auVar28 = vrcpps_avx(auVar147);
  fVar192 = auVar28._0_4_;
  fVar217 = auVar28._4_4_;
  auVar175._4_4_ = auVar147._4_4_ * fVar217;
  auVar175._0_4_ = auVar147._0_4_ * fVar192;
  fVar218 = auVar28._8_4_;
  auVar175._8_4_ = auVar147._8_4_ * fVar218;
  fVar219 = auVar28._12_4_;
  auVar175._12_4_ = auVar147._12_4_ * fVar219;
  fVar220 = auVar28._16_4_;
  auVar175._16_4_ = auVar147._16_4_ * fVar220;
  fVar221 = auVar28._20_4_;
  auVar175._20_4_ = auVar147._20_4_ * fVar221;
  fVar222 = auVar28._24_4_;
  auVar175._24_4_ = auVar147._24_4_ * fVar222;
  auVar175._28_4_ = auVar147._28_4_;
  auVar377._8_4_ = 0x3f800000;
  auVar377._0_8_ = 0x3f8000003f800000;
  auVar377._12_4_ = 0x3f800000;
  auVar377._16_4_ = 0x3f800000;
  auVar377._20_4_ = 0x3f800000;
  auVar377._24_4_ = 0x3f800000;
  auVar377._28_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar377,auVar175);
  auVar175 = vrcpps_avx(auVar27);
  fVar192 = fVar192 + fVar192 * auVar29._0_4_;
  fVar217 = fVar217 + fVar217 * auVar29._4_4_;
  fVar218 = fVar218 + fVar218 * auVar29._8_4_;
  fVar219 = fVar219 + fVar219 * auVar29._12_4_;
  fVar220 = fVar220 + fVar220 * auVar29._16_4_;
  fVar221 = fVar221 + fVar221 * auVar29._20_4_;
  fVar222 = fVar222 + fVar222 * auVar29._24_4_;
  fVar223 = auVar175._0_4_;
  fVar191 = auVar175._4_4_;
  auVar147._4_4_ = fVar191 * auVar27._4_4_;
  auVar147._0_4_ = fVar223 * auVar27._0_4_;
  fVar244 = auVar175._8_4_;
  auVar147._8_4_ = fVar244 * auVar27._8_4_;
  fVar245 = auVar175._12_4_;
  auVar147._12_4_ = fVar245 * auVar27._12_4_;
  fVar246 = auVar175._16_4_;
  auVar147._16_4_ = fVar246 * auVar27._16_4_;
  fVar247 = auVar175._20_4_;
  auVar147._20_4_ = fVar247 * auVar27._20_4_;
  fVar248 = auVar175._24_4_;
  auVar147._24_4_ = fVar248 * auVar27._24_4_;
  auVar147._28_4_ = auVar27._28_4_;
  auVar27 = vsubps_avx(auVar377,auVar147);
  fVar223 = fVar223 + fVar223 * auVar27._0_4_;
  fVar191 = fVar191 + fVar191 * auVar27._4_4_;
  fVar244 = fVar244 + fVar244 * auVar27._8_4_;
  fVar245 = fVar245 + fVar245 * auVar27._12_4_;
  fVar246 = fVar246 + fVar246 * auVar27._16_4_;
  fVar247 = fVar247 + fVar247 * auVar27._20_4_;
  fVar248 = fVar248 + fVar248 * auVar27._24_4_;
  auVar147 = vrcpps_avx(auVar116);
  fVar249 = auVar147._0_4_;
  fVar265 = auVar147._4_4_;
  auVar349._4_4_ = fVar265 * auVar116._4_4_;
  auVar349._0_4_ = fVar249 * auVar116._0_4_;
  fVar266 = auVar147._8_4_;
  auVar349._8_4_ = fVar266 * auVar116._8_4_;
  fVar268 = auVar147._12_4_;
  auVar349._12_4_ = fVar268 * auVar116._12_4_;
  fVar270 = auVar147._16_4_;
  auVar349._16_4_ = fVar270 * auVar116._16_4_;
  fVar272 = auVar147._20_4_;
  auVar349._20_4_ = fVar272 * auVar116._20_4_;
  fVar274 = auVar147._24_4_;
  auVar349._24_4_ = fVar274 * auVar116._24_4_;
  auVar349._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar377,auVar349);
  fVar249 = fVar249 + fVar249 * auVar116._0_4_;
  fVar265 = fVar265 + fVar265 * auVar116._4_4_;
  fVar266 = fVar266 + fVar266 * auVar116._8_4_;
  fVar268 = fVar268 + fVar268 * auVar116._12_4_;
  fVar270 = fVar270 + fVar270 * auVar116._16_4_;
  fVar272 = fVar272 + fVar272 * auVar116._20_4_;
  fVar274 = fVar274 + fVar274 * auVar116._24_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar167 = vpmovsxwd_avx(auVar167);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar91 * 9 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar301._16_16_ = auVar280;
  auVar301._0_16_ = auVar200;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar200 = vpmovsxwd_avx(auVar31);
  auVar332._16_16_ = auVar108;
  auVar332._0_16_ = auVar30;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 0xe);
  auVar280 = vpmovsxwd_avx(auVar113);
  auVar30 = vpermilps_avx(auVar110,0);
  auVar116 = vcvtdq2ps_avx(auVar301);
  auVar147 = vcvtdq2ps_avx(auVar332);
  auVar147 = vsubps_avx(auVar147,auVar116);
  fVar101 = auVar30._0_4_;
  fVar102 = auVar30._4_4_;
  fVar129 = auVar30._8_4_;
  fVar103 = auVar30._12_4_;
  auVar302._0_4_ = auVar147._0_4_ * fVar101 + auVar116._0_4_;
  auVar302._4_4_ = auVar147._4_4_ * fVar102 + auVar116._4_4_;
  auVar302._8_4_ = auVar147._8_4_ * fVar129 + auVar116._8_4_;
  auVar302._12_4_ = auVar147._12_4_ * fVar103 + auVar116._12_4_;
  auVar302._16_4_ = auVar147._16_4_ * fVar101 + auVar116._16_4_;
  auVar302._20_4_ = auVar147._20_4_ * fVar102 + auVar116._20_4_;
  auVar302._24_4_ = auVar147._24_4_ * fVar129 + auVar116._24_4_;
  auVar302._28_4_ = auVar147._28_4_ + auVar116._28_4_;
  auVar333._16_16_ = auVar197;
  auVar333._0_16_ = auVar167;
  auVar116 = vcvtdq2ps_avx(auVar333);
  auVar319._16_16_ = auVar280;
  auVar319._0_16_ = auVar200;
  auVar147 = vcvtdq2ps_avx(auVar319);
  auVar147 = vsubps_avx(auVar147,auVar116);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar200 = vpmovsxwd_avx(auVar110);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar32);
  auVar320._0_4_ = auVar116._0_4_ + auVar147._0_4_ * fVar101;
  auVar320._4_4_ = auVar116._4_4_ + auVar147._4_4_ * fVar102;
  auVar320._8_4_ = auVar116._8_4_ + auVar147._8_4_ * fVar129;
  auVar320._12_4_ = auVar116._12_4_ + auVar147._12_4_ * fVar103;
  auVar320._16_4_ = auVar116._16_4_ + auVar147._16_4_ * fVar101;
  auVar320._20_4_ = auVar116._20_4_ + auVar147._20_4_ * fVar102;
  auVar320._24_4_ = auVar116._24_4_ + auVar147._24_4_ * fVar129;
  auVar320._28_4_ = auVar116._28_4_ + auVar147._28_4_;
  auVar334._16_16_ = auVar280;
  auVar334._0_16_ = auVar200;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar91 * 0x16 + 6);
  auVar200 = vpmovsxwd_avx(auVar33);
  auVar116 = vcvtdq2ps_avx(auVar334);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar91 * 0x16 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar34);
  auVar341._16_16_ = auVar280;
  auVar341._0_16_ = auVar200;
  auVar147 = vcvtdq2ps_avx(auVar341);
  auVar147 = vsubps_avx(auVar147,auVar116);
  auVar335._0_4_ = auVar116._0_4_ + auVar147._0_4_ * fVar101;
  auVar335._4_4_ = auVar116._4_4_ + auVar147._4_4_ * fVar102;
  auVar335._8_4_ = auVar116._8_4_ + auVar147._8_4_ * fVar129;
  auVar335._12_4_ = auVar116._12_4_ + auVar147._12_4_ * fVar103;
  auVar335._16_4_ = auVar116._16_4_ + auVar147._16_4_ * fVar101;
  auVar335._20_4_ = auVar116._20_4_ + auVar147._20_4_ * fVar102;
  auVar335._24_4_ = auVar116._24_4_ + auVar147._24_4_ * fVar129;
  auVar335._28_4_ = auVar116._28_4_ + auVar147._28_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar91 * 0x14 + 6);
  auVar200 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar91 * 0x14 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar36);
  auVar342._16_16_ = auVar280;
  auVar342._0_16_ = auVar200;
  auVar116 = vcvtdq2ps_avx(auVar342);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar200 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar38);
  auVar361._16_16_ = auVar280;
  auVar361._0_16_ = auVar200;
  auVar147 = vcvtdq2ps_avx(auVar361);
  auVar147 = vsubps_avx(auVar147,auVar116);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar200 = vpmovsxwd_avx(auVar12);
  auVar343._0_4_ = auVar116._0_4_ + auVar147._0_4_ * fVar101;
  auVar343._4_4_ = auVar116._4_4_ + auVar147._4_4_ * fVar102;
  auVar343._8_4_ = auVar116._8_4_ + auVar147._8_4_ * fVar129;
  auVar343._12_4_ = auVar116._12_4_ + auVar147._12_4_ * fVar103;
  auVar343._16_4_ = auVar116._16_4_ + auVar147._16_4_ * fVar101;
  auVar343._20_4_ = auVar116._20_4_ + auVar147._20_4_ * fVar102;
  auVar343._24_4_ = auVar116._24_4_ + auVar147._24_4_ * fVar129;
  auVar343._28_4_ = auVar116._28_4_ + auVar147._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 0xe);
  auVar280 = vpmovsxwd_avx(auVar13);
  auVar362._16_16_ = auVar280;
  auVar362._0_16_ = auVar200;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 * 0x21 + 6);
  auVar200 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar91 * 0x21 + 0xe);
  auVar280 = vpmovsxwd_avx(auVar15);
  auVar378._16_16_ = auVar280;
  auVar378._0_16_ = auVar200;
  auVar116 = vcvtdq2ps_avx(auVar362);
  auVar147 = vcvtdq2ps_avx(auVar378);
  auVar147 = vsubps_avx(auVar147,auVar116);
  auVar363._0_4_ = auVar116._0_4_ + auVar147._0_4_ * fVar101;
  auVar363._4_4_ = auVar116._4_4_ + auVar147._4_4_ * fVar102;
  auVar363._8_4_ = auVar116._8_4_ + auVar147._8_4_ * fVar129;
  auVar363._12_4_ = auVar116._12_4_ + auVar147._12_4_ * fVar103;
  auVar363._16_4_ = auVar116._16_4_ + auVar147._16_4_ * fVar101;
  auVar363._20_4_ = auVar116._20_4_ + auVar147._20_4_ * fVar102;
  auVar363._24_4_ = auVar116._24_4_ + auVar147._24_4_ * fVar129;
  auVar363._28_4_ = auVar116._28_4_ + auVar147._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar91 * 0x1f + 6);
  auVar200 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar91 * 0x1f + 0xe);
  auVar280 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar30 = vpmovsxwd_avx(auVar18);
  local_7c8 = prim;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 0xe);
  auVar108 = vpmovsxwd_avx(auVar19);
  auVar379._16_16_ = auVar280;
  auVar379._0_16_ = auVar200;
  auVar398._16_16_ = auVar108;
  auVar398._0_16_ = auVar30;
  auVar116 = vcvtdq2ps_avx(auVar379);
  auVar147 = vcvtdq2ps_avx(auVar398);
  auVar147 = vsubps_avx(auVar147,auVar116);
  auVar380._0_4_ = auVar116._0_4_ + auVar147._0_4_ * fVar101;
  auVar380._4_4_ = auVar116._4_4_ + auVar147._4_4_ * fVar102;
  auVar380._8_4_ = auVar116._8_4_ + auVar147._8_4_ * fVar129;
  auVar380._12_4_ = auVar116._12_4_ + auVar147._12_4_ * fVar103;
  auVar380._16_4_ = auVar116._16_4_ + auVar147._16_4_ * fVar101;
  auVar380._20_4_ = auVar116._20_4_ + auVar147._20_4_ * fVar102;
  auVar380._24_4_ = auVar116._24_4_ + auVar147._24_4_ * fVar129;
  auVar380._28_4_ = auVar116._28_4_ + fVar103;
  auVar116 = vsubps_avx(auVar302,auVar142);
  auVar278._0_4_ = fVar192 * auVar116._0_4_;
  auVar278._4_4_ = fVar217 * auVar116._4_4_;
  auVar278._8_4_ = fVar218 * auVar116._8_4_;
  auVar278._12_4_ = fVar219 * auVar116._12_4_;
  auVar260._16_4_ = fVar220 * auVar116._16_4_;
  auVar260._0_16_ = auVar278;
  auVar260._20_4_ = fVar221 * auVar116._20_4_;
  auVar260._24_4_ = fVar222 * auVar116._24_4_;
  auVar260._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar320,auVar142);
  auVar193._0_4_ = fVar192 * auVar116._0_4_;
  auVar193._4_4_ = fVar217 * auVar116._4_4_;
  auVar193._8_4_ = fVar218 * auVar116._8_4_;
  auVar193._12_4_ = fVar219 * auVar116._12_4_;
  auVar214._16_4_ = fVar220 * auVar116._16_4_;
  auVar214._0_16_ = auVar193;
  auVar214._20_4_ = fVar221 * auVar116._20_4_;
  auVar214._24_4_ = fVar222 * auVar116._24_4_;
  auVar214._28_4_ = auVar28._28_4_ + auVar29._28_4_;
  auVar116 = vsubps_avx(auVar335,auVar114);
  auVar130._0_4_ = fVar223 * auVar116._0_4_;
  auVar130._4_4_ = fVar191 * auVar116._4_4_;
  auVar130._8_4_ = fVar244 * auVar116._8_4_;
  auVar130._12_4_ = fVar245 * auVar116._12_4_;
  auVar28._16_4_ = fVar246 * auVar116._16_4_;
  auVar28._0_16_ = auVar130;
  auVar28._20_4_ = fVar247 * auVar116._20_4_;
  auVar28._24_4_ = fVar248 * auVar116._24_4_;
  auVar28._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar343,auVar114);
  auVar224._0_4_ = fVar223 * auVar116._0_4_;
  auVar224._4_4_ = fVar191 * auVar116._4_4_;
  auVar224._8_4_ = fVar244 * auVar116._8_4_;
  auVar224._12_4_ = fVar245 * auVar116._12_4_;
  auVar29._16_4_ = fVar246 * auVar116._16_4_;
  auVar29._0_16_ = auVar224;
  auVar29._20_4_ = fVar247 * auVar116._20_4_;
  auVar29._24_4_ = fVar248 * auVar116._24_4_;
  auVar29._28_4_ = auVar175._28_4_ + auVar27._28_4_;
  auVar116 = vsubps_avx(auVar363,auVar173);
  auVar104._0_4_ = fVar249 * auVar116._0_4_;
  auVar104._4_4_ = fVar265 * auVar116._4_4_;
  auVar104._8_4_ = fVar266 * auVar116._8_4_;
  auVar104._12_4_ = fVar268 * auVar116._12_4_;
  auVar27._16_4_ = fVar270 * auVar116._16_4_;
  auVar27._0_16_ = auVar104;
  auVar27._20_4_ = fVar272 * auVar116._20_4_;
  auVar27._24_4_ = fVar274 * auVar116._24_4_;
  auVar27._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar380,auVar173);
  auVar165._0_4_ = fVar249 * auVar116._0_4_;
  auVar165._4_4_ = fVar265 * auVar116._4_4_;
  auVar165._8_4_ = fVar266 * auVar116._8_4_;
  auVar165._12_4_ = fVar268 * auVar116._12_4_;
  auVar348._16_4_ = fVar270 * auVar116._16_4_;
  auVar348._0_16_ = auVar165;
  auVar348._20_4_ = fVar272 * auVar116._20_4_;
  auVar348._24_4_ = fVar274 * auVar116._24_4_;
  auVar348._28_4_ = auVar116._28_4_;
  auVar200 = vpminsd_avx(auVar260._16_16_,auVar214._16_16_);
  auVar280 = vpminsd_avx(auVar278,auVar193);
  auVar321._16_16_ = auVar200;
  auVar321._0_16_ = auVar280;
  auVar200 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar280 = vpminsd_avx(auVar130,auVar224);
  auVar336._16_16_ = auVar200;
  auVar336._0_16_ = auVar280;
  auVar116 = vmaxps_avx(auVar321,auVar336);
  auVar200 = vpminsd_avx(auVar27._16_16_,auVar348._16_16_);
  auVar280 = vpminsd_avx(auVar104,auVar165);
  uVar98 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar419._4_4_ = uVar98;
  auVar419._0_4_ = uVar98;
  auVar419._8_4_ = uVar98;
  auVar419._12_4_ = uVar98;
  auVar419._16_4_ = uVar98;
  auVar419._20_4_ = uVar98;
  auVar419._24_4_ = uVar98;
  auVar419._28_4_ = uVar98;
  auVar399._16_16_ = auVar200;
  auVar399._0_16_ = auVar280;
  auVar147 = vmaxps_avx(auVar399,auVar419);
  auVar116 = vmaxps_avx(auVar116,auVar147);
  local_380._4_4_ = auVar116._4_4_ * 0.99999964;
  local_380._0_4_ = auVar116._0_4_ * 0.99999964;
  local_380._8_4_ = auVar116._8_4_ * 0.99999964;
  local_380._12_4_ = auVar116._12_4_ * 0.99999964;
  local_380._16_4_ = auVar116._16_4_ * 0.99999964;
  local_380._20_4_ = auVar116._20_4_ * 0.99999964;
  local_380._24_4_ = auVar116._24_4_ * 0.99999964;
  local_380._28_4_ = auVar116._28_4_;
  auVar200 = vpmaxsd_avx(auVar260._16_16_,auVar214._16_16_);
  auVar280 = vpmaxsd_avx(auVar278,auVar193);
  auVar211._16_16_ = auVar200;
  auVar211._0_16_ = auVar280;
  auVar200 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar280 = vpmaxsd_avx(auVar130,auVar224);
  auVar143._16_16_ = auVar200;
  auVar143._0_16_ = auVar280;
  auVar116 = vminps_avx(auVar211,auVar143);
  auVar200 = vpmaxsd_avx(auVar27._16_16_,auVar348._16_16_);
  auVar280 = vpmaxsd_avx(auVar104,auVar165);
  auVar115._16_16_ = auVar200;
  auVar115._0_16_ = auVar280;
  fVar192 = (ray->super_RayK<1>).tfar;
  auVar174._4_4_ = fVar192;
  auVar174._0_4_ = fVar192;
  auVar174._8_4_ = fVar192;
  auVar174._12_4_ = fVar192;
  auVar174._16_4_ = fVar192;
  auVar174._20_4_ = fVar192;
  auVar174._24_4_ = fVar192;
  auVar174._28_4_ = fVar192;
  auVar147 = vminps_avx(auVar115,auVar174);
  auVar116 = vminps_avx(auVar116,auVar147);
  auVar39._4_4_ = auVar116._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar116._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar116._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar116._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar116._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar116._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar116._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar116._28_4_;
  auVar116 = vcmpps_avx(local_380,auVar39,2);
  auVar200 = vpshufd_avx(ZEXT116((byte)PVar20),0);
  auVar144._16_16_ = auVar200;
  auVar144._0_16_ = auVar200;
  auVar147 = vcvtdq2ps_avx(auVar144);
  auVar147 = vcmpps_avx(_DAT_01f7b060,auVar147,1);
  auVar116 = vandps_avx(auVar116,auVar147);
  uVar98 = vmovmskps_avx(auVar116);
  uVar91 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar98);
  auVar116._16_16_ = mm_lookupmask_ps._240_16_;
  auVar116._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar116,ZEXT832(0) << 0x20,0x80);
LAB_00a972e5:
  if (uVar91 == 0) {
    return;
  }
  lVar99 = 0;
  if (uVar91 != 0) {
    for (; (uVar91 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
    }
  }
  uVar95 = *(uint *)(local_7c8 + 2);
  pGVar21 = (context->scene->geometries).items[uVar95].ptr;
  uVar92 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                           (ulong)*(uint *)(local_7c8 + lVar99 * 4 + 6) *
                           pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar192 = (pGVar21->time_range).lower;
  fVar192 = pGVar21->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar192) /
            ((pGVar21->time_range).upper - fVar192));
  auVar200 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
  auVar200 = vminss_avx(auVar200,ZEXT416((uint)(pGVar21->fnumTimeSegments + -1.0)));
  auVar200 = vmaxss_avx(ZEXT816(0) << 0x20,auVar200);
  fVar192 = fVar192 - auVar200._0_4_;
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar97 = (long)(int)auVar200._0_4_ * 0x38;
  lVar23 = *(long *)(_Var22 + 0x10 + lVar97);
  lVar24 = *(long *)(_Var22 + 0x38 + lVar97);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar97);
  auVar200 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
  pfVar1 = (float *)(lVar24 + uVar92 * lVar25);
  fVar218 = auVar200._0_4_;
  fVar129 = auVar200._4_4_;
  fVar219 = auVar200._8_4_;
  fVar103 = auVar200._12_4_;
  pfVar2 = (float *)(lVar24 + (uVar92 + 1) * lVar25);
  pfVar3 = (float *)(lVar24 + (uVar92 + 2) * lVar25);
  pfVar4 = (float *)(lVar24 + lVar25 * (uVar92 + 3));
  lVar24 = *(long *)(_Var22 + lVar97);
  auVar200 = vshufps_avx(ZEXT416((uint)(1.0 - fVar192)),ZEXT416((uint)(1.0 - fVar192)),0);
  pfVar5 = (float *)(lVar24 + lVar23 * uVar92);
  fVar192 = auVar200._0_4_;
  fVar101 = auVar200._4_4_;
  fVar217 = auVar200._8_4_;
  fVar102 = auVar200._12_4_;
  pfVar6 = (float *)(lVar24 + lVar23 * (uVar92 + 1));
  pfVar7 = (float *)(lVar24 + lVar23 * (uVar92 + 2));
  auVar166._0_4_ = fVar218 * *pfVar1 + fVar192 * *pfVar5;
  auVar166._4_4_ = fVar129 * pfVar1[1] + fVar101 * pfVar5[1];
  auVar166._8_4_ = fVar219 * pfVar1[2] + fVar217 * pfVar5[2];
  auVar166._12_4_ = fVar103 * pfVar1[3] + fVar102 * pfVar5[3];
  auVar194._0_4_ = fVar192 * *pfVar6 + fVar218 * *pfVar2;
  auVar194._4_4_ = fVar101 * pfVar6[1] + fVar129 * pfVar2[1];
  auVar194._8_4_ = fVar217 * pfVar6[2] + fVar219 * pfVar2[2];
  auVar194._12_4_ = fVar102 * pfVar6[3] + fVar103 * pfVar2[3];
  auVar225._0_4_ = fVar192 * *pfVar7 + fVar218 * *pfVar3;
  auVar225._4_4_ = fVar101 * pfVar7[1] + fVar129 * pfVar3[1];
  auVar225._8_4_ = fVar217 * pfVar7[2] + fVar219 * pfVar3[2];
  auVar225._12_4_ = fVar102 * pfVar7[3] + fVar103 * pfVar3[3];
  pfVar1 = (float *)(lVar24 + lVar23 * (uVar92 + 3));
  auVar250._0_4_ = fVar192 * *pfVar1 + fVar218 * *pfVar4;
  auVar250._4_4_ = fVar101 * pfVar1[1] + fVar129 * pfVar4[1];
  auVar250._8_4_ = fVar217 * pfVar1[2] + fVar219 * pfVar4[2];
  auVar250._12_4_ = fVar102 * pfVar1[3] + fVar103 * pfVar4[3];
  auVar105._0_4_ = (auVar166._0_4_ + auVar194._0_4_ + auVar225._0_4_ + auVar250._0_4_) * 0.25;
  auVar105._4_4_ = (auVar166._4_4_ + auVar194._4_4_ + auVar225._4_4_ + auVar250._4_4_) * 0.25;
  auVar105._8_4_ = (auVar166._8_4_ + auVar194._8_4_ + auVar225._8_4_ + auVar250._8_4_) * 0.25;
  auVar105._12_4_ = (auVar166._12_4_ + auVar194._12_4_ + auVar225._12_4_ + auVar250._12_4_) * 0.25;
  aVar9 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar200 = vsubps_avx(auVar105,(undefined1  [16])aVar9);
  auVar200 = vdpps_avx(auVar200,(undefined1  [16])aVar10,0x7f);
  auVar280 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar30 = vrcpss_avx(auVar280,auVar280);
  fVar192 = auVar200._0_4_ * auVar30._0_4_ * (2.0 - auVar30._0_4_ * auVar280._0_4_);
  local_7e0 = ZEXT416((uint)fVar192);
  auVar280 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
  fVar192 = aVar10.x;
  fVar101 = aVar10.y;
  fVar217 = aVar10.z;
  aVar159 = aVar10.field_3;
  auVar279._0_4_ = aVar9.x + fVar192 * auVar280._0_4_;
  auVar279._4_4_ = aVar9.y + fVar101 * auVar280._4_4_;
  auVar279._8_4_ = aVar9.z + fVar217 * auVar280._8_4_;
  auVar279._12_4_ = aVar9.field_3.w + aVar159.w * auVar280._12_4_;
  auVar200 = vblendps_avx(auVar279,_DAT_01f45a50,8);
  auVar30 = vsubps_avx(auVar166,auVar200);
  auVar309 = ZEXT1664(auVar30);
  auVar167 = vsubps_avx(auVar225,auVar200);
  auVar108 = vsubps_avx(auVar194,auVar200);
  auVar197 = vsubps_avx(auVar250,auVar200);
  auVar200 = vshufps_avx(auVar30,auVar30,0);
  auVar337._16_16_ = auVar200;
  auVar337._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar30,auVar30,0x55);
  auVar344._16_16_ = auVar200;
  auVar344._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar30,auVar30,0xaa);
  local_940._16_16_ = auVar200;
  local_940._0_16_ = auVar200;
  auVar382 = ZEXT3264(local_940);
  _local_9c0 = auVar30;
  auVar200 = vshufps_avx(auVar30,auVar30,0xff);
  auVar308._16_16_ = auVar200;
  auVar308._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar108,auVar108,0);
  auVar285._16_16_ = auVar200;
  auVar285._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar108,auVar108,0x55);
  auVar323._16_16_ = auVar200;
  auVar323._0_16_ = auVar200;
  auVar200 = vshufps_avx(auVar108,auVar108,0xaa);
  local_880._16_16_ = auVar200;
  local_880._0_16_ = auVar200;
  auVar131._0_4_ = fVar192 * fVar192;
  auVar131._4_4_ = fVar101 * fVar101;
  auVar131._8_4_ = fVar217 * fVar217;
  auVar131._12_4_ = aVar159.w * aVar159.w;
  auVar200 = vshufps_avx(auVar131,auVar131,0xaa);
  auVar30 = vshufps_avx(auVar131,auVar131,0x55);
  _local_840 = auVar108;
  auVar108 = vshufps_avx(auVar108,auVar108,0xff);
  local_760._16_16_ = auVar108;
  local_760._0_16_ = auVar108;
  auVar108 = vshufps_avx(auVar131,auVar131,0);
  local_1e0._0_4_ = auVar108._0_4_ + auVar30._0_4_ + auVar200._0_4_;
  local_1e0._4_4_ = auVar108._4_4_ + auVar30._4_4_ + auVar200._4_4_;
  local_1e0._8_4_ = auVar108._8_4_ + auVar30._8_4_ + auVar200._8_4_;
  local_1e0._12_4_ = auVar108._12_4_ + auVar30._12_4_ + auVar200._12_4_;
  local_1e0._16_4_ = auVar108._0_4_ + auVar30._0_4_ + auVar200._0_4_;
  local_1e0._20_4_ = auVar108._4_4_ + auVar30._4_4_ + auVar200._4_4_;
  local_1e0._24_4_ = auVar108._8_4_ + auVar30._8_4_ + auVar200._8_4_;
  local_1e0._28_4_ = auVar108._12_4_ + auVar30._12_4_ + auVar200._12_4_;
  auVar200 = vshufps_avx(auVar167,auVar167,0);
  register0x00001250 = auVar200;
  _local_200 = auVar200;
  auVar200 = vshufps_avx(auVar167,auVar167,0x55);
  register0x00001250 = auVar200;
  _local_220 = auVar200;
  auVar200 = vshufps_avx(auVar167,auVar167,0xaa);
  register0x00001250 = auVar200;
  _local_240 = auVar200;
  _local_9e0 = auVar167;
  auVar200 = vshufps_avx(auVar167,auVar167,0xff);
  register0x00001250 = auVar200;
  _local_260 = auVar200;
  auVar200 = vshufps_avx(auVar197,auVar197,0);
  register0x00001250 = auVar200;
  _local_280 = auVar200;
  auVar200 = vshufps_avx(auVar197,auVar197,0x55);
  register0x00001250 = auVar200;
  _local_2a0 = auVar200;
  auVar200 = vshufps_avx(auVar197,auVar197,0xaa);
  register0x00001250 = auVar200;
  _local_2c0 = auVar200;
  _local_860 = auVar197;
  auVar200 = vshufps_avx(auVar197,auVar197,0xff);
  auVar290 = ZEXT3264(local_880);
  register0x00001250 = auVar200;
  _local_2e0 = auVar200;
  register0x00001210 = auVar280;
  _local_660 = auVar280;
  uVar94 = 0;
  local_b8c = 1;
  local_460 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  local_720 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  local_740 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_1e0,auVar117);
  local_590 = ZEXT816(0x3f80000000000000);
  local_900 = auVar337;
  local_920 = auVar344;
  local_960 = auVar308;
  local_4a0 = auVar285;
  local_980 = auVar323;
  uVar92 = (ulong)*(uint *)(local_7c8 + lVar99 * 4 + 6);
  do {
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = 0x3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar237._16_4_ = 0x3f800000;
    auVar237._20_4_ = 0x3f800000;
    auVar237._24_4_ = 0x3f800000;
    auVar237._28_4_ = 0x3f800000;
    auVar200 = vmovshdup_avx(local_590);
    auVar30 = vsubps_avx(auVar200,local_590);
    auVar200 = vshufps_avx(local_590,local_590,0);
    local_6c0._16_16_ = auVar200;
    local_6c0._0_16_ = auVar200;
    auVar280 = vshufps_avx(auVar30,auVar30,0);
    local_6e0._16_16_ = auVar280;
    local_6e0._0_16_ = auVar280;
    fVar415 = auVar280._0_4_;
    fVar156 = auVar280._4_4_;
    fVar157 = auVar280._8_4_;
    fVar160 = auVar280._12_4_;
    fVar183 = auVar200._0_4_;
    auVar145._0_4_ = fVar183 + fVar415 * 0.0;
    fVar186 = auVar200._4_4_;
    auVar145._4_4_ = fVar186 + fVar156 * 0.14285715;
    fVar189 = auVar200._8_4_;
    auVar145._8_4_ = fVar189 + fVar157 * 0.2857143;
    fVar411 = auVar200._12_4_;
    auVar145._12_4_ = fVar411 + fVar160 * 0.42857146;
    auVar145._16_4_ = fVar183 + fVar415 * 0.5714286;
    auVar145._20_4_ = fVar186 + fVar156 * 0.71428573;
    auVar145._24_4_ = fVar189 + fVar157 * 0.8571429;
    auVar145._28_4_ = fVar411 + fVar160;
    auVar116 = vsubps_avx(auVar237,auVar145);
    fVar192 = auVar116._0_4_;
    fVar101 = auVar116._4_4_;
    fVar217 = auVar116._8_4_;
    fVar102 = auVar116._12_4_;
    fVar218 = auVar116._16_4_;
    fVar129 = auVar116._20_4_;
    fVar219 = auVar116._24_4_;
    fVar246 = auVar309._28_4_ + 1.0;
    fVar103 = auVar337._28_4_;
    fVar277 = (float)local_200._0_4_ * auVar145._0_4_ + auVar285._0_4_ * fVar192;
    fVar291 = (float)local_200._4_4_ * auVar145._4_4_ + auVar285._4_4_ * fVar101;
    fVar292 = fStack_1f8 * auVar145._8_4_ + auVar285._8_4_ * fVar217;
    fVar293 = fStack_1f4 * auVar145._12_4_ + auVar285._12_4_ * fVar102;
    fVar294 = fStack_1f0 * auVar145._16_4_ + auVar285._16_4_ * fVar218;
    fVar295 = fStack_1ec * auVar145._20_4_ + auVar285._20_4_ * fVar129;
    fVar296 = fStack_1e8 * auVar145._24_4_ + auVar285._24_4_ * fVar219;
    fVar220 = (float)local_220._0_4_ * auVar145._0_4_ + auVar323._0_4_ * fVar192;
    fVar221 = (float)local_220._4_4_ * auVar145._4_4_ + auVar323._4_4_ * fVar101;
    fVar222 = fStack_218 * auVar145._8_4_ + auVar323._8_4_ * fVar217;
    fVar223 = fStack_214 * auVar145._12_4_ + auVar323._12_4_ * fVar102;
    fVar191 = fStack_210 * auVar145._16_4_ + auVar323._16_4_ * fVar218;
    fVar244 = fStack_20c * auVar145._20_4_ + auVar323._20_4_ * fVar129;
    fVar245 = fStack_208 * auVar145._24_4_ + auVar323._24_4_ * fVar219;
    fVar247 = (float)local_240._0_4_ * auVar145._0_4_ + auVar290._0_4_ * fVar192;
    fVar248 = (float)local_240._4_4_ * auVar145._4_4_ + auVar290._4_4_ * fVar101;
    fVar249 = fStack_238 * auVar145._8_4_ + auVar290._8_4_ * fVar217;
    fVar265 = fStack_234 * auVar145._12_4_ + auVar290._12_4_ * fVar102;
    fVar266 = fStack_230 * auVar145._16_4_ + auVar290._16_4_ * fVar218;
    fVar268 = fStack_22c * auVar145._20_4_ + auVar290._20_4_ * fVar129;
    fVar270 = fStack_228 * auVar145._24_4_ + auVar290._24_4_ * fVar219;
    fVar272 = (float)local_260._0_4_ * auVar145._0_4_ + local_760._0_4_ * fVar192;
    fVar274 = (float)local_260._4_4_ * auVar145._4_4_ + local_760._4_4_ * fVar101;
    fVar267 = fStack_258 * auVar145._8_4_ + local_760._8_4_ * fVar217;
    fVar269 = fStack_254 * auVar145._12_4_ + local_760._12_4_ * fVar102;
    fVar271 = fStack_250 * auVar145._16_4_ + local_760._16_4_ * fVar218;
    fVar273 = fStack_24c * auVar145._20_4_ + local_760._20_4_ * fVar129;
    fVar275 = fStack_248 * auVar145._24_4_ + local_760._24_4_ * fVar219;
    fVar416 = auVar308._28_4_;
    fVar410 = fVar416 + auVar285._28_4_;
    fVar395 = fVar103 + fVar416;
    auVar338._0_4_ =
         fVar192 * (auVar285._0_4_ * auVar145._0_4_ + auVar337._0_4_ * fVar192) +
         auVar145._0_4_ * fVar277;
    auVar338._4_4_ =
         fVar101 * (auVar285._4_4_ * auVar145._4_4_ + auVar337._4_4_ * fVar101) +
         auVar145._4_4_ * fVar291;
    auVar338._8_4_ =
         fVar217 * (auVar285._8_4_ * auVar145._8_4_ + auVar337._8_4_ * fVar217) +
         auVar145._8_4_ * fVar292;
    auVar338._12_4_ =
         fVar102 * (auVar285._12_4_ * auVar145._12_4_ + auVar337._12_4_ * fVar102) +
         auVar145._12_4_ * fVar293;
    auVar338._16_4_ =
         fVar218 * (auVar285._16_4_ * auVar145._16_4_ + auVar337._16_4_ * fVar218) +
         auVar145._16_4_ * fVar294;
    auVar338._20_4_ =
         fVar129 * (auVar285._20_4_ * auVar145._20_4_ + auVar337._20_4_ * fVar129) +
         auVar145._20_4_ * fVar295;
    auVar338._24_4_ =
         fVar219 * (auVar285._24_4_ * auVar145._24_4_ + auVar337._24_4_ * fVar219) +
         auVar145._24_4_ * fVar296;
    auVar338._28_4_ = fVar103 + fVar416;
    auVar345._0_4_ =
         (auVar323._0_4_ * auVar145._0_4_ + auVar344._0_4_ * fVar192) * fVar192 +
         auVar145._0_4_ * fVar220;
    auVar345._4_4_ =
         (auVar323._4_4_ * auVar145._4_4_ + auVar344._4_4_ * fVar101) * fVar101 +
         auVar145._4_4_ * fVar221;
    auVar345._8_4_ =
         (auVar323._8_4_ * auVar145._8_4_ + auVar344._8_4_ * fVar217) * fVar217 +
         auVar145._8_4_ * fVar222;
    auVar345._12_4_ =
         (auVar323._12_4_ * auVar145._12_4_ + auVar344._12_4_ * fVar102) * fVar102 +
         auVar145._12_4_ * fVar223;
    auVar345._16_4_ =
         (auVar323._16_4_ * auVar145._16_4_ + auVar344._16_4_ * fVar218) * fVar218 +
         auVar145._16_4_ * fVar191;
    auVar345._20_4_ =
         (auVar323._20_4_ * auVar145._20_4_ + auVar344._20_4_ * fVar129) * fVar129 +
         auVar145._20_4_ * fVar244;
    auVar345._24_4_ =
         (auVar323._24_4_ * auVar145._24_4_ + auVar344._24_4_ * fVar219) * fVar219 +
         auVar145._24_4_ * fVar245;
    auVar345._28_4_ = fVar246 + 1.0 + fVar416;
    auVar364._0_4_ =
         fVar192 * (auVar290._0_4_ * auVar145._0_4_ + auVar382._0_4_ * fVar192) +
         auVar145._0_4_ * fVar247;
    auVar364._4_4_ =
         fVar101 * (auVar290._4_4_ * auVar145._4_4_ + auVar382._4_4_ * fVar101) +
         auVar145._4_4_ * fVar248;
    auVar364._8_4_ =
         fVar217 * (auVar290._8_4_ * auVar145._8_4_ + auVar382._8_4_ * fVar217) +
         auVar145._8_4_ * fVar249;
    auVar364._12_4_ =
         fVar102 * (auVar290._12_4_ * auVar145._12_4_ + auVar382._12_4_ * fVar102) +
         auVar145._12_4_ * fVar265;
    auVar364._16_4_ =
         fVar218 * (auVar290._16_4_ * auVar145._16_4_ + auVar382._16_4_ * fVar218) +
         auVar145._16_4_ * fVar266;
    auVar364._20_4_ =
         fVar129 * (auVar290._20_4_ * auVar145._20_4_ + auVar382._20_4_ * fVar129) +
         auVar145._20_4_ * fVar268;
    auVar364._24_4_ =
         fVar219 * (auVar290._24_4_ * auVar145._24_4_ + auVar382._24_4_ * fVar219) +
         auVar145._24_4_ * fVar270;
    auVar364._28_4_ = fStack_244 + fVar416;
    auVar303._0_4_ =
         auVar145._0_4_ * fVar272 +
         fVar192 * (local_760._0_4_ * auVar145._0_4_ + auVar308._0_4_ * fVar192);
    auVar303._4_4_ =
         auVar145._4_4_ * fVar274 +
         fVar101 * (local_760._4_4_ * auVar145._4_4_ + auVar308._4_4_ * fVar101);
    auVar303._8_4_ =
         auVar145._8_4_ * fVar267 +
         fVar217 * (local_760._8_4_ * auVar145._8_4_ + auVar308._8_4_ * fVar217);
    auVar303._12_4_ =
         auVar145._12_4_ * fVar269 +
         fVar102 * (local_760._12_4_ * auVar145._12_4_ + auVar308._12_4_ * fVar102);
    auVar303._16_4_ =
         auVar145._16_4_ * fVar271 +
         fVar218 * (local_760._16_4_ * auVar145._16_4_ + auVar308._16_4_ * fVar218);
    auVar303._20_4_ =
         auVar145._20_4_ * fVar273 +
         fVar129 * (local_760._20_4_ * auVar145._20_4_ + auVar308._20_4_ * fVar129);
    auVar303._24_4_ =
         auVar145._24_4_ * fVar275 +
         fVar219 * (local_760._24_4_ * auVar145._24_4_ + auVar308._24_4_ * fVar219);
    auVar303._28_4_ = fStack_244 + fStack_224;
    auVar286._0_4_ =
         (auVar145._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar192) *
         auVar145._0_4_ + fVar192 * fVar277;
    auVar286._4_4_ =
         (auVar145._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar101) *
         auVar145._4_4_ + fVar101 * fVar291;
    auVar286._8_4_ =
         (auVar145._8_4_ * fStack_278 + fStack_1f8 * fVar217) * auVar145._8_4_ + fVar217 * fVar292;
    auVar286._12_4_ =
         (auVar145._12_4_ * fStack_274 + fStack_1f4 * fVar102) * auVar145._12_4_ + fVar102 * fVar293
    ;
    auVar286._16_4_ =
         (auVar145._16_4_ * fStack_270 + fStack_1f0 * fVar218) * auVar145._16_4_ + fVar218 * fVar294
    ;
    auVar286._20_4_ =
         (auVar145._20_4_ * fStack_26c + fStack_1ec * fVar129) * auVar145._20_4_ + fVar129 * fVar295
    ;
    auVar286._24_4_ =
         (auVar145._24_4_ * fStack_268 + fStack_1e8 * fVar219) * auVar145._24_4_ + fVar219 * fVar296
    ;
    auVar286._28_4_ = fStack_244 + fVar246 + auVar290._28_4_;
    auVar212._0_4_ =
         (auVar145._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar192) *
         auVar145._0_4_ + fVar192 * fVar220;
    auVar212._4_4_ =
         (auVar145._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar101) *
         auVar145._4_4_ + fVar101 * fVar221;
    auVar212._8_4_ =
         (auVar145._8_4_ * fStack_298 + fStack_218 * fVar217) * auVar145._8_4_ + fVar217 * fVar222;
    auVar212._12_4_ =
         (auVar145._12_4_ * fStack_294 + fStack_214 * fVar102) * auVar145._12_4_ + fVar102 * fVar223
    ;
    auVar212._16_4_ =
         (auVar145._16_4_ * fStack_290 + fStack_210 * fVar218) * auVar145._16_4_ + fVar218 * fVar191
    ;
    auVar212._20_4_ =
         (auVar145._20_4_ * fStack_28c + fStack_20c * fVar129) * auVar145._20_4_ + fVar129 * fVar244
    ;
    auVar212._24_4_ =
         (auVar145._24_4_ * fStack_288 + fStack_208 * fVar219) * auVar145._24_4_ + fVar219 * fVar245
    ;
    auVar212._28_4_ = fStack_244 + fVar246 + 1.0;
    auVar238._0_4_ =
         (auVar145._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar192) *
         auVar145._0_4_ + fVar192 * fVar247;
    auVar238._4_4_ =
         (auVar145._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar101) *
         auVar145._4_4_ + fVar101 * fVar248;
    auVar238._8_4_ =
         (auVar145._8_4_ * fStack_2b8 + fStack_238 * fVar217) * auVar145._8_4_ + fVar217 * fVar249;
    auVar238._12_4_ =
         (auVar145._12_4_ * fStack_2b4 + fStack_234 * fVar102) * auVar145._12_4_ + fVar102 * fVar265
    ;
    auVar238._16_4_ =
         (auVar145._16_4_ * fStack_2b0 + fStack_230 * fVar218) * auVar145._16_4_ + fVar218 * fVar266
    ;
    auVar238._20_4_ =
         (auVar145._20_4_ * fStack_2ac + fStack_22c * fVar129) * auVar145._20_4_ + fVar129 * fVar268
    ;
    auVar238._24_4_ =
         (auVar145._24_4_ * fStack_2a8 + fStack_228 * fVar219) * auVar145._24_4_ + fVar219 * fVar270
    ;
    auVar238._28_4_ = fVar395 + fVar103 + 1.0;
    auVar257._0_4_ =
         (auVar145._0_4_ * (float)local_2e0._0_4_ + (float)local_260._0_4_ * fVar192) *
         auVar145._0_4_ + fVar192 * fVar272;
    auVar257._4_4_ =
         (auVar145._4_4_ * (float)local_2e0._4_4_ + (float)local_260._4_4_ * fVar101) *
         auVar145._4_4_ + fVar101 * fVar274;
    auVar257._8_4_ =
         (auVar145._8_4_ * fStack_2d8 + fStack_258 * fVar217) * auVar145._8_4_ + fVar217 * fVar267;
    auVar257._12_4_ =
         (auVar145._12_4_ * fStack_2d4 + fStack_254 * fVar102) * auVar145._12_4_ + fVar102 * fVar269
    ;
    auVar257._16_4_ =
         (auVar145._16_4_ * fStack_2d0 + fStack_250 * fVar218) * auVar145._16_4_ + fVar218 * fVar271
    ;
    auVar257._20_4_ =
         (auVar145._20_4_ * fStack_2cc + fStack_24c * fVar129) * auVar145._20_4_ + fVar129 * fVar273
    ;
    auVar257._24_4_ =
         (auVar145._24_4_ * fStack_2c8 + fStack_248 * fVar219) * auVar145._24_4_ + fVar219 * fVar275
    ;
    auVar257._28_4_ = fVar410 + fVar416 + local_760._28_4_;
    auVar420._0_4_ = auVar338._0_4_ * fVar192 + auVar145._0_4_ * auVar286._0_4_;
    auVar420._4_4_ = auVar338._4_4_ * fVar101 + auVar145._4_4_ * auVar286._4_4_;
    auVar420._8_4_ = auVar338._8_4_ * fVar217 + auVar145._8_4_ * auVar286._8_4_;
    auVar420._12_4_ = auVar338._12_4_ * fVar102 + auVar145._12_4_ * auVar286._12_4_;
    auVar420._16_4_ = auVar338._16_4_ * fVar218 + auVar145._16_4_ * auVar286._16_4_;
    auVar420._20_4_ = auVar338._20_4_ * fVar129 + auVar145._20_4_ * auVar286._20_4_;
    auVar420._24_4_ = auVar338._24_4_ * fVar219 + auVar145._24_4_ * auVar286._24_4_;
    auVar420._28_4_ = fVar410 + fStack_244;
    local_620._0_4_ = auVar345._0_4_ * fVar192 + auVar145._0_4_ * auVar212._0_4_;
    local_620._4_4_ = auVar345._4_4_ * fVar101 + auVar145._4_4_ * auVar212._4_4_;
    local_620._8_4_ = auVar345._8_4_ * fVar217 + auVar145._8_4_ * auVar212._8_4_;
    local_620._12_4_ = auVar345._12_4_ * fVar102 + auVar145._12_4_ * auVar212._12_4_;
    local_620._16_4_ = auVar345._16_4_ * fVar218 + auVar145._16_4_ * auVar212._16_4_;
    local_620._20_4_ = auVar345._20_4_ * fVar129 + auVar145._20_4_ * auVar212._20_4_;
    local_620._24_4_ = auVar345._24_4_ * fVar219 + auVar145._24_4_ * auVar212._24_4_;
    local_620._28_4_ = fStack_244 + fVar395;
    local_600._0_4_ = auVar364._0_4_ * fVar192 + auVar145._0_4_ * auVar238._0_4_;
    local_600._4_4_ = auVar364._4_4_ * fVar101 + auVar145._4_4_ * auVar238._4_4_;
    local_600._8_4_ = auVar364._8_4_ * fVar217 + auVar145._8_4_ * auVar238._8_4_;
    local_600._12_4_ = auVar364._12_4_ * fVar102 + auVar145._12_4_ * auVar238._12_4_;
    local_600._16_4_ = auVar364._16_4_ * fVar218 + auVar145._16_4_ * auVar238._16_4_;
    local_600._20_4_ = auVar364._20_4_ * fVar129 + auVar145._20_4_ * auVar238._20_4_;
    local_600._24_4_ = auVar364._24_4_ * fVar219 + auVar145._24_4_ * auVar238._24_4_;
    local_600._28_4_ = fVar395 + fStack_244;
    local_b80 = auVar30._0_4_;
    local_700._0_4_ = fVar192 * auVar303._0_4_ + auVar145._0_4_ * auVar257._0_4_;
    local_700._4_4_ = fVar101 * auVar303._4_4_ + auVar145._4_4_ * auVar257._4_4_;
    local_700._8_4_ = fVar217 * auVar303._8_4_ + auVar145._8_4_ * auVar257._8_4_;
    local_700._12_4_ = fVar102 * auVar303._12_4_ + auVar145._12_4_ * auVar257._12_4_;
    local_700._16_4_ = fVar218 * auVar303._16_4_ + auVar145._16_4_ * auVar257._16_4_;
    local_700._20_4_ = fVar129 * auVar303._20_4_ + auVar145._20_4_ * auVar257._20_4_;
    local_700._24_4_ = fVar219 * auVar303._24_4_ + auVar145._24_4_ * auVar257._24_4_;
    local_700._28_4_ = auVar116._28_4_ + auVar145._28_4_;
    auVar116 = vsubps_avx(auVar286,auVar338);
    auVar147 = vsubps_avx(auVar212,auVar345);
    auVar27 = vsubps_avx(auVar238,auVar364);
    auVar28 = vsubps_avx(auVar257,auVar303);
    auVar200 = vshufps_avx(ZEXT416((uint)(local_b80 * 0.04761905)),
                           ZEXT416((uint)(local_b80 * 0.04761905)),0);
    fVar192 = auVar200._0_4_;
    fVar359 = fVar192 * auVar116._0_4_ * 3.0;
    fVar101 = auVar200._4_4_;
    fVar369 = fVar101 * auVar116._4_4_ * 3.0;
    local_ac0._4_4_ = fVar369;
    local_ac0._0_4_ = fVar359;
    fVar217 = auVar200._8_4_;
    fVar370 = fVar217 * auVar116._8_4_ * 3.0;
    local_ac0._8_4_ = fVar370;
    fVar102 = auVar200._12_4_;
    fVar371 = fVar102 * auVar116._12_4_ * 3.0;
    local_ac0._12_4_ = fVar371;
    fVar372 = fVar192 * auVar116._16_4_ * 3.0;
    local_ac0._16_4_ = fVar372;
    fVar373 = fVar101 * auVar116._20_4_ * 3.0;
    local_ac0._20_4_ = fVar373;
    fVar374 = fVar217 * auVar116._24_4_ * 3.0;
    local_ac0._24_4_ = fVar374;
    local_ac0._28_4_ = auVar364._28_4_;
    fVar340 = fVar192 * auVar147._0_4_ * 3.0;
    fVar353 = fVar101 * auVar147._4_4_ * 3.0;
    local_800._4_4_ = fVar353;
    local_800._0_4_ = fVar340;
    fVar354 = fVar217 * auVar147._8_4_ * 3.0;
    local_800._8_4_ = fVar354;
    fVar355 = fVar102 * auVar147._12_4_ * 3.0;
    local_800._12_4_ = fVar355;
    fVar356 = fVar192 * auVar147._16_4_ * 3.0;
    local_800._16_4_ = fVar356;
    fVar357 = fVar101 * auVar147._20_4_ * 3.0;
    local_800._20_4_ = fVar357;
    fVar358 = fVar217 * auVar147._24_4_ * 3.0;
    local_800._24_4_ = fVar358;
    local_800._28_4_ = auVar345._28_4_;
    fVar375 = fVar192 * auVar27._0_4_ * 3.0;
    fVar383 = fVar101 * auVar27._4_4_ * 3.0;
    local_a60._4_4_ = fVar383;
    local_a60._0_4_ = fVar375;
    fVar385 = fVar217 * auVar27._8_4_ * 3.0;
    local_a60._8_4_ = fVar385;
    fVar387 = fVar102 * auVar27._12_4_ * 3.0;
    local_a60._12_4_ = fVar387;
    fVar389 = fVar192 * auVar27._16_4_ * 3.0;
    local_a60._16_4_ = fVar389;
    fVar391 = fVar101 * auVar27._20_4_ * 3.0;
    local_a60._20_4_ = fVar391;
    fVar393 = fVar217 * auVar27._24_4_ * 3.0;
    local_a60._24_4_ = fVar393;
    local_a60._28_4_ = fVar395;
    auVar118._0_4_ = fVar192 * auVar28._0_4_ * 3.0;
    auVar118._4_4_ = fVar101 * auVar28._4_4_ * 3.0;
    auVar118._8_4_ = fVar217 * auVar28._8_4_ * 3.0;
    auVar118._12_4_ = fVar102 * auVar28._12_4_ * 3.0;
    auVar118._16_4_ = fVar192 * auVar28._16_4_ * 3.0;
    auVar118._20_4_ = fVar101 * auVar28._20_4_ * 3.0;
    auVar118._24_4_ = fVar217 * auVar28._24_4_ * 3.0;
    auVar118._28_4_ = 0;
    auVar116 = vperm2f128_avx(local_620,local_620,1);
    auVar116 = vshufps_avx(auVar116,local_620,0x30);
    local_aa0 = vshufps_avx(local_620,auVar116,0x29);
    auVar116 = vperm2f128_avx(local_600,local_600,1);
    auVar116 = vshufps_avx(auVar116,local_600,0x30);
    _local_a00 = vshufps_avx(local_600,auVar116,0x29);
    auVar147 = vsubps_avx(local_700,auVar118);
    auVar116 = vperm2f128_avx(auVar147,auVar147,1);
    auVar116 = vshufps_avx(auVar116,auVar147,0x30);
    auVar28 = vshufps_avx(auVar147,auVar116,0x29);
    local_320 = vsubps_avx(local_aa0,local_620);
    local_300 = vsubps_avx(_local_a00,local_600);
    fVar101 = local_320._0_4_;
    fVar129 = local_320._4_4_;
    auVar40._4_4_ = fVar383 * fVar129;
    auVar40._0_4_ = fVar375 * fVar101;
    fVar221 = local_320._8_4_;
    auVar40._8_4_ = fVar385 * fVar221;
    fVar244 = local_320._12_4_;
    auVar40._12_4_ = fVar387 * fVar244;
    fVar248 = local_320._16_4_;
    auVar40._16_4_ = fVar389 * fVar248;
    fVar268 = local_320._20_4_;
    auVar40._20_4_ = fVar391 * fVar268;
    fVar267 = local_320._24_4_;
    auVar40._24_4_ = fVar393 * fVar267;
    auVar40._28_4_ = auVar147._28_4_;
    fVar217 = local_300._0_4_;
    fVar219 = local_300._4_4_;
    auVar41._4_4_ = fVar353 * fVar219;
    auVar41._0_4_ = fVar340 * fVar217;
    fVar222 = local_300._8_4_;
    auVar41._8_4_ = fVar354 * fVar222;
    fVar245 = local_300._12_4_;
    auVar41._12_4_ = fVar355 * fVar245;
    fVar249 = local_300._16_4_;
    auVar41._16_4_ = fVar356 * fVar249;
    fVar270 = local_300._20_4_;
    auVar41._20_4_ = fVar357 * fVar270;
    fVar269 = local_300._24_4_;
    auVar41._24_4_ = fVar358 * fVar269;
    auVar41._28_4_ = auVar116._28_4_;
    auVar27 = vsubps_avx(auVar41,auVar40);
    auVar116 = vperm2f128_avx(auVar420,auVar420,1);
    auVar116 = vshufps_avx(auVar116,auVar420,0x30);
    local_8e0 = vshufps_avx(auVar420,auVar116,0x29);
    local_340 = vsubps_avx(local_8e0,auVar420);
    auVar42._4_4_ = fVar369 * fVar219;
    auVar42._0_4_ = fVar359 * fVar217;
    auVar42._8_4_ = fVar370 * fVar222;
    auVar42._12_4_ = fVar371 * fVar245;
    auVar42._16_4_ = fVar372 * fVar249;
    auVar42._20_4_ = fVar373 * fVar270;
    auVar42._24_4_ = fVar374 * fVar269;
    auVar42._28_4_ = local_8e0._28_4_;
    fVar102 = local_340._0_4_;
    fVar103 = local_340._4_4_;
    auVar43._4_4_ = fVar383 * fVar103;
    auVar43._0_4_ = fVar375 * fVar102;
    fVar223 = local_340._8_4_;
    auVar43._8_4_ = fVar385 * fVar223;
    fVar246 = local_340._12_4_;
    auVar43._12_4_ = fVar387 * fVar246;
    fVar265 = local_340._16_4_;
    auVar43._16_4_ = fVar389 * fVar265;
    fVar272 = local_340._20_4_;
    auVar43._20_4_ = fVar391 * fVar272;
    fVar271 = local_340._24_4_;
    auVar43._24_4_ = fVar393 * fVar271;
    auVar43._28_4_ = local_aa0._28_4_;
    auVar175 = vsubps_avx(auVar43,auVar42);
    auVar44._4_4_ = fVar353 * fVar103;
    auVar44._0_4_ = fVar340 * fVar102;
    auVar44._8_4_ = fVar354 * fVar223;
    auVar44._12_4_ = fVar355 * fVar246;
    auVar44._16_4_ = fVar356 * fVar265;
    auVar44._20_4_ = fVar357 * fVar272;
    auVar44._24_4_ = fVar358 * fVar271;
    auVar44._28_4_ = local_aa0._28_4_;
    auVar45._4_4_ = fVar369 * fVar129;
    auVar45._0_4_ = fVar359 * fVar101;
    auVar45._8_4_ = fVar370 * fVar221;
    auVar45._12_4_ = fVar371 * fVar244;
    auVar45._16_4_ = fVar372 * fVar248;
    auVar45._20_4_ = fVar373 * fVar268;
    auVar45._24_4_ = fVar374 * fVar267;
    auVar45._28_4_ = auVar338._28_4_;
    auVar29 = vsubps_avx(auVar45,auVar44);
    fVar192 = auVar29._28_4_;
    fVar218 = auVar175._28_4_ + fVar192;
    auVar213._0_4_ = fVar102 * fVar102 + fVar101 * fVar101 + fVar217 * fVar217;
    auVar213._4_4_ = fVar103 * fVar103 + fVar129 * fVar129 + fVar219 * fVar219;
    auVar213._8_4_ = fVar223 * fVar223 + fVar221 * fVar221 + fVar222 * fVar222;
    auVar213._12_4_ = fVar246 * fVar246 + fVar244 * fVar244 + fVar245 * fVar245;
    auVar213._16_4_ = fVar265 * fVar265 + fVar248 * fVar248 + fVar249 * fVar249;
    auVar213._20_4_ = fVar272 * fVar272 + fVar268 * fVar268 + fVar270 * fVar270;
    auVar213._24_4_ = fVar271 * fVar271 + fVar267 * fVar267 + fVar269 * fVar269;
    auVar213._28_4_ = fVar192 + fVar192 + fVar218;
    auVar116 = vrcpps_avx(auVar213);
    fVar220 = auVar116._0_4_;
    fVar191 = auVar116._4_4_;
    auVar46._4_4_ = fVar191 * auVar213._4_4_;
    auVar46._0_4_ = fVar220 * auVar213._0_4_;
    fVar247 = auVar116._8_4_;
    auVar46._8_4_ = fVar247 * auVar213._8_4_;
    fVar266 = auVar116._12_4_;
    auVar46._12_4_ = fVar266 * auVar213._12_4_;
    fVar274 = auVar116._16_4_;
    auVar46._16_4_ = fVar274 * auVar213._16_4_;
    fVar273 = auVar116._20_4_;
    auVar46._20_4_ = fVar273 * auVar213._20_4_;
    fVar275 = auVar116._24_4_;
    auVar46._24_4_ = fVar275 * auVar213._24_4_;
    auVar46._28_4_ = auVar338._28_4_;
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar349 = vsubps_avx(auVar119,auVar46);
    fVar220 = auVar349._0_4_ * fVar220 + fVar220;
    fVar191 = auVar349._4_4_ * fVar191 + fVar191;
    fVar247 = auVar349._8_4_ * fVar247 + fVar247;
    fVar266 = auVar349._12_4_ * fVar266 + fVar266;
    fVar274 = auVar349._16_4_ * fVar274 + fVar274;
    fVar273 = auVar349._20_4_ * fVar273 + fVar273;
    fVar275 = auVar349._24_4_ * fVar275 + fVar275;
    auVar147 = vperm2f128_avx(local_800,local_800,1);
    auVar147 = vshufps_avx(auVar147,local_800,0x30);
    local_ae0 = vshufps_avx(local_800,auVar147,0x29);
    auVar147 = vperm2f128_avx(local_a60,local_a60,1);
    auVar147 = vshufps_avx(auVar147,local_a60,0x30);
    local_820 = vshufps_avx(local_a60,auVar147,0x29);
    fVar277 = local_820._0_4_;
    fVar291 = local_820._4_4_;
    auVar47._4_4_ = fVar291 * fVar129;
    auVar47._0_4_ = fVar277 * fVar101;
    fVar292 = local_820._8_4_;
    auVar47._8_4_ = fVar292 * fVar221;
    fVar293 = local_820._12_4_;
    auVar47._12_4_ = fVar293 * fVar244;
    fVar294 = local_820._16_4_;
    auVar47._16_4_ = fVar294 * fVar248;
    fVar295 = local_820._20_4_;
    auVar47._20_4_ = fVar295 * fVar268;
    fVar296 = local_820._24_4_;
    auVar47._24_4_ = fVar296 * fVar267;
    auVar47._28_4_ = auVar147._28_4_;
    fVar416 = local_ae0._0_4_;
    fVar410 = local_ae0._4_4_;
    auVar48._4_4_ = fVar410 * fVar219;
    auVar48._0_4_ = fVar416 * fVar217;
    fVar158 = local_ae0._8_4_;
    auVar48._8_4_ = fVar158 * fVar222;
    fVar161 = local_ae0._12_4_;
    auVar48._12_4_ = fVar161 * fVar245;
    fVar162 = local_ae0._16_4_;
    auVar48._16_4_ = fVar162 * fVar249;
    fVar163 = local_ae0._20_4_;
    auVar48._20_4_ = fVar163 * fVar270;
    fVar164 = local_ae0._24_4_;
    auVar48._24_4_ = fVar164 * fVar269;
    auVar48._28_4_ = auVar345._28_4_;
    auVar260 = vsubps_avx(auVar48,auVar47);
    auVar147 = vperm2f128_avx(local_ac0,local_ac0,1);
    auVar147 = vshufps_avx(auVar147,local_ac0,0x30);
    local_a80 = vshufps_avx(local_ac0,auVar147,0x29);
    fVar376 = local_a80._0_4_;
    fVar384 = local_a80._4_4_;
    auVar49._4_4_ = fVar384 * fVar219;
    auVar49._0_4_ = fVar376 * fVar217;
    fVar386 = local_a80._8_4_;
    auVar49._8_4_ = fVar386 * fVar222;
    fVar388 = local_a80._12_4_;
    auVar49._12_4_ = fVar388 * fVar245;
    fVar390 = local_a80._16_4_;
    auVar49._16_4_ = fVar390 * fVar249;
    fVar392 = local_a80._20_4_;
    auVar49._20_4_ = fVar392 * fVar270;
    fVar394 = local_a80._24_4_;
    auVar49._24_4_ = fVar394 * fVar269;
    auVar49._28_4_ = auVar147._28_4_;
    auVar114 = local_820;
    auVar50._4_4_ = fVar291 * fVar103;
    auVar50._0_4_ = fVar277 * fVar102;
    auVar50._8_4_ = fVar292 * fVar223;
    auVar50._12_4_ = fVar293 * fVar246;
    auVar50._16_4_ = fVar294 * fVar265;
    auVar50._20_4_ = fVar295 * fVar272;
    auVar50._24_4_ = fVar296 * fVar271;
    auVar50._28_4_ = auVar364._28_4_;
    auVar214 = vsubps_avx(auVar50,auVar49);
    auVar39 = local_ae0;
    auVar51._4_4_ = fVar410 * fVar103;
    auVar51._0_4_ = fVar416 * fVar102;
    auVar51._8_4_ = fVar158 * fVar223;
    auVar51._12_4_ = fVar161 * fVar246;
    auVar51._16_4_ = fVar162 * fVar265;
    auVar51._20_4_ = fVar163 * fVar272;
    auVar51._24_4_ = fVar164 * fVar271;
    auVar51._28_4_ = auVar364._28_4_;
    auVar52._4_4_ = fVar384 * fVar129;
    auVar52._0_4_ = fVar376 * fVar101;
    auVar52._8_4_ = fVar386 * fVar221;
    auVar52._12_4_ = fVar388 * fVar244;
    auVar52._16_4_ = fVar390 * fVar248;
    auVar52._20_4_ = fVar392 * fVar268;
    fVar192 = local_a80._28_4_;
    auVar52._24_4_ = fVar394 * fVar267;
    auVar52._28_4_ = fVar192;
    auVar348 = vsubps_avx(auVar52,auVar51);
    auVar53._4_4_ =
         (auVar27._4_4_ * auVar27._4_4_ +
         auVar175._4_4_ * auVar175._4_4_ + auVar29._4_4_ * auVar29._4_4_) * fVar191;
    auVar53._0_4_ =
         (auVar27._0_4_ * auVar27._0_4_ +
         auVar175._0_4_ * auVar175._0_4_ + auVar29._0_4_ * auVar29._0_4_) * fVar220;
    auVar53._8_4_ =
         (auVar27._8_4_ * auVar27._8_4_ +
         auVar175._8_4_ * auVar175._8_4_ + auVar29._8_4_ * auVar29._8_4_) * fVar247;
    auVar53._12_4_ =
         (auVar27._12_4_ * auVar27._12_4_ +
         auVar175._12_4_ * auVar175._12_4_ + auVar29._12_4_ * auVar29._12_4_) * fVar266;
    auVar53._16_4_ =
         (auVar27._16_4_ * auVar27._16_4_ +
         auVar175._16_4_ * auVar175._16_4_ + auVar29._16_4_ * auVar29._16_4_) * fVar274;
    auVar53._20_4_ =
         (auVar27._20_4_ * auVar27._20_4_ +
         auVar175._20_4_ * auVar175._20_4_ + auVar29._20_4_ * auVar29._20_4_) * fVar273;
    auVar53._24_4_ =
         (auVar27._24_4_ * auVar27._24_4_ +
         auVar175._24_4_ * auVar175._24_4_ + auVar29._24_4_ * auVar29._24_4_) * fVar275;
    auVar53._28_4_ = auVar27._28_4_ + fVar218;
    auVar54._4_4_ =
         (auVar260._4_4_ * auVar260._4_4_ +
         auVar214._4_4_ * auVar214._4_4_ + auVar348._4_4_ * auVar348._4_4_) * fVar191;
    auVar54._0_4_ =
         (auVar260._0_4_ * auVar260._0_4_ +
         auVar214._0_4_ * auVar214._0_4_ + auVar348._0_4_ * auVar348._0_4_) * fVar220;
    auVar54._8_4_ =
         (auVar260._8_4_ * auVar260._8_4_ +
         auVar214._8_4_ * auVar214._8_4_ + auVar348._8_4_ * auVar348._8_4_) * fVar247;
    auVar54._12_4_ =
         (auVar260._12_4_ * auVar260._12_4_ +
         auVar214._12_4_ * auVar214._12_4_ + auVar348._12_4_ * auVar348._12_4_) * fVar266;
    auVar54._16_4_ =
         (auVar260._16_4_ * auVar260._16_4_ +
         auVar214._16_4_ * auVar214._16_4_ + auVar348._16_4_ * auVar348._16_4_) * fVar274;
    auVar54._20_4_ =
         (auVar260._20_4_ * auVar260._20_4_ +
         auVar214._20_4_ * auVar214._20_4_ + auVar348._20_4_ * auVar348._20_4_) * fVar273;
    auVar54._24_4_ =
         (auVar260._24_4_ * auVar260._24_4_ +
         auVar214._24_4_ * auVar214._24_4_ + auVar348._24_4_ * auVar348._24_4_) * fVar275;
    auVar54._28_4_ = auVar349._28_4_ + auVar116._28_4_;
    auVar116 = vmaxps_avx(auVar53,auVar54);
    auVar147 = vperm2f128_avx(local_700,local_700,1);
    auVar147 = vshufps_avx(auVar147,local_700,0x30);
    _local_780 = vshufps_avx(local_700,auVar147,0x29);
    local_7a0._0_4_ = (float)local_700._0_4_ + auVar118._0_4_;
    local_7a0._4_4_ = local_700._4_4_ + auVar118._4_4_;
    fStack_798 = local_700._8_4_ + auVar118._8_4_;
    fStack_794 = local_700._12_4_ + auVar118._12_4_;
    fStack_790 = local_700._16_4_ + auVar118._16_4_;
    fStack_78c = local_700._20_4_ + auVar118._20_4_;
    fStack_788 = local_700._24_4_ + auVar118._24_4_;
    fStack_784 = local_700._28_4_ + 0.0;
    auVar147 = vmaxps_avx(local_700,_local_7a0);
    auVar27 = vmaxps_avx(auVar28,_local_780);
    auVar147 = vmaxps_avx(auVar147,auVar27);
    auVar27 = vrsqrtps_avx(auVar213);
    fVar218 = auVar27._0_4_;
    fVar220 = auVar27._4_4_;
    fVar191 = auVar27._8_4_;
    fVar247 = auVar27._12_4_;
    fVar266 = auVar27._16_4_;
    fVar274 = auVar27._20_4_;
    fVar273 = auVar27._24_4_;
    local_4e0 = fVar218 * 1.5 + fVar218 * fVar218 * fVar218 * auVar213._0_4_ * -0.5;
    fStack_4dc = fVar220 * 1.5 + fVar220 * fVar220 * fVar220 * auVar213._4_4_ * -0.5;
    fStack_4d8 = fVar191 * 1.5 + fVar191 * fVar191 * fVar191 * auVar213._8_4_ * -0.5;
    fStack_4d4 = fVar247 * 1.5 + fVar247 * fVar247 * fVar247 * auVar213._12_4_ * -0.5;
    fStack_4d0 = fVar266 * 1.5 + fVar266 * fVar266 * fVar266 * auVar213._16_4_ * -0.5;
    fStack_4cc = fVar274 * 1.5 + fVar274 * fVar274 * fVar274 * auVar213._20_4_ * -0.5;
    fStack_4c8 = fVar273 * 1.5 + fVar273 * fVar273 * fVar273 * auVar213._24_4_ * -0.5;
    _local_b00 = vsubps_avx(ZEXT832(0) << 0x20,local_620);
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    fVar396 = local_9a0._0_4_;
    fVar404 = local_9a0._4_4_;
    fVar405 = local_9a0._8_4_;
    fVar406 = local_9a0._12_4_;
    fVar407 = local_9a0._16_4_;
    fVar408 = local_9a0._20_4_;
    fVar409 = local_9a0._24_4_;
    fVar316 = local_b00._0_4_;
    fVar325 = local_b00._4_4_;
    fVar326 = local_b00._8_4_;
    fVar327 = local_b00._12_4_;
    fVar328 = local_b00._16_4_;
    fVar329 = local_b00._20_4_;
    fVar330 = local_b00._24_4_;
    auVar175 = vsubps_avx(ZEXT832(0) << 0x20,auVar420);
    fVar218 = auVar175._0_4_;
    fVar220 = auVar175._4_4_;
    fVar191 = auVar175._8_4_;
    fVar247 = auVar175._12_4_;
    fVar266 = auVar175._16_4_;
    fVar274 = auVar175._20_4_;
    fVar273 = auVar175._24_4_;
    auVar346._0_4_ = local_460 * fVar218 + fVar316 * local_720 + fVar396 * local_740;
    auVar346._4_4_ = fStack_45c * fVar220 + fVar325 * fStack_71c + fVar404 * fStack_73c;
    auVar346._8_4_ = fStack_458 * fVar191 + fVar326 * fStack_718 + fVar405 * fStack_738;
    auVar346._12_4_ = fStack_454 * fVar247 + fVar327 * fStack_714 + fVar406 * fStack_734;
    auVar346._16_4_ = fStack_450 * fVar266 + fVar328 * fStack_710 + fVar407 * fStack_730;
    auVar346._20_4_ = fStack_44c * fVar274 + fVar329 * fStack_70c + fVar408 * fStack_72c;
    auVar346._24_4_ = fStack_448 * fVar273 + fVar330 * fStack_708 + fVar409 * fStack_728;
    auVar346._28_4_ = auVar214._28_4_ + auVar348._28_4_ + auVar27._28_4_ + 0.0;
    auVar365._0_4_ = fVar218 * fVar218 + fVar316 * fVar316 + fVar396 * fVar396;
    auVar365._4_4_ = fVar220 * fVar220 + fVar325 * fVar325 + fVar404 * fVar404;
    auVar365._8_4_ = fVar191 * fVar191 + fVar326 * fVar326 + fVar405 * fVar405;
    auVar365._12_4_ = fVar247 * fVar247 + fVar327 * fVar327 + fVar406 * fVar406;
    auVar365._16_4_ = fVar266 * fVar266 + fVar328 * fVar328 + fVar407 * fVar407;
    auVar365._20_4_ = fVar274 * fVar274 + fVar329 * fVar329 + fVar408 * fVar408;
    auVar365._24_4_ = fVar273 * fVar273 + fVar330 * fVar330 + fVar409 * fVar409;
    auVar365._28_4_ = fVar192 + fVar192 + 0.0;
    fVar192 = local_320._28_4_;
    fVar276 = fVar192 + local_300._28_4_;
    fVar275 = local_340._28_4_;
    local_500 = local_460 * local_4e0 * fVar102 +
                local_4e0 * fVar101 * local_720 + local_4e0 * fVar217 * local_740;
    fStack_4fc = fStack_45c * fStack_4dc * fVar103 +
                 fStack_4dc * fVar129 * fStack_71c + fStack_4dc * fVar219 * fStack_73c;
    fStack_4f8 = fStack_458 * fStack_4d8 * fVar223 +
                 fStack_4d8 * fVar221 * fStack_718 + fStack_4d8 * fVar222 * fStack_738;
    fStack_4f4 = fStack_454 * fStack_4d4 * fVar246 +
                 fStack_4d4 * fVar244 * fStack_714 + fStack_4d4 * fVar245 * fStack_734;
    fStack_4f0 = fStack_450 * fStack_4d0 * fVar265 +
                 fStack_4d0 * fVar248 * fStack_710 + fStack_4d0 * fVar249 * fStack_730;
    fStack_4ec = fStack_44c * fStack_4cc * fVar272 +
                 fStack_4cc * fVar268 * fStack_70c + fStack_4cc * fVar270 * fStack_72c;
    fStack_4e8 = fStack_448 * fStack_4c8 * fVar271 +
                 fStack_4c8 * fVar267 * fStack_708 + fStack_4c8 * fVar269 * fStack_728;
    fStack_4e4 = fVar275 + fVar276;
    fVar276 = fVar275 + fVar276;
    local_6a0._0_4_ =
         fVar218 * local_4e0 * fVar102 +
         fVar316 * local_4e0 * fVar101 + fVar396 * local_4e0 * fVar217;
    local_6a0._4_4_ =
         fVar220 * fStack_4dc * fVar103 +
         fVar325 * fStack_4dc * fVar129 + fVar404 * fStack_4dc * fVar219;
    fStack_698 = fVar191 * fStack_4d8 * fVar223 +
                 fVar326 * fStack_4d8 * fVar221 + fVar405 * fStack_4d8 * fVar222;
    fStack_694 = fVar247 * fStack_4d4 * fVar246 +
                 fVar327 * fStack_4d4 * fVar244 + fVar406 * fStack_4d4 * fVar245;
    fStack_690 = fVar266 * fStack_4d0 * fVar265 +
                 fVar328 * fStack_4d0 * fVar248 + fVar407 * fStack_4d0 * fVar249;
    fStack_68c = fVar274 * fStack_4cc * fVar272 +
                 fVar329 * fStack_4cc * fVar268 + fVar408 * fStack_4cc * fVar270;
    fStack_688 = fVar273 * fStack_4c8 * fVar271 +
                 fVar330 * fStack_4c8 * fVar267 + fVar409 * fStack_4c8 * fVar269;
    fStack_684 = fVar192 + fVar276;
    auVar55._4_4_ = (float)local_6a0._4_4_ * fStack_4fc;
    auVar55._0_4_ = (float)local_6a0._0_4_ * local_500;
    auVar55._8_4_ = fStack_698 * fStack_4f8;
    auVar55._12_4_ = fStack_694 * fStack_4f4;
    auVar55._16_4_ = fStack_690 * fStack_4f0;
    auVar55._20_4_ = fStack_68c * fStack_4ec;
    auVar55._24_4_ = fStack_688 * fStack_4e8;
    auVar55._28_4_ = fVar276;
    auVar175 = vsubps_avx(auVar346,auVar55);
    auVar56._4_4_ = (float)local_6a0._4_4_ * (float)local_6a0._4_4_;
    auVar56._0_4_ = (float)local_6a0._0_4_ * (float)local_6a0._0_4_;
    auVar56._8_4_ = fStack_698 * fStack_698;
    auVar56._12_4_ = fStack_694 * fStack_694;
    auVar56._16_4_ = fStack_690 * fStack_690;
    auVar56._20_4_ = fStack_68c * fStack_68c;
    auVar56._24_4_ = fStack_688 * fStack_688;
    auVar56._28_4_ = fVar192;
    local_8c0 = vsubps_avx(auVar365,auVar56);
    local_7c0 = vsqrtps_avx(auVar116);
    fVar192 = (auVar147._0_4_ + local_7c0._0_4_) * 1.0000002;
    fVar276 = (auVar147._4_4_ + local_7c0._4_4_) * 1.0000002;
    fVar184 = (auVar147._8_4_ + local_7c0._8_4_) * 1.0000002;
    fVar185 = (auVar147._12_4_ + local_7c0._12_4_) * 1.0000002;
    fVar187 = (auVar147._16_4_ + local_7c0._16_4_) * 1.0000002;
    fVar188 = (auVar147._20_4_ + local_7c0._20_4_) * 1.0000002;
    fVar190 = (auVar147._24_4_ + local_7c0._24_4_) * 1.0000002;
    auVar57._4_4_ = fVar276 * fVar276;
    auVar57._0_4_ = fVar192 * fVar192;
    auVar57._8_4_ = fVar184 * fVar184;
    auVar57._12_4_ = fVar185 * fVar185;
    auVar57._16_4_ = fVar187 * fVar187;
    auVar57._20_4_ = fVar188 * fVar188;
    auVar57._24_4_ = fVar190 * fVar190;
    auVar57._28_4_ = auVar147._28_4_ + local_7c0._28_4_;
    local_400._0_4_ = auVar175._0_4_ + auVar175._0_4_;
    local_400._4_4_ = auVar175._4_4_ + auVar175._4_4_;
    local_400._8_4_ = auVar175._8_4_ + auVar175._8_4_;
    local_400._12_4_ = auVar175._12_4_ + auVar175._12_4_;
    local_400._16_4_ = auVar175._16_4_ + auVar175._16_4_;
    local_400._20_4_ = auVar175._20_4_ + auVar175._20_4_;
    local_400._24_4_ = auVar175._24_4_ + auVar175._24_4_;
    fVar192 = auVar175._28_4_;
    local_400._28_4_ = fVar192 + fVar192;
    auVar147 = vsubps_avx(local_8c0,auVar57);
    fVar276 = 0.0;
    auVar58._4_4_ = fStack_4fc * fStack_4fc;
    auVar58._0_4_ = local_500 * local_500;
    auVar58._8_4_ = fStack_4f8 * fStack_4f8;
    auVar58._12_4_ = fStack_4f4 * fStack_4f4;
    auVar58._16_4_ = fStack_4f0 * fStack_4f0;
    auVar58._20_4_ = fStack_4ec * fStack_4ec;
    auVar58._24_4_ = fStack_4e8 * fStack_4e8;
    auVar58._28_4_ = fVar192;
    auVar175 = vsubps_avx(local_1e0,auVar58);
    local_5c0._4_4_ = local_400._4_4_ * local_400._4_4_;
    local_5c0._0_4_ = local_400._0_4_ * local_400._0_4_;
    local_5c0._8_4_ = local_400._8_4_ * local_400._8_4_;
    local_5c0._12_4_ = local_400._12_4_ * local_400._12_4_;
    local_5c0._16_4_ = local_400._16_4_ * local_400._16_4_;
    local_5c0._20_4_ = local_400._20_4_ * local_400._20_4_;
    local_5c0._24_4_ = local_400._24_4_ * local_400._24_4_;
    local_5c0._28_4_ = local_1e0._28_4_;
    fVar192 = auVar175._0_4_;
    local_5e0._0_4_ = fVar192 * 4.0;
    fVar184 = auVar175._4_4_;
    local_5e0._4_4_ = fVar184 * 4.0;
    fVar185 = auVar175._8_4_;
    fStack_5d8 = fVar185 * 4.0;
    fVar187 = auVar175._12_4_;
    fStack_5d4 = fVar187 * 4.0;
    fVar188 = auVar175._16_4_;
    fStack_5d0 = fVar188 * 4.0;
    fVar190 = auVar175._20_4_;
    fStack_5cc = fVar190 * 4.0;
    fVar297 = auVar175._24_4_;
    fStack_5c8 = fVar297 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar59._4_4_ = auVar147._4_4_ * (float)local_5e0._4_4_;
    auVar59._0_4_ = auVar147._0_4_ * (float)local_5e0._0_4_;
    auVar59._8_4_ = auVar147._8_4_ * fStack_5d8;
    auVar59._12_4_ = auVar147._12_4_ * fStack_5d4;
    auVar59._16_4_ = auVar147._16_4_ * fStack_5d0;
    auVar59._20_4_ = auVar147._20_4_ * fStack_5cc;
    auVar59._24_4_ = auVar147._24_4_ * fStack_5c8;
    auVar59._28_4_ = 0x40800000;
    auVar29 = vsubps_avx(local_5c0,auVar59);
    auVar116 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
    auVar120._8_4_ = 0x7fffffff;
    auVar120._0_8_ = 0x7fffffff7fffffff;
    auVar120._12_4_ = 0x7fffffff;
    auVar120._16_4_ = 0x7fffffff;
    auVar120._20_4_ = 0x7fffffff;
    auVar120._24_4_ = 0x7fffffff;
    auVar120._28_4_ = 0x7fffffff;
    local_360 = vandps_avx(auVar58,auVar120);
    local_8a0._0_4_ = fVar192 + fVar192;
    local_8a0._4_4_ = fVar184 + fVar184;
    local_8a0._8_4_ = fVar185 + fVar185;
    local_8a0._12_4_ = fVar187 + fVar187;
    local_8a0._16_4_ = fVar188 + fVar188;
    local_8a0._20_4_ = fVar190 + fVar190;
    local_8a0._24_4_ = fVar297 + fVar297;
    local_8a0._28_4_ = auVar175._28_4_ + auVar175._28_4_;
    local_3e0 = vandps_avx(auVar175,auVar120);
    uVar93 = CONCAT44(local_400._4_4_,local_400._0_4_);
    local_420._0_8_ = uVar93 ^ 0x8000000080000000;
    local_420._8_4_ = -local_400._8_4_;
    local_420._12_4_ = -local_400._12_4_;
    local_420._16_4_ = -local_400._16_4_;
    local_420._20_4_ = -local_400._20_4_;
    local_420._24_4_ = -local_400._24_4_;
    local_420._28_4_ = -local_400._28_4_;
    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar116 >> 0x7f,0) == '\0') &&
          (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar116 >> 0xbf,0) == '\0') &&
        (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar116[0x1f])
    {
      auVar339._8_4_ = 0x7f800000;
      auVar339._0_8_ = 0x7f8000007f800000;
      auVar339._12_4_ = 0x7f800000;
      auVar339._16_4_ = 0x7f800000;
      auVar339._20_4_ = 0x7f800000;
      auVar339._24_4_ = 0x7f800000;
      auVar339._28_4_ = 0x7f800000;
      auVar414._8_4_ = 0xff800000;
      auVar414._0_8_ = 0xff800000ff800000;
      auVar414._12_4_ = 0xff800000;
      auVar414._16_4_ = 0xff800000;
      auVar414._20_4_ = 0xff800000;
      auVar414._24_4_ = 0xff800000;
      auVar414._28_4_ = 0xff800000;
    }
    else {
      auVar260 = vsqrtps_avx(auVar29);
      auVar349 = vrcpps_avx(local_8a0);
      auVar175 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
      fVar276 = auVar175._28_4_;
      fVar192 = auVar349._0_4_;
      fVar184 = auVar349._4_4_;
      auVar60._4_4_ = local_8a0._4_4_ * fVar184;
      auVar60._0_4_ = (float)local_8a0._0_4_ * fVar192;
      fVar185 = auVar349._8_4_;
      auVar60._8_4_ = local_8a0._8_4_ * fVar185;
      fVar187 = auVar349._12_4_;
      auVar60._12_4_ = local_8a0._12_4_ * fVar187;
      fVar188 = auVar349._16_4_;
      auVar60._16_4_ = local_8a0._16_4_ * fVar188;
      fVar190 = auVar349._20_4_;
      auVar60._20_4_ = local_8a0._20_4_ * fVar190;
      fVar297 = auVar349._24_4_;
      auVar60._24_4_ = local_8a0._24_4_ * fVar297;
      auVar60._28_4_ = local_420._28_4_;
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar121,auVar60);
      fVar192 = fVar192 + fVar192 * auVar29._0_4_;
      fVar184 = fVar184 + fVar184 * auVar29._4_4_;
      fVar185 = fVar185 + fVar185 * auVar29._8_4_;
      fVar187 = fVar187 + fVar187 * auVar29._12_4_;
      fVar188 = fVar188 + fVar188 * auVar29._16_4_;
      fVar190 = fVar190 + fVar190 * auVar29._20_4_;
      fVar297 = fVar297 + fVar297 * auVar29._24_4_;
      auVar214 = vsubps_avx(local_420,auVar260);
      fVar298 = auVar214._0_4_ * fVar192;
      fVar310 = auVar214._4_4_ * fVar184;
      auVar61._4_4_ = fVar310;
      auVar61._0_4_ = fVar298;
      fVar311 = auVar214._8_4_ * fVar185;
      auVar61._8_4_ = fVar311;
      fVar312 = auVar214._12_4_ * fVar187;
      auVar61._12_4_ = fVar312;
      fVar313 = auVar214._16_4_ * fVar188;
      auVar61._16_4_ = fVar313;
      fVar314 = auVar214._20_4_ * fVar190;
      auVar61._20_4_ = fVar314;
      fVar315 = auVar214._24_4_ * fVar297;
      auVar61._24_4_ = fVar315;
      auVar61._28_4_ = auVar214._28_4_;
      auVar260 = vsubps_avx(auVar260,local_400);
      fVar192 = auVar260._0_4_ * fVar192;
      fVar184 = auVar260._4_4_ * fVar184;
      auVar62._4_4_ = fVar184;
      auVar62._0_4_ = fVar192;
      fVar185 = auVar260._8_4_ * fVar185;
      auVar62._8_4_ = fVar185;
      fVar187 = auVar260._12_4_ * fVar187;
      auVar62._12_4_ = fVar187;
      fVar188 = auVar260._16_4_ * fVar188;
      auVar62._16_4_ = fVar188;
      fVar190 = auVar260._20_4_ * fVar190;
      auVar62._20_4_ = fVar190;
      fVar297 = auVar260._24_4_ * fVar297;
      auVar62._24_4_ = fVar297;
      auVar62._28_4_ = auVar260._28_4_;
      fStack_3a4 = fStack_684 + auVar349._28_4_ + auVar29._28_4_;
      local_3c0 = local_4e0 * ((float)local_6a0._0_4_ + local_500 * fVar298);
      fStack_3bc = fStack_4dc * ((float)local_6a0._4_4_ + fStack_4fc * fVar310);
      fStack_3b8 = fStack_4d8 * (fStack_698 + fStack_4f8 * fVar311);
      fStack_3b4 = fStack_4d4 * (fStack_694 + fStack_4f4 * fVar312);
      fStack_3b0 = fStack_4d0 * (fStack_690 + fStack_4f0 * fVar313);
      fStack_3ac = fStack_4cc * (fStack_68c + fStack_4ec * fVar314);
      fStack_3a8 = fStack_4c8 * (fStack_688 + fStack_4e8 * fVar315);
      local_3a0 = local_4e0 * ((float)local_6a0._0_4_ + local_500 * fVar192);
      fStack_39c = fStack_4dc * ((float)local_6a0._4_4_ + fStack_4fc * fVar184);
      fStack_398 = fStack_4d8 * (fStack_698 + fStack_4f8 * fVar185);
      fStack_394 = fStack_4d4 * (fStack_694 + fStack_4f4 * fVar187);
      fStack_390 = fStack_4d0 * (fStack_690 + fStack_4f0 * fVar188);
      fStack_38c = fStack_4cc * (fStack_68c + fStack_4ec * fVar190);
      fStack_388 = fStack_4c8 * (fStack_688 + fStack_4e8 * fVar297);
      fStack_384 = fStack_684 + fStack_3a4;
      auVar287._8_4_ = 0x7f800000;
      auVar287._0_8_ = 0x7f8000007f800000;
      auVar287._12_4_ = 0x7f800000;
      auVar287._16_4_ = 0x7f800000;
      auVar287._20_4_ = 0x7f800000;
      auVar287._24_4_ = 0x7f800000;
      auVar287._28_4_ = 0x7f800000;
      auVar339 = vblendvps_avx(auVar287,auVar61,auVar175);
      auVar288._8_4_ = 0xff800000;
      auVar288._0_8_ = 0xff800000ff800000;
      auVar288._12_4_ = 0xff800000;
      auVar288._16_4_ = 0xff800000;
      auVar288._20_4_ = 0xff800000;
      auVar288._24_4_ = 0xff800000;
      auVar288._28_4_ = 0xff800000;
      auVar414 = vblendvps_avx(auVar288,auVar62,auVar175);
      auVar29 = vmaxps_avx(local_4c0,local_360);
      auVar63._4_4_ = auVar29._4_4_ * 1.9073486e-06;
      auVar63._0_4_ = auVar29._0_4_ * 1.9073486e-06;
      auVar63._8_4_ = auVar29._8_4_ * 1.9073486e-06;
      auVar63._12_4_ = auVar29._12_4_ * 1.9073486e-06;
      auVar63._16_4_ = auVar29._16_4_ * 1.9073486e-06;
      auVar63._20_4_ = auVar29._20_4_ * 1.9073486e-06;
      auVar63._24_4_ = auVar29._24_4_ * 1.9073486e-06;
      auVar63._28_4_ = auVar29._28_4_;
      auVar29 = vcmpps_avx(local_3e0,auVar63,1);
      auVar349 = auVar175 & auVar29;
      if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar349 >> 0x7f,0) != '\0') ||
            (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar349 >> 0xbf,0) != '\0') ||
          (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar349[0x1f] < '\0') {
        auVar116 = vandps_avx(auVar29,auVar175);
        auVar200 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
        auVar29 = vcmpps_avx(auVar147,_DAT_01f7b000,2);
        auVar381._8_4_ = 0xff800000;
        auVar381._0_8_ = 0xff800000ff800000;
        auVar381._12_4_ = 0xff800000;
        auVar381._16_4_ = 0xff800000;
        auVar381._20_4_ = 0xff800000;
        auVar381._24_4_ = 0xff800000;
        auVar381._28_4_ = 0xff800000;
        auVar367._8_4_ = 0x7f800000;
        auVar367._0_8_ = 0x7f8000007f800000;
        auVar367._12_4_ = 0x7f800000;
        auVar367._16_4_ = 0x7f800000;
        auVar367._20_4_ = 0x7f800000;
        auVar367._24_4_ = 0x7f800000;
        auVar367._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar367,auVar381,auVar29);
        auVar280 = vpmovsxwd_avx(auVar200);
        auVar200 = vpunpckhwd_avx(auVar200,auVar200);
        auVar264._16_16_ = auVar200;
        auVar264._0_16_ = auVar280;
        auVar339 = vblendvps_avx(auVar339,auVar147,auVar264);
        auVar147 = vblendvps_avx(auVar381,auVar367,auVar29);
        auVar414 = vblendvps_avx(auVar414,auVar147,auVar264);
        auVar182._0_8_ = auVar116._0_8_ ^ 0xffffffffffffffff;
        auVar182._8_4_ = auVar116._8_4_ ^ 0xffffffff;
        auVar182._12_4_ = auVar116._12_4_ ^ 0xffffffff;
        auVar182._16_4_ = auVar116._16_4_ ^ 0xffffffff;
        auVar182._20_4_ = auVar116._20_4_ ^ 0xffffffff;
        auVar182._24_4_ = auVar116._24_4_ ^ 0xffffffff;
        auVar182._28_4_ = auVar116._28_4_ ^ 0xffffffff;
        auVar116 = vorps_avx(auVar29,auVar182);
        auVar116 = vandps_avx(auVar175,auVar116);
      }
    }
    auVar309 = ZEXT3264(local_420);
    auVar147 = local_480 & auVar116;
    auVar290 = ZEXT3264(local_880);
    local_8c0._0_8_ = uVar92;
    auVar337 = local_900;
    auVar344 = local_920;
    auVar308 = local_960;
    auVar323 = local_980;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      auVar382 = ZEXT3264(local_940);
    }
    else {
      fStack_4c4 = auVar27._28_4_ + auVar213._28_4_;
      auVar200 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7e0._0_4_));
      auVar200 = vshufps_avx(auVar200,auVar200,0);
      auVar258._16_16_ = auVar200;
      auVar258._0_16_ = auVar200;
      auVar175 = vmaxps_avx(auVar258,auVar339);
      auVar200 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7e0._0_4_));
      auVar200 = vshufps_avx(auVar200,auVar200,0);
      auVar259._16_16_ = auVar200;
      auVar259._0_16_ = auVar200;
      auVar29 = vminps_avx(auVar259,auVar414);
      fVar276 = local_400._28_4_ + fVar276;
      auVar122._0_4_ = local_460 * fVar359 + local_720 * fVar340 + local_740 * fVar375;
      auVar122._4_4_ = fStack_45c * fVar369 + fStack_71c * fVar353 + fStack_73c * fVar383;
      auVar122._8_4_ = fStack_458 * fVar370 + fStack_718 * fVar354 + fStack_738 * fVar385;
      auVar122._12_4_ = fStack_454 * fVar371 + fStack_714 * fVar355 + fStack_734 * fVar387;
      auVar122._16_4_ = fStack_450 * fVar372 + fStack_710 * fVar356 + fStack_730 * fVar389;
      auVar122._20_4_ = fStack_44c * fVar373 + fStack_70c * fVar357 + fStack_72c * fVar391;
      auVar122._24_4_ = fStack_448 * fVar374 + fStack_708 * fVar358 + fStack_728 * fVar393;
      auVar122._28_4_ = fVar276 + fVar276 + fVar395;
      auVar147 = vrcpps_avx(auVar122);
      fVar192 = auVar147._0_4_;
      fVar184 = auVar147._4_4_;
      auVar64._4_4_ = auVar122._4_4_ * fVar184;
      auVar64._0_4_ = auVar122._0_4_ * fVar192;
      fVar185 = auVar147._8_4_;
      auVar64._8_4_ = auVar122._8_4_ * fVar185;
      fVar187 = auVar147._12_4_;
      auVar64._12_4_ = auVar122._12_4_ * fVar187;
      fVar188 = auVar147._16_4_;
      auVar64._16_4_ = auVar122._16_4_ * fVar188;
      fVar190 = auVar147._20_4_;
      auVar64._20_4_ = auVar122._20_4_ * fVar190;
      fVar297 = auVar147._24_4_;
      auVar64._24_4_ = auVar122._24_4_ * fVar297;
      auVar64._28_4_ = auVar364._28_4_;
      auVar400._8_4_ = 0x3f800000;
      auVar400._0_8_ = 0x3f8000003f800000;
      auVar400._12_4_ = 0x3f800000;
      auVar400._16_4_ = 0x3f800000;
      auVar400._20_4_ = 0x3f800000;
      auVar400._24_4_ = 0x3f800000;
      auVar400._28_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar400,auVar64);
      auVar304._8_4_ = 0x7fffffff;
      auVar304._0_8_ = 0x7fffffff7fffffff;
      auVar304._12_4_ = 0x7fffffff;
      auVar304._16_4_ = 0x7fffffff;
      auVar304._20_4_ = 0x7fffffff;
      auVar304._24_4_ = 0x7fffffff;
      auVar304._28_4_ = 0x7fffffff;
      auVar147 = vandps_avx(auVar122,auVar304);
      auVar347._8_4_ = 0x219392ef;
      auVar347._0_8_ = 0x219392ef219392ef;
      auVar347._12_4_ = 0x219392ef;
      auVar347._16_4_ = 0x219392ef;
      auVar347._20_4_ = 0x219392ef;
      auVar347._24_4_ = 0x219392ef;
      auVar347._28_4_ = 0x219392ef;
      auVar147 = vcmpps_avx(auVar147,auVar347,1);
      auVar65._4_4_ =
           (fVar184 + fVar184 * auVar27._4_4_) *
           -(fVar220 * fVar369 + fVar353 * fVar325 + fVar383 * fVar404);
      auVar65._0_4_ =
           (fVar192 + fVar192 * auVar27._0_4_) *
           -(fVar218 * fVar359 + fVar340 * fVar316 + fVar375 * fVar396);
      auVar65._8_4_ =
           (fVar185 + fVar185 * auVar27._8_4_) *
           -(fVar191 * fVar370 + fVar354 * fVar326 + fVar385 * fVar405);
      auVar65._12_4_ =
           (fVar187 + fVar187 * auVar27._12_4_) *
           -(fVar247 * fVar371 + fVar355 * fVar327 + fVar387 * fVar406);
      auVar65._16_4_ =
           (fVar188 + fVar188 * auVar27._16_4_) *
           -(fVar266 * fVar372 + fVar356 * fVar328 + fVar389 * fVar407);
      auVar65._20_4_ =
           (fVar190 + fVar190 * auVar27._20_4_) *
           -(fVar274 * fVar373 + fVar357 * fVar329 + fVar391 * fVar408);
      auVar65._24_4_ =
           (fVar297 + fVar297 * auVar27._24_4_) *
           -(fVar273 * fVar374 + fVar358 * fVar330 + fVar393 * fVar409);
      auVar65._28_4_ = -(fStack_4e4 + fVar276);
      auVar87 = ZEXT812(0);
      auVar27 = vcmpps_avx(auVar122,ZEXT1232(auVar87) << 0x20,1);
      auVar349 = vorps_avx(auVar147,auVar27);
      auVar27 = vcmpps_avx(auVar122,ZEXT1232(auVar87) << 0x20,6);
      auVar27 = vorps_avx(auVar147,auVar27);
      auVar322._8_4_ = 0xff800000;
      auVar322._0_8_ = 0xff800000ff800000;
      auVar322._12_4_ = 0xff800000;
      auVar322._16_4_ = 0xff800000;
      auVar322._20_4_ = 0xff800000;
      auVar322._24_4_ = 0xff800000;
      auVar322._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar65,auVar322,auVar349);
      auVar366._8_4_ = 0x7f800000;
      auVar366._0_8_ = 0x7f8000007f800000;
      auVar366._12_4_ = 0x7f800000;
      auVar366._16_4_ = 0x7f800000;
      auVar366._20_4_ = 0x7f800000;
      auVar366._24_4_ = 0x7f800000;
      auVar366._28_4_ = 0x7f800000;
      auVar27 = vblendvps_avx(auVar65,auVar366,auVar27);
      auVar175 = vmaxps_avx(auVar175,auVar147);
      auVar29 = vminps_avx(auVar29,auVar27);
      auVar348 = ZEXT1232(auVar87) << 0x20;
      auVar147 = vsubps_avx(auVar348,local_aa0);
      auVar27 = vsubps_avx(auVar348,_local_a00);
      auVar66._4_4_ = auVar27._4_4_ * -fVar291;
      auVar66._0_4_ = auVar27._0_4_ * -fVar277;
      auVar66._8_4_ = auVar27._8_4_ * -fVar292;
      auVar66._12_4_ = auVar27._12_4_ * -fVar293;
      auVar66._16_4_ = auVar27._16_4_ * -fVar294;
      auVar66._20_4_ = auVar27._20_4_ * -fVar295;
      auVar66._24_4_ = auVar27._24_4_ * -fVar296;
      auVar66._28_4_ = auVar27._28_4_;
      auVar67._4_4_ = fVar410 * auVar147._4_4_;
      auVar67._0_4_ = fVar416 * auVar147._0_4_;
      auVar67._8_4_ = fVar158 * auVar147._8_4_;
      auVar67._12_4_ = fVar161 * auVar147._12_4_;
      auVar67._16_4_ = fVar162 * auVar147._16_4_;
      auVar67._20_4_ = fVar163 * auVar147._20_4_;
      auVar67._24_4_ = fVar164 * auVar147._24_4_;
      auVar67._28_4_ = auVar147._28_4_;
      auVar147 = vsubps_avx(auVar66,auVar67);
      auVar27 = vsubps_avx(auVar348,local_8e0);
      auVar68._4_4_ = fVar384 * auVar27._4_4_;
      auVar68._0_4_ = fVar376 * auVar27._0_4_;
      auVar68._8_4_ = fVar386 * auVar27._8_4_;
      auVar68._12_4_ = fVar388 * auVar27._12_4_;
      auVar68._16_4_ = fVar390 * auVar27._16_4_;
      auVar68._20_4_ = fVar392 * auVar27._20_4_;
      uVar98 = auVar27._28_4_;
      auVar68._24_4_ = fVar394 * auVar27._24_4_;
      auVar68._28_4_ = uVar98;
      auVar349 = vsubps_avx(auVar147,auVar68);
      auVar69._4_4_ = fStack_73c * -fVar291;
      auVar69._0_4_ = local_740 * -fVar277;
      auVar69._8_4_ = fStack_738 * -fVar292;
      auVar69._12_4_ = fStack_734 * -fVar293;
      auVar69._16_4_ = fStack_730 * -fVar294;
      auVar69._20_4_ = fStack_72c * -fVar295;
      auVar69._24_4_ = fStack_728 * -fVar296;
      auVar69._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar401._8_4_ = 0x3f800000;
      auVar401._0_8_ = 0x3f8000003f800000;
      auVar401._12_4_ = 0x3f800000;
      auVar401._16_4_ = 0x3f800000;
      auVar401._20_4_ = 0x3f800000;
      auVar401._24_4_ = 0x3f800000;
      auVar401._28_4_ = 0x3f800000;
      auVar70._4_4_ = fStack_71c * fVar410;
      auVar70._0_4_ = local_720 * fVar416;
      auVar70._8_4_ = fStack_718 * fVar158;
      auVar70._12_4_ = fStack_714 * fVar161;
      auVar70._16_4_ = fStack_710 * fVar162;
      auVar70._20_4_ = fStack_70c * fVar163;
      auVar70._24_4_ = fStack_708 * fVar164;
      auVar70._28_4_ = uVar98;
      auVar147 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = fStack_45c * fVar384;
      auVar71._0_4_ = local_460 * fVar376;
      auVar71._8_4_ = fStack_458 * fVar386;
      auVar71._12_4_ = fStack_454 * fVar388;
      auVar71._16_4_ = fStack_450 * fVar390;
      auVar71._20_4_ = fStack_44c * fVar392;
      auVar71._24_4_ = fStack_448 * fVar394;
      auVar71._28_4_ = uVar98;
      auVar260 = vsubps_avx(auVar147,auVar71);
      auVar147 = vrcpps_avx(auVar260);
      fVar192 = auVar147._0_4_;
      fVar218 = auVar147._4_4_;
      auVar72._4_4_ = auVar260._4_4_ * fVar218;
      auVar72._0_4_ = auVar260._0_4_ * fVar192;
      fVar220 = auVar147._8_4_;
      auVar72._8_4_ = auVar260._8_4_ * fVar220;
      fVar191 = auVar147._12_4_;
      auVar72._12_4_ = auVar260._12_4_ * fVar191;
      fVar247 = auVar147._16_4_;
      auVar72._16_4_ = auVar260._16_4_ * fVar247;
      fVar266 = auVar147._20_4_;
      auVar72._20_4_ = auVar260._20_4_ * fVar266;
      fVar274 = auVar147._24_4_;
      auVar72._24_4_ = auVar260._24_4_ * fVar274;
      auVar72._28_4_ = local_ae0._28_4_;
      auVar214 = vsubps_avx(auVar401,auVar72);
      auVar147 = vandps_avx(auVar260,auVar304);
      auVar305._8_4_ = 0x219392ef;
      auVar305._0_8_ = 0x219392ef219392ef;
      auVar305._12_4_ = 0x219392ef;
      auVar305._16_4_ = 0x219392ef;
      auVar305._20_4_ = 0x219392ef;
      auVar305._24_4_ = 0x219392ef;
      auVar305._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar147,auVar305,1);
      auVar73._4_4_ = (fVar218 + fVar218 * auVar214._4_4_) * -auVar349._4_4_;
      auVar73._0_4_ = (fVar192 + fVar192 * auVar214._0_4_) * -auVar349._0_4_;
      auVar73._8_4_ = (fVar220 + fVar220 * auVar214._8_4_) * -auVar349._8_4_;
      auVar73._12_4_ = (fVar191 + fVar191 * auVar214._12_4_) * -auVar349._12_4_;
      auVar73._16_4_ = (fVar247 + fVar247 * auVar214._16_4_) * -auVar349._16_4_;
      auVar73._20_4_ = (fVar266 + fVar266 * auVar214._20_4_) * -auVar349._20_4_;
      auVar73._24_4_ = (fVar274 + fVar274 * auVar214._24_4_) * -auVar349._24_4_;
      auVar73._28_4_ = auVar349._28_4_ ^ 0x80000000;
      auVar147 = vcmpps_avx(auVar260,auVar348,1);
      auVar147 = vorps_avx(auVar27,auVar147);
      auVar147 = vblendvps_avx(auVar73,auVar322,auVar147);
      local_680 = vmaxps_avx(auVar175,auVar147);
      auVar349 = ZEXT1232(auVar87) << 0x20;
      auVar147 = vcmpps_avx(auVar260,auVar349,6);
      auVar147 = vorps_avx(auVar27,auVar147);
      auVar147 = vblendvps_avx(auVar73,auVar366,auVar147);
      auVar116 = vandps_avx(auVar116,local_480);
      local_560 = vminps_avx(auVar29,auVar147);
      auVar27 = vcmpps_avx(local_680,local_560,2);
      auVar175 = auVar116 & auVar27;
      auVar147 = local_680;
      if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar175 >> 0x7f,0) != '\0') ||
            (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar175 >> 0xbf,0) != '\0') ||
          (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar175[0x1f] < '\0') {
        auVar147 = vminps_avx(local_700,_local_7a0);
        auVar28 = vminps_avx(auVar28,_local_780);
        auVar147 = vminps_avx(auVar147,auVar28);
        auVar28 = vsubps_avx(auVar147,local_7c0);
        auVar116 = vandps_avx(auVar27,auVar116);
        auVar88._4_4_ = fStack_3bc;
        auVar88._0_4_ = local_3c0;
        auVar88._8_4_ = fStack_3b8;
        auVar88._12_4_ = fStack_3b4;
        auVar88._16_4_ = fStack_3b0;
        auVar88._20_4_ = fStack_3ac;
        auVar88._24_4_ = fStack_3a8;
        auVar88._28_4_ = fStack_3a4;
        auVar147 = vminps_avx(auVar88,auVar401);
        auVar175 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar147 = vmaxps_avx(auVar147,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar183 + fVar415 * (auVar147._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar186 + fVar156 * (auVar147._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar189 + fVar157 * (auVar147._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar411 + fVar160 * (auVar147._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar183 + fVar415 * (auVar147._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar186 + fVar156 * (auVar147._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar189 + fVar157 * (auVar147._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar411 + auVar147._28_4_ + 7.0;
        auVar89._4_4_ = fStack_39c;
        auVar89._0_4_ = local_3a0;
        auVar89._8_4_ = fStack_398;
        auVar89._12_4_ = fStack_394;
        auVar89._16_4_ = fStack_390;
        auVar89._20_4_ = fStack_38c;
        auVar89._24_4_ = fStack_388;
        auVar89._28_4_ = fStack_384;
        auVar147 = vminps_avx(auVar89,auVar401);
        auVar147 = vmaxps_avx(auVar147,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar183 + fVar415 * (auVar147._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar186 + fVar156 * (auVar147._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar189 + fVar157 * (auVar147._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar411 + fVar160 * (auVar147._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar183 + fVar415 * (auVar147._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar186 + fVar156 * (auVar147._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar189 + fVar157 * (auVar147._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar411 + auVar147._28_4_ + 7.0;
        auVar74._4_4_ = auVar28._4_4_ * 0.99999976;
        auVar74._0_4_ = auVar28._0_4_ * 0.99999976;
        auVar74._8_4_ = auVar28._8_4_ * 0.99999976;
        auVar74._12_4_ = auVar28._12_4_ * 0.99999976;
        auVar74._16_4_ = auVar28._16_4_ * 0.99999976;
        auVar74._20_4_ = auVar28._20_4_ * 0.99999976;
        auVar74._24_4_ = auVar28._24_4_ * 0.99999976;
        auVar74._28_4_ = 0x3f7ffffc;
        auVar147 = vmaxps_avx(auVar349,auVar74);
        auVar75._4_4_ = auVar147._4_4_ * auVar147._4_4_;
        auVar75._0_4_ = auVar147._0_4_ * auVar147._0_4_;
        auVar75._8_4_ = auVar147._8_4_ * auVar147._8_4_;
        auVar75._12_4_ = auVar147._12_4_ * auVar147._12_4_;
        auVar75._16_4_ = auVar147._16_4_ * auVar147._16_4_;
        auVar75._20_4_ = auVar147._20_4_ * auVar147._20_4_;
        auVar75._24_4_ = auVar147._24_4_ * auVar147._24_4_;
        auVar75._28_4_ = auVar147._28_4_;
        auVar28 = vsubps_avx(local_8c0,auVar75);
        auVar76._4_4_ = auVar28._4_4_ * (float)local_5e0._4_4_;
        auVar76._0_4_ = auVar28._0_4_ * (float)local_5e0._0_4_;
        auVar76._8_4_ = auVar28._8_4_ * fStack_5d8;
        auVar76._12_4_ = auVar28._12_4_ * fStack_5d4;
        auVar76._16_4_ = auVar28._16_4_ * fStack_5d0;
        auVar76._20_4_ = auVar28._20_4_ * fStack_5cc;
        auVar76._24_4_ = auVar28._24_4_ * fStack_5c8;
        auVar76._28_4_ = auVar147._28_4_;
        auVar147 = vsubps_avx(local_5c0,auVar76);
        auVar27 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,5);
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0x7f,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0xbf,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar27[0x1f]) {
          auVar283 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar260 = ZEXT832(0) << 0x20;
          auVar214 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar234 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar331 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar306._8_4_ = 0x7f800000;
          auVar306._0_8_ = 0x7f8000007f800000;
          auVar306._12_4_ = 0x7f800000;
          auVar306._16_4_ = 0x7f800000;
          auVar306._20_4_ = 0x7f800000;
          auVar306._24_4_ = 0x7f800000;
          auVar306._28_4_ = 0x7f800000;
          auVar350._8_4_ = 0xff800000;
          auVar350._0_8_ = 0xff800000ff800000;
          auVar350._12_4_ = 0xff800000;
          auVar350._16_4_ = 0xff800000;
          auVar350._20_4_ = 0xff800000;
          auVar350._24_4_ = 0xff800000;
          auVar350._28_4_ = 0xff800000;
        }
        else {
          local_800 = auVar28;
          local_ac0 = auVar27;
          auVar175 = vrcpps_avx(local_8a0);
          fVar192 = auVar175._0_4_;
          fVar218 = auVar175._4_4_;
          auVar77._4_4_ = local_8a0._4_4_ * fVar218;
          auVar77._0_4_ = (float)local_8a0._0_4_ * fVar192;
          fVar220 = auVar175._8_4_;
          auVar77._8_4_ = local_8a0._8_4_ * fVar220;
          fVar191 = auVar175._12_4_;
          auVar77._12_4_ = local_8a0._12_4_ * fVar191;
          fVar247 = auVar175._16_4_;
          auVar77._16_4_ = local_8a0._16_4_ * fVar247;
          fVar266 = auVar175._20_4_;
          auVar77._20_4_ = local_8a0._20_4_ * fVar266;
          fVar274 = auVar175._24_4_;
          auVar77._24_4_ = local_8a0._24_4_ * fVar274;
          auVar77._28_4_ = local_1e0._28_4_;
          auVar260 = vsubps_avx(auVar401,auVar77);
          auVar29 = vsqrtps_avx(auVar147);
          fVar192 = fVar192 + fVar192 * auVar260._0_4_;
          fVar218 = fVar218 + fVar218 * auVar260._4_4_;
          fVar220 = fVar220 + fVar220 * auVar260._8_4_;
          fVar191 = fVar191 + fVar191 * auVar260._12_4_;
          fVar247 = fVar247 + fVar247 * auVar260._16_4_;
          fVar266 = fVar266 + fVar266 * auVar260._20_4_;
          fVar274 = fVar274 + fVar274 * auVar260._24_4_;
          auVar214 = vsubps_avx(local_420,auVar29);
          fVar411 = auVar214._0_4_ * fVar192;
          fVar293 = auVar214._4_4_ * fVar218;
          auVar78._4_4_ = fVar293;
          auVar78._0_4_ = fVar411;
          fVar294 = auVar214._8_4_ * fVar220;
          auVar78._8_4_ = fVar294;
          fVar295 = auVar214._12_4_ * fVar191;
          auVar78._12_4_ = fVar295;
          fVar296 = auVar214._16_4_ * fVar247;
          auVar78._16_4_ = fVar296;
          fVar415 = auVar214._20_4_ * fVar266;
          auVar78._20_4_ = fVar415;
          fVar416 = auVar214._24_4_ * fVar274;
          auVar78._24_4_ = fVar416;
          auVar78._28_4_ = fStack_704;
          auVar214 = vsubps_avx(auVar29,local_400);
          fVar192 = auVar214._0_4_ * fVar192;
          fVar218 = auVar214._4_4_ * fVar218;
          auVar79._4_4_ = fVar218;
          auVar79._0_4_ = fVar192;
          fVar220 = auVar214._8_4_ * fVar220;
          auVar79._8_4_ = fVar220;
          fVar191 = auVar214._12_4_ * fVar191;
          auVar79._12_4_ = fVar191;
          fVar247 = auVar214._16_4_ * fVar247;
          auVar79._16_4_ = fVar247;
          fVar266 = auVar214._20_4_ * fVar266;
          auVar79._20_4_ = fVar266;
          fVar274 = auVar214._24_4_ * fVar274;
          auVar79._24_4_ = fVar274;
          auVar79._28_4_ = 0x3f800000;
          fVar273 = (fVar411 * local_500 + (float)local_6a0._0_4_) * local_4e0;
          fVar183 = (fVar293 * fStack_4fc + (float)local_6a0._4_4_) * fStack_4dc;
          fVar277 = (fVar294 * fStack_4f8 + fStack_698) * fStack_4d8;
          fVar186 = (fVar295 * fStack_4f4 + fStack_694) * fStack_4d4;
          fVar291 = (fVar296 * fStack_4f0 + fStack_690) * fStack_4d0;
          fVar189 = (fVar415 * fStack_4ec + fStack_68c) * fStack_4cc;
          fVar292 = (fVar416 * fStack_4e8 + fStack_688) * fStack_4c8;
          auVar215._0_4_ = auVar420._0_4_ + fVar102 * fVar273;
          auVar215._4_4_ = auVar420._4_4_ + fVar103 * fVar183;
          auVar215._8_4_ = auVar420._8_4_ + fVar223 * fVar277;
          auVar215._12_4_ = auVar420._12_4_ + fVar246 * fVar186;
          auVar215._16_4_ = auVar420._16_4_ + fVar265 * fVar291;
          auVar215._20_4_ = auVar420._20_4_ + fVar272 * fVar189;
          auVar215._24_4_ = auVar420._24_4_ + fVar271 * fVar292;
          auVar215._28_4_ = auVar420._28_4_ + auVar214._28_4_;
          auVar80._4_4_ = fStack_45c * fVar293;
          auVar80._0_4_ = local_460 * fVar411;
          auVar80._8_4_ = fStack_458 * fVar294;
          auVar80._12_4_ = fStack_454 * fVar295;
          auVar80._16_4_ = fStack_450 * fVar296;
          auVar80._20_4_ = fStack_44c * fVar415;
          auVar80._24_4_ = fStack_448 * fVar416;
          auVar80._28_4_ = auVar29._28_4_;
          auVar214 = vsubps_avx(auVar80,auVar215);
          _local_b00 = auVar214;
          auVar239._0_4_ = local_620._0_4_ + fVar101 * fVar273;
          auVar239._4_4_ = local_620._4_4_ + fVar129 * fVar183;
          auVar239._8_4_ = local_620._8_4_ + fVar221 * fVar277;
          auVar239._12_4_ = local_620._12_4_ + fVar244 * fVar186;
          auVar239._16_4_ = local_620._16_4_ + fVar248 * fVar291;
          auVar239._20_4_ = local_620._20_4_ + fVar268 * fVar189;
          auVar239._24_4_ = local_620._24_4_ + fVar267 * fVar292;
          auVar239._28_4_ = local_620._28_4_ + auVar29._28_4_;
          auVar81._4_4_ = fVar293 * fStack_71c;
          auVar81._0_4_ = fVar411 * local_720;
          auVar81._8_4_ = fVar294 * fStack_718;
          auVar81._12_4_ = fVar295 * fStack_714;
          auVar81._16_4_ = fVar296 * fStack_710;
          auVar81._20_4_ = fVar415 * fStack_70c;
          auVar81._24_4_ = fVar416 * fStack_708;
          auVar81._28_4_ = 0x3e000000;
          local_aa0 = vsubps_avx(auVar81,auVar239);
          auVar176._0_4_ = local_600._0_4_ + fVar217 * fVar273;
          auVar176._4_4_ = local_600._4_4_ + fVar219 * fVar183;
          auVar176._8_4_ = local_600._8_4_ + fVar222 * fVar277;
          auVar176._12_4_ = local_600._12_4_ + fVar245 * fVar186;
          auVar176._16_4_ = local_600._16_4_ + fVar249 * fVar291;
          auVar176._20_4_ = local_600._20_4_ + fVar270 * fVar189;
          auVar176._24_4_ = local_600._24_4_ + fVar269 * fVar292;
          auVar176._28_4_ = local_600._28_4_ + auVar175._28_4_ + auVar260._28_4_ + fStack_684;
          auVar82._4_4_ = fStack_73c * fVar293;
          auVar82._0_4_ = local_740 * fVar411;
          auVar82._8_4_ = fStack_738 * fVar294;
          auVar82._12_4_ = fStack_734 * fVar295;
          auVar82._16_4_ = fStack_730 * fVar296;
          auVar82._20_4_ = fStack_72c * fVar415;
          auVar82._24_4_ = fStack_728 * fVar416;
          auVar82._28_4_ = 0x3e000000;
          _local_a00 = vsubps_avx(auVar82,auVar176);
          fVar273 = (fVar192 * local_500 + (float)local_6a0._0_4_) * local_4e0;
          fVar183 = (fVar218 * fStack_4fc + (float)local_6a0._4_4_) * fStack_4dc;
          fVar277 = (fVar220 * fStack_4f8 + fStack_698) * fStack_4d8;
          fVar186 = (fVar191 * fStack_4f4 + fStack_694) * fStack_4d4;
          fVar291 = (fVar247 * fStack_4f0 + fStack_690) * fStack_4d0;
          fVar189 = (fVar266 * fStack_4ec + fStack_68c) * fStack_4cc;
          fVar292 = (fVar274 * fStack_4e8 + fStack_688) * fStack_4c8;
          auVar177._0_4_ = auVar420._0_4_ + fVar102 * fVar273;
          auVar177._4_4_ = auVar420._4_4_ + fVar103 * fVar183;
          auVar177._8_4_ = auVar420._8_4_ + fVar223 * fVar277;
          auVar177._12_4_ = auVar420._12_4_ + fVar246 * fVar186;
          auVar177._16_4_ = auVar420._16_4_ + fVar265 * fVar291;
          auVar177._20_4_ = auVar420._20_4_ + fVar272 * fVar189;
          auVar177._24_4_ = auVar420._24_4_ + fVar271 * fVar292;
          auVar177._28_4_ = auVar420._28_4_ + local_a00._28_4_ + fStack_684;
          auVar83._4_4_ = fStack_45c * fVar218;
          auVar83._0_4_ = local_460 * fVar192;
          auVar83._8_4_ = fStack_458 * fVar220;
          auVar83._12_4_ = fStack_454 * fVar191;
          auVar83._16_4_ = fStack_450 * fVar247;
          auVar83._20_4_ = fStack_44c * fVar266;
          auVar83._24_4_ = fStack_448 * fVar274;
          auVar83._28_4_ = fVar275;
          auVar175 = vsubps_avx(auVar83,auVar177);
          auVar289._0_4_ = local_620._0_4_ + fVar101 * fVar273;
          auVar289._4_4_ = local_620._4_4_ + fVar129 * fVar183;
          auVar289._8_4_ = local_620._8_4_ + fVar221 * fVar277;
          auVar289._12_4_ = local_620._12_4_ + fVar244 * fVar186;
          auVar289._16_4_ = local_620._16_4_ + fVar248 * fVar291;
          auVar289._20_4_ = local_620._20_4_ + fVar268 * fVar189;
          auVar289._24_4_ = local_620._24_4_ + fVar267 * fVar292;
          auVar289._28_4_ = local_620._28_4_ + fVar275;
          auVar84._4_4_ = fVar218 * fStack_71c;
          auVar84._0_4_ = fVar192 * local_720;
          auVar84._8_4_ = fVar220 * fStack_718;
          auVar84._12_4_ = fVar191 * fStack_714;
          auVar84._16_4_ = fVar247 * fStack_710;
          auVar84._20_4_ = fVar266 * fStack_70c;
          auVar84._24_4_ = fVar274 * fStack_708;
          auVar84._28_4_ = fStack_704;
          auVar29 = vsubps_avx(auVar84,auVar289);
          auVar283 = auVar29._0_28_;
          auVar261._0_4_ = local_600._0_4_ + fVar217 * fVar273;
          auVar261._4_4_ = local_600._4_4_ + fVar219 * fVar183;
          auVar261._8_4_ = local_600._8_4_ + fVar222 * fVar277;
          auVar261._12_4_ = local_600._12_4_ + fVar245 * fVar186;
          auVar261._16_4_ = local_600._16_4_ + fVar249 * fVar291;
          auVar261._20_4_ = local_600._20_4_ + fVar270 * fVar189;
          auVar261._24_4_ = local_600._24_4_ + fVar269 * fVar292;
          auVar261._28_4_ = local_600._28_4_ + 0.125;
          auVar85._4_4_ = fStack_73c * fVar218;
          auVar85._0_4_ = local_740 * fVar192;
          auVar85._8_4_ = fStack_738 * fVar220;
          auVar85._12_4_ = fStack_734 * fVar191;
          auVar85._16_4_ = fStack_730 * fVar247;
          auVar85._20_4_ = fStack_72c * fVar266;
          auVar85._24_4_ = fStack_728 * fVar274;
          auVar85._28_4_ = fStack_704;
          auVar260 = vsubps_avx(auVar85,auVar261);
          auVar147 = vcmpps_avx(auVar147,auVar349,5);
          auVar307._8_4_ = 0x7f800000;
          auVar307._0_8_ = 0x7f8000007f800000;
          auVar307._12_4_ = 0x7f800000;
          auVar307._16_4_ = 0x7f800000;
          auVar307._20_4_ = 0x7f800000;
          auVar307._24_4_ = 0x7f800000;
          auVar307._28_4_ = 0x7f800000;
          auVar306 = vblendvps_avx(auVar307,auVar78,auVar147);
          auVar29 = vmaxps_avx(local_4c0,local_360);
          auVar86._4_4_ = auVar29._4_4_ * 1.9073486e-06;
          auVar86._0_4_ = auVar29._0_4_ * 1.9073486e-06;
          auVar86._8_4_ = auVar29._8_4_ * 1.9073486e-06;
          auVar86._12_4_ = auVar29._12_4_ * 1.9073486e-06;
          auVar86._16_4_ = auVar29._16_4_ * 1.9073486e-06;
          auVar86._20_4_ = auVar29._20_4_ * 1.9073486e-06;
          auVar86._24_4_ = auVar29._24_4_ * 1.9073486e-06;
          auVar86._28_4_ = auVar29._28_4_;
          auVar29 = vcmpps_avx(local_3e0,auVar86,1);
          auVar351._8_4_ = 0xff800000;
          auVar351._0_8_ = 0xff800000ff800000;
          auVar351._12_4_ = 0xff800000;
          auVar351._16_4_ = 0xff800000;
          auVar351._20_4_ = 0xff800000;
          auVar351._24_4_ = 0xff800000;
          auVar351._28_4_ = 0xff800000;
          auVar350 = vblendvps_avx(auVar351,auVar79,auVar147);
          auVar349 = auVar147 & auVar29;
          if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar349 >> 0x7f,0) != '\0') ||
                (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar349 >> 0xbf,0) != '\0') ||
              (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar349[0x1f] < '\0') {
            auVar27 = vandps_avx(auVar29,auVar147);
            auVar200 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
            auVar29 = vcmpps_avx(auVar28,_DAT_01f7b000,2);
            auVar216._8_4_ = 0xff800000;
            auVar216._0_8_ = 0xff800000ff800000;
            auVar216._12_4_ = 0xff800000;
            auVar216._16_4_ = 0xff800000;
            auVar216._20_4_ = 0xff800000;
            auVar216._24_4_ = 0xff800000;
            auVar216._28_4_ = 0xff800000;
            auVar243._8_4_ = 0x7f800000;
            auVar243._0_8_ = 0x7f8000007f800000;
            auVar243._12_4_ = 0x7f800000;
            auVar243._16_4_ = 0x7f800000;
            auVar243._20_4_ = 0x7f800000;
            auVar243._24_4_ = 0x7f800000;
            auVar243._28_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar243,auVar216,auVar29);
            auVar280 = vpmovsxwd_avx(auVar200);
            auVar200 = vpunpckhwd_avx(auVar200,auVar200);
            auVar402._16_16_ = auVar200;
            auVar402._0_16_ = auVar280;
            auVar306 = vblendvps_avx(auVar306,auVar28,auVar402);
            auVar28 = vblendvps_avx(auVar216,auVar243,auVar29);
            auVar350 = vblendvps_avx(auVar350,auVar28,auVar402);
            auVar155._0_8_ = auVar27._0_8_ ^ 0xffffffffffffffff;
            auVar155._8_4_ = auVar27._8_4_ ^ 0xffffffff;
            auVar155._12_4_ = auVar27._12_4_ ^ 0xffffffff;
            auVar155._16_4_ = auVar27._16_4_ ^ 0xffffffff;
            auVar155._20_4_ = auVar27._20_4_ ^ 0xffffffff;
            auVar155._24_4_ = auVar27._24_4_ ^ 0xffffffff;
            auVar155._28_4_ = auVar27._28_4_ ^ 0xffffffff;
            auVar27 = vorps_avx(auVar29,auVar155);
            auVar27 = vandps_avx(auVar147,auVar27);
          }
          auVar234 = local_aa0._0_28_;
          auVar331 = local_a00._0_28_;
        }
        fVar192 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar101 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar217 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_540 = local_680;
        local_520 = vminps_avx(local_560,auVar306);
        _local_580 = vmaxps_avx(local_680,auVar350);
        auVar147 = vcmpps_avx(local_680,local_520,2);
        auVar147 = vandps_avx(auVar116,auVar147);
        auVar28 = vcmpps_avx(_local_580,local_560,2);
        local_7c0 = vandps_avx(auVar116,auVar28);
        auVar116 = vorps_avx(local_7c0,auVar147);
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0x7f,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0xbf,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar116[0x1f] < '\0') {
          _local_780 = _local_580;
          auVar125._0_4_ =
               fVar192 * auVar175._0_4_ + fVar101 * auVar283._0_4_ + fVar217 * auVar260._0_4_;
          auVar125._4_4_ =
               fVar192 * auVar175._4_4_ + fVar101 * auVar283._4_4_ + fVar217 * auVar260._4_4_;
          auVar125._8_4_ =
               fVar192 * auVar175._8_4_ + fVar101 * auVar283._8_4_ + fVar217 * auVar260._8_4_;
          auVar125._12_4_ =
               fVar192 * auVar175._12_4_ + fVar101 * auVar283._12_4_ + fVar217 * auVar260._12_4_;
          auVar125._16_4_ =
               fVar192 * auVar175._16_4_ + fVar101 * auVar283._16_4_ + fVar217 * auVar260._16_4_;
          auVar125._20_4_ =
               fVar192 * auVar175._20_4_ + fVar101 * auVar283._20_4_ + fVar217 * auVar260._20_4_;
          auVar125._24_4_ =
               fVar192 * auVar175._24_4_ + fVar101 * auVar283._24_4_ + fVar217 * auVar260._24_4_;
          auVar125._28_4_ = auVar175._28_4_ + auVar260._28_4_ + auVar116._28_4_;
          auVar148._0_8_ = auVar27._0_8_ ^ 0xffffffffffffffff;
          auVar148._8_4_ = auVar27._8_4_ ^ 0xffffffff;
          auVar148._12_4_ = auVar27._12_4_ ^ 0xffffffff;
          auVar148._16_4_ = auVar27._16_4_ ^ 0xffffffff;
          auVar148._20_4_ = auVar27._20_4_ ^ 0xffffffff;
          auVar148._24_4_ = auVar27._24_4_ ^ 0xffffffff;
          auVar148._28_4_ = auVar27._28_4_ ^ 0xffffffff;
          auVar240._8_4_ = 0x7fffffff;
          auVar240._0_8_ = 0x7fffffff7fffffff;
          auVar240._12_4_ = 0x7fffffff;
          auVar240._16_4_ = 0x7fffffff;
          auVar240._20_4_ = 0x7fffffff;
          auVar240._24_4_ = 0x7fffffff;
          auVar240._28_4_ = 0x7fffffff;
          auVar116 = vandps_avx(auVar125,auVar240);
          auVar262._8_4_ = 0x3e99999a;
          auVar262._0_8_ = 0x3e99999a3e99999a;
          auVar262._12_4_ = 0x3e99999a;
          auVar262._16_4_ = 0x3e99999a;
          auVar262._20_4_ = 0x3e99999a;
          auVar262._24_4_ = 0x3e99999a;
          auVar262._28_4_ = 0x3e99999a;
          auVar116 = vcmpps_avx(auVar116,auVar262,1);
          _local_6a0 = vorps_avx(auVar116,auVar148);
          auVar126._0_4_ =
               fVar192 * auVar214._0_4_ + fVar101 * auVar234._0_4_ + auVar331._0_4_ * fVar217;
          auVar126._4_4_ =
               fVar192 * auVar214._4_4_ + fVar101 * auVar234._4_4_ + auVar331._4_4_ * fVar217;
          auVar126._8_4_ =
               fVar192 * auVar214._8_4_ + fVar101 * auVar234._8_4_ + auVar331._8_4_ * fVar217;
          auVar126._12_4_ =
               fVar192 * auVar214._12_4_ + fVar101 * auVar234._12_4_ + auVar331._12_4_ * fVar217;
          auVar126._16_4_ =
               fVar192 * auVar214._16_4_ + fVar101 * auVar234._16_4_ + auVar331._16_4_ * fVar217;
          auVar126._20_4_ =
               fVar192 * auVar214._20_4_ + fVar101 * auVar234._20_4_ + auVar331._20_4_ * fVar217;
          auVar126._24_4_ =
               fVar192 * auVar214._24_4_ + fVar101 * auVar234._24_4_ + auVar331._24_4_ * fVar217;
          auVar126._28_4_ = auVar175._28_4_ + auVar214._28_4_ + local_6a0._28_4_;
          auVar116 = vandps_avx(auVar126,auVar240);
          auVar116 = vcmpps_avx(auVar116,auVar262,1);
          auVar116 = vorps_avx(auVar116,auVar148);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar116 = vblendvps_avx(auVar178,auVar149,auVar116);
          local_600 = ZEXT432(local_b8c);
          auVar280 = vpshufd_avx(ZEXT416(local_b8c),0);
          auVar200 = vpcmpgtd_avx(auVar116._16_16_,auVar280);
          local_620._0_16_ = auVar280;
          auVar280 = vpcmpgtd_avx(auVar116._0_16_,auVar280);
          auVar150._16_16_ = auVar200;
          auVar150._0_16_ = auVar280;
          _local_5e0 = vblendps_avx(ZEXT1632(auVar280),auVar150,0xf0);
          local_5c0 = auVar147;
          auVar116 = vandnps_avx(_local_5e0,auVar147);
          local_7a0._4_4_ = local_680._4_4_ + (float)local_660._4_4_;
          local_7a0._0_4_ = local_680._0_4_ + (float)local_660._0_4_;
          fStack_798 = local_680._8_4_ + fStack_658;
          fStack_794 = local_680._12_4_ + fStack_654;
          fStack_790 = local_680._16_4_ + fStack_650;
          fStack_78c = local_680._20_4_ + fStack_64c;
          fStack_788 = local_680._24_4_ + fStack_648;
          fStack_784 = local_680._28_4_ + fStack_644;
          local_ae0 = auVar39;
          local_820 = auVar114;
          while( true ) {
            local_440 = auVar116;
            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar116 >> 0x7f,0) == '\0') &&
                  (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar116 >> 0xbf,0) == '\0') &&
                (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar116[0x1f]) break;
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar151,local_680,auVar116);
            auVar27 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar27 = vminps_avx(auVar147,auVar27);
            auVar28 = vshufpd_avx(auVar27,auVar27,5);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar28 = vperm2f128_avx(auVar27,auVar27,1);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar147 = vcmpps_avx(auVar147,auVar27,0);
            auVar27 = auVar116 & auVar147;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar116 = vandps_avx(auVar147,auVar116);
            }
            uVar90 = vmovmskps_avx(auVar116);
            uVar96 = 0;
            if (uVar90 != 0) {
              for (; (uVar90 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
              }
            }
            uVar92 = (ulong)uVar96;
            *(undefined4 *)(local_440 + uVar92 * 4) = 0;
            aVar11 = (ray->super_RayK<1>).dir.field_0;
            _local_b00 = (undefined1  [16])aVar11;
            auVar200 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
            fVar192 = local_1a0[uVar92];
            uVar96 = *(uint *)(local_540 + uVar92 * 4);
            if (auVar200._0_4_ < 0.0) {
              fVar101 = sqrtf(auVar200._0_4_);
            }
            else {
              auVar200 = vsqrtss_avx(auVar200,auVar200);
              fVar101 = auVar200._0_4_;
            }
            auVar280 = vminps_avx(_local_9c0,_local_840);
            auVar200 = vmaxps_avx(_local_9c0,_local_840);
            auVar30 = vminps_avx(_local_9e0,_local_860);
            auVar108 = vminps_avx(auVar280,auVar30);
            auVar280 = vmaxps_avx(_local_9e0,_local_860);
            auVar30 = vmaxps_avx(auVar200,auVar280);
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar200 = vandps_avx(auVar108,auVar195);
            auVar280 = vandps_avx(auVar30,auVar195);
            auVar200 = vmaxps_avx(auVar200,auVar280);
            auVar280 = vmovshdup_avx(auVar200);
            auVar280 = vmaxss_avx(auVar280,auVar200);
            auVar200 = vshufpd_avx(auVar200,auVar200,1);
            auVar200 = vmaxss_avx(auVar200,auVar280);
            local_aa0._0_4_ = auVar200._0_4_ * 1.9073486e-06;
            local_8e0._0_4_ = fVar101 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar30,auVar30,0xff);
            auVar200 = vinsertps_avx(ZEXT416(uVar96),ZEXT416((uint)fVar192),0x10);
            auVar290 = ZEXT1664(auVar200);
            lVar99 = 5;
            do {
              do {
                bVar100 = lVar99 == 0;
                lVar99 = lVar99 + -1;
                if (bVar100) goto LAB_00a98d76;
                auVar280 = auVar290._0_16_;
                local_ac0._0_16_ = vmovshdup_avx(auVar280);
                fVar218 = 1.0 - local_ac0._0_4_;
                auVar200 = vshufps_avx(auVar280,auVar280,0x55);
                fVar192 = auVar200._0_4_;
                fVar101 = auVar200._4_4_;
                fVar217 = auVar200._8_4_;
                fVar102 = auVar200._12_4_;
                auVar200 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                fVar129 = auVar200._0_4_;
                fVar219 = auVar200._4_4_;
                fVar103 = auVar200._8_4_;
                fVar220 = auVar200._12_4_;
                fVar221 = (float)local_9e0._0_4_ * fVar192 + (float)local_840._0_4_ * fVar129;
                fVar222 = (float)local_9e0._4_4_ * fVar101 + (float)local_840._4_4_ * fVar219;
                fVar223 = fStack_9d8 * fVar217 + fStack_838 * fVar103;
                fVar191 = fStack_9d4 * fVar102 + fStack_834 * fVar220;
                auVar251._0_4_ =
                     fVar129 * ((float)local_840._0_4_ * fVar192 + fVar129 * (float)local_9c0._0_4_)
                     + fVar192 * fVar221;
                auVar251._4_4_ =
                     fVar219 * ((float)local_840._4_4_ * fVar101 + fVar219 * (float)local_9c0._4_4_)
                     + fVar101 * fVar222;
                auVar251._8_4_ =
                     fVar103 * (fStack_838 * fVar217 + fVar103 * fStack_9b8) + fVar217 * fVar223;
                auVar251._12_4_ =
                     fVar220 * (fStack_834 * fVar102 + fVar220 * fStack_9b4) + fVar102 * fVar191;
                auVar196._0_4_ =
                     fVar129 * fVar221 +
                     fVar192 * (fVar192 * (float)local_860._0_4_ + (float)local_9e0._0_4_ * fVar129)
                ;
                auVar196._4_4_ =
                     fVar219 * fVar222 +
                     fVar101 * (fVar101 * (float)local_860._4_4_ + (float)local_9e0._4_4_ * fVar219)
                ;
                auVar196._8_4_ =
                     fVar103 * fVar223 + fVar217 * (fVar217 * fStack_858 + fStack_9d8 * fVar103);
                auVar196._12_4_ =
                     fVar220 * fVar191 + fVar102 * (fVar102 * fStack_854 + fStack_9d4 * fVar220);
                auVar200 = vshufps_avx(auVar280,auVar280,0);
                auVar132._0_4_ = auVar200._0_4_ * (float)local_b00._0_4_ + 0.0;
                auVar132._4_4_ = auVar200._4_4_ * (float)local_b00._4_4_ + 0.0;
                auVar132._8_4_ = auVar200._8_4_ * fStack_af8 + 0.0;
                auVar132._12_4_ = auVar200._12_4_ * fStack_af4 + 0.0;
                auVar107._0_4_ = fVar129 * auVar251._0_4_ + fVar192 * auVar196._0_4_;
                auVar107._4_4_ = fVar219 * auVar251._4_4_ + fVar101 * auVar196._4_4_;
                auVar107._8_4_ = fVar103 * auVar251._8_4_ + fVar217 * auVar196._8_4_;
                auVar107._12_4_ = fVar220 * auVar251._12_4_ + fVar102 * auVar196._12_4_;
                local_800._0_16_ = auVar107;
                auVar200 = vsubps_avx(auVar132,auVar107);
                _local_a00 = auVar200;
                auVar200 = vdpps_avx(auVar200,auVar200,0x7f);
                fVar192 = auVar200._0_4_;
                if (fVar192 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar218);
                  local_ae0._0_16_ = auVar251;
                  local_a80._0_16_ = auVar196;
                  fVar101 = sqrtf(fVar192);
                  auVar290 = ZEXT1664(auVar280);
                  auVar196 = local_a80._0_16_;
                  auVar251 = local_ae0._0_16_;
                  fVar218 = (float)local_a60._0_4_;
                }
                else {
                  auVar30 = vsqrtss_avx(auVar200,auVar200);
                  fVar101 = auVar30._0_4_;
                }
                auVar30 = vsubps_avx(auVar196,auVar251);
                auVar300._0_4_ = auVar30._0_4_ * 3.0;
                auVar300._4_4_ = auVar30._4_4_ * 3.0;
                auVar300._8_4_ = auVar30._8_4_ * 3.0;
                auVar300._12_4_ = auVar30._12_4_ * 3.0;
                fVar217 = local_ac0._0_4_;
                auVar30 = vshufps_avx(ZEXT416((uint)(fVar217 * 6.0)),ZEXT416((uint)(fVar217 * 6.0)),
                                      0);
                auVar108 = ZEXT416((uint)((fVar218 - (fVar217 + fVar217)) * 6.0));
                auVar167 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = ZEXT416((uint)((fVar217 - (fVar218 + fVar218)) * 6.0));
                auVar197 = vshufps_avx(auVar108,auVar108,0);
                auVar31 = vshufps_avx(ZEXT416((uint)(fVar218 * 6.0)),ZEXT416((uint)(fVar218 * 6.0)),
                                      0);
                auVar108 = vdpps_avx(auVar300,auVar300,0x7f);
                auVar133._0_4_ =
                     auVar31._0_4_ * (float)local_9c0._0_4_ +
                     auVar197._0_4_ * (float)local_840._0_4_ +
                     auVar30._0_4_ * (float)local_860._0_4_ +
                     auVar167._0_4_ * (float)local_9e0._0_4_;
                auVar133._4_4_ =
                     auVar31._4_4_ * (float)local_9c0._4_4_ +
                     auVar197._4_4_ * (float)local_840._4_4_ +
                     auVar30._4_4_ * (float)local_860._4_4_ +
                     auVar167._4_4_ * (float)local_9e0._4_4_;
                auVar133._8_4_ =
                     auVar31._8_4_ * fStack_9b8 +
                     auVar197._8_4_ * fStack_838 +
                     auVar30._8_4_ * fStack_858 + auVar167._8_4_ * fStack_9d8;
                auVar133._12_4_ =
                     auVar31._12_4_ * fStack_9b4 +
                     auVar197._12_4_ * fStack_834 +
                     auVar30._12_4_ * fStack_854 + auVar167._12_4_ * fStack_9d4;
                auVar30 = vblendps_avx(auVar108,_DAT_01f45a50,0xe);
                auVar167 = vrsqrtss_avx(auVar30,auVar30);
                fVar102 = auVar167._0_4_;
                fVar217 = auVar108._0_4_;
                auVar167 = vdpps_avx(auVar300,auVar133,0x7f);
                auVar197 = vshufps_avx(auVar108,auVar108,0);
                auVar134._0_4_ = auVar133._0_4_ * auVar197._0_4_;
                auVar134._4_4_ = auVar133._4_4_ * auVar197._4_4_;
                auVar134._8_4_ = auVar133._8_4_ * auVar197._8_4_;
                auVar134._12_4_ = auVar133._12_4_ * auVar197._12_4_;
                auVar167 = vshufps_avx(auVar167,auVar167,0);
                auVar226._0_4_ = auVar300._0_4_ * auVar167._0_4_;
                auVar226._4_4_ = auVar300._4_4_ * auVar167._4_4_;
                auVar226._8_4_ = auVar300._8_4_ * auVar167._8_4_;
                auVar226._12_4_ = auVar300._12_4_ * auVar167._12_4_;
                auVar31 = vsubps_avx(auVar134,auVar226);
                auVar167 = vrcpss_avx(auVar30,auVar30);
                auVar30 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar290._0_4_ * (float)local_8e0._0_4_)));
                auVar167 = ZEXT416((uint)(auVar167._0_4_ * (2.0 - fVar217 * auVar167._0_4_)));
                auVar167 = vshufps_avx(auVar167,auVar167,0);
                uVar92 = CONCAT44(auVar300._4_4_,auVar300._0_4_);
                auVar252._0_8_ = uVar92 ^ 0x8000000080000000;
                auVar252._8_4_ = -auVar300._8_4_;
                auVar252._12_4_ = -auVar300._12_4_;
                auVar197 = ZEXT416((uint)(fVar102 * 1.5 +
                                         fVar217 * -0.5 * fVar102 * fVar102 * fVar102));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar198._0_4_ = auVar197._0_4_ * auVar31._0_4_ * auVar167._0_4_;
                auVar198._4_4_ = auVar197._4_4_ * auVar31._4_4_ * auVar167._4_4_;
                auVar198._8_4_ = auVar197._8_4_ * auVar31._8_4_ * auVar167._8_4_;
                auVar198._12_4_ = auVar197._12_4_ * auVar31._12_4_ * auVar167._12_4_;
                auVar281._0_4_ = auVar300._0_4_ * auVar197._0_4_;
                auVar281._4_4_ = auVar300._4_4_ * auVar197._4_4_;
                auVar281._8_4_ = auVar300._8_4_ * auVar197._8_4_;
                auVar281._12_4_ = auVar300._12_4_ * auVar197._12_4_;
                local_ac0._0_16_ = auVar300;
                local_a60._0_4_ = auVar30._0_4_;
                if (fVar217 < 0.0) {
                  local_ae0._0_4_ = fVar101;
                  local_a80._0_16_ = auVar252;
                  local_820._0_16_ = auVar281;
                  local_9a0._0_16_ = auVar198;
                  fVar102 = sqrtf(fVar217);
                  auVar198 = local_9a0._0_16_;
                  auVar252 = local_a80._0_16_;
                  auVar281 = local_820._0_16_;
                  fVar101 = (float)local_ae0._0_4_;
                  fVar217 = (float)local_a60._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar102 = auVar108._0_4_;
                  fVar217 = auVar30._0_4_;
                }
                auVar30 = vdpps_avx(_local_a00,auVar281,0x7f);
                fVar101 = ((float)local_aa0._0_4_ / fVar102) * (fVar101 + 1.0) +
                          fVar217 + fVar101 * (float)local_aa0._0_4_;
                auVar108 = vdpps_avx(auVar252,auVar281,0x7f);
                auVar167 = vdpps_avx(_local_a00,auVar198,0x7f);
                auVar197 = vdpps_avx(_local_b00,auVar281,0x7f);
                auVar31 = vdpps_avx(_local_a00,auVar252,0x7f);
                fVar102 = auVar108._0_4_ + auVar167._0_4_;
                fVar218 = auVar30._0_4_;
                auVar109._0_4_ = fVar218 * fVar218;
                auVar109._4_4_ = auVar30._4_4_ * auVar30._4_4_;
                auVar109._8_4_ = auVar30._8_4_ * auVar30._8_4_;
                auVar109._12_4_ = auVar30._12_4_ * auVar30._12_4_;
                auVar167 = vsubps_avx(auVar200,auVar109);
                auVar108 = vdpps_avx(_local_a00,_local_b00,0x7f);
                fVar129 = auVar31._0_4_ - fVar218 * fVar102;
                fVar219 = auVar108._0_4_ - fVar218 * auVar197._0_4_;
                auVar108 = vrsqrtss_avx(auVar167,auVar167);
                fVar103 = auVar167._0_4_;
                fVar218 = auVar108._0_4_;
                fVar218 = fVar218 * 1.5 + fVar103 * -0.5 * fVar218 * fVar218 * fVar218;
                if (fVar103 < 0.0) {
                  local_ae0._0_16_ = auVar30;
                  local_a80._0_4_ = fVar101;
                  local_820._0_16_ = auVar197;
                  local_9a0._0_16_ = ZEXT416((uint)fVar102);
                  local_8a0._0_4_ = fVar129;
                  local_6c0._0_4_ = fVar219;
                  local_6e0._0_4_ = fVar218;
                  fVar103 = sqrtf(fVar103);
                  fVar101 = (float)local_a80._0_4_;
                  fVar218 = (float)local_6e0._0_4_;
                  fVar129 = (float)local_8a0._0_4_;
                  fVar219 = (float)local_6c0._0_4_;
                  auVar197 = local_820._0_16_;
                  auVar30 = local_ae0._0_16_;
                  auVar108 = local_9a0._0_16_;
                  fVar217 = (float)local_a60._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar167,auVar167);
                  fVar103 = auVar108._0_4_;
                  auVar108 = ZEXT416((uint)fVar102);
                }
                auVar31 = vpermilps_avx(local_800._0_16_,0xff);
                auVar113 = vshufps_avx(local_ac0._0_16_,local_ac0._0_16_,0xff);
                fVar102 = fVar129 * fVar218 - auVar113._0_4_;
                auVar227._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
                auVar227._8_4_ = auVar197._8_4_ ^ 0x80000000;
                auVar227._12_4_ = auVar197._12_4_ ^ 0x80000000;
                auVar253._0_4_ = -fVar102;
                auVar253._4_4_ = 0x80000000;
                auVar253._8_4_ = 0x80000000;
                auVar253._12_4_ = 0x80000000;
                auVar167 = vinsertps_avx(auVar253,ZEXT416((uint)(fVar219 * fVar218)),0x1c);
                auVar197 = vmovsldup_avx(ZEXT416((uint)(auVar108._0_4_ * fVar219 * fVar218 -
                                                       auVar197._0_4_ * fVar102)));
                auVar167 = vdivps_avx(auVar167,auVar197);
                auVar108 = vinsertps_avx(auVar108,auVar227,0x10);
                auVar108 = vdivps_avx(auVar108,auVar197);
                auVar197 = vmovsldup_avx(auVar30);
                auVar110 = ZEXT416((uint)(fVar103 - auVar31._0_4_));
                auVar31 = vmovsldup_avx(auVar110);
                auVar168._0_4_ = auVar197._0_4_ * auVar167._0_4_ + auVar31._0_4_ * auVar108._0_4_;
                auVar168._4_4_ = auVar197._4_4_ * auVar167._4_4_ + auVar31._4_4_ * auVar108._4_4_;
                auVar168._8_4_ = auVar197._8_4_ * auVar167._8_4_ + auVar31._8_4_ * auVar108._8_4_;
                auVar168._12_4_ =
                     auVar197._12_4_ * auVar167._12_4_ + auVar31._12_4_ * auVar108._12_4_;
                auVar108 = vsubps_avx(auVar280,auVar168);
                auVar290 = ZEXT1664(auVar108);
                auVar169._8_4_ = 0x7fffffff;
                auVar169._0_8_ = 0x7fffffff7fffffff;
                auVar169._12_4_ = 0x7fffffff;
                auVar280 = vandps_avx(auVar30,auVar169);
              } while (fVar101 <= auVar280._0_4_);
              auVar199._8_4_ = 0x7fffffff;
              auVar199._0_8_ = 0x7fffffff7fffffff;
              auVar199._12_4_ = 0x7fffffff;
              auVar280 = vandps_avx(auVar110,auVar199);
            } while ((float)local_700._0_4_ * 1.9073486e-06 + fVar217 + fVar101 <= auVar280._0_4_);
            fVar101 = auVar108._0_4_ + (float)local_7e0._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar101) &&
               (fVar217 = (ray->super_RayK<1>).tfar, fVar101 <= fVar217)) {
              auVar280 = vmovshdup_avx(auVar108);
              fVar102 = auVar280._0_4_;
              if ((0.0 <= fVar102) && (fVar102 <= 1.0)) {
                auVar200 = vrsqrtss_avx(auVar200,auVar200);
                fVar218 = auVar200._0_4_;
                pGVar21 = (context->scene->geometries).items[uVar95].ptr;
                if ((pGVar21->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar200 = ZEXT416((uint)(fVar218 * 1.5 +
                                           fVar192 * -0.5 * fVar218 * fVar218 * fVar218));
                  auVar200 = vshufps_avx(auVar200,auVar200,0);
                  auVar201._0_4_ = auVar200._0_4_ * (float)local_a00._0_4_;
                  auVar201._4_4_ = auVar200._4_4_ * (float)local_a00._4_4_;
                  auVar201._8_4_ = auVar200._8_4_ * fStack_9f8;
                  auVar201._12_4_ = auVar200._12_4_ * fStack_9f4;
                  auVar135._0_4_ = local_ac0._0_4_ + auVar113._0_4_ * auVar201._0_4_;
                  auVar135._4_4_ = local_ac0._4_4_ + auVar113._4_4_ * auVar201._4_4_;
                  auVar135._8_4_ = local_ac0._8_4_ + auVar113._8_4_ * auVar201._8_4_;
                  auVar135._12_4_ = local_ac0._12_4_ + auVar113._12_4_ * auVar201._12_4_;
                  auVar200 = vshufps_avx(auVar201,auVar201,0xc9);
                  auVar280 = vshufps_avx(local_ac0._0_16_,local_ac0._0_16_,0xc9);
                  auVar202._0_4_ = auVar280._0_4_ * auVar201._0_4_;
                  auVar202._4_4_ = auVar280._4_4_ * auVar201._4_4_;
                  auVar202._8_4_ = auVar280._8_4_ * auVar201._8_4_;
                  auVar202._12_4_ = auVar280._12_4_ * auVar201._12_4_;
                  auVar228._0_4_ = local_ac0._0_4_ * auVar200._0_4_;
                  auVar228._4_4_ = local_ac0._4_4_ * auVar200._4_4_;
                  auVar228._8_4_ = local_ac0._8_4_ * auVar200._8_4_;
                  auVar228._12_4_ = local_ac0._12_4_ * auVar200._12_4_;
                  auVar30 = vsubps_avx(auVar228,auVar202);
                  auVar200 = vshufps_avx(auVar30,auVar30,0xc9);
                  auVar280 = vshufps_avx(auVar135,auVar135,0xc9);
                  auVar229._0_4_ = auVar280._0_4_ * auVar200._0_4_;
                  auVar229._4_4_ = auVar280._4_4_ * auVar200._4_4_;
                  auVar229._8_4_ = auVar280._8_4_ * auVar200._8_4_;
                  auVar229._12_4_ = auVar280._12_4_ * auVar200._12_4_;
                  auVar200 = vshufps_avx(auVar30,auVar30,0xd2);
                  auVar136._0_4_ = auVar135._0_4_ * auVar200._0_4_;
                  auVar136._4_4_ = auVar135._4_4_ * auVar200._4_4_;
                  auVar136._8_4_ = auVar135._8_4_ * auVar200._8_4_;
                  auVar136._12_4_ = auVar135._12_4_ * auVar200._12_4_;
                  auVar280 = vsubps_avx(auVar229,auVar136);
                  auVar200 = vshufps_avx(auVar280,auVar280,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar101;
                    uVar8 = vmovlps_avx(auVar200);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                    (ray->Ng).field_0.field_0.z = auVar280._0_4_;
                    ray->u = fVar102;
                    ray->v = 0.0;
                    ray->primID = local_8c0._0_4_;
                    ray->geomID = uVar95;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_a30 = vmovlps_avx(auVar200);
                    local_a28 = auVar280._0_4_;
                    local_a24 = fVar102;
                    local_a20 = 0;
                    local_a1c = local_8c0._0_4_;
                    local_a18 = uVar95;
                    local_a14 = context->user->instID[0];
                    local_a10 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar101;
                    local_640._0_4_ = 0xffffffff;
                    local_b38.valid = (int *)local_640;
                    local_b38.geometryUserPtr = pGVar21->userPtr;
                    local_b38.context = context->user;
                    local_b38.hit = (RTCHitN *)&local_a30;
                    local_b38.N = 1;
                    local_b38.ray = (RTCRayN *)ray;
                    if ((pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar21->intersectionFilterN)(&local_b38), *local_b38.valid != 0)) {
                      p_Var26 = context->args->filter;
                      if ((p_Var26 == (RTCFilterFunctionN)0x0) ||
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT &&
                           (((pGVar21->field_8).field_0x2 & 0x40) == 0)) ||
                          ((*p_Var26)(&local_b38), *local_b38.valid != 0)))) {
                        (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).components[0] =
                             *(float *)local_b38.hit;
                        (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_b38.hit + 4);
                        (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_b38.hit + 8);
                        *(float *)((long)local_b38.ray + 0x3c) = *(float *)(local_b38.hit + 0xc);
                        *(float *)((long)local_b38.ray + 0x40) = *(float *)(local_b38.hit + 0x10);
                        *(float *)((long)local_b38.ray + 0x44) = *(float *)(local_b38.hit + 0x14);
                        *(float *)((long)local_b38.ray + 0x48) = *(float *)(local_b38.hit + 0x18);
                        *(float *)((long)local_b38.ray + 0x4c) = *(float *)(local_b38.hit + 0x1c);
                        *(float *)((long)local_b38.ray + 0x50) = *(float *)(local_b38.hit + 0x20);
                        goto LAB_00a98d76;
                      }
                    }
                    (ray->super_RayK<1>).tfar = fVar217;
                  }
                }
              }
            }
LAB_00a98d76:
            fVar192 = (ray->super_RayK<1>).tfar;
            auVar127._4_4_ = fVar192;
            auVar127._0_4_ = fVar192;
            auVar127._8_4_ = fVar192;
            auVar127._12_4_ = fVar192;
            auVar127._16_4_ = fVar192;
            auVar127._20_4_ = fVar192;
            auVar127._24_4_ = fVar192;
            auVar127._28_4_ = fVar192;
            auVar116 = vcmpps_avx(_local_7a0,auVar127,2);
            auVar116 = vandps_avx(auVar116,local_440);
          }
          auVar152._0_4_ = (float)local_660._0_4_ + (float)local_780._0_4_;
          auVar152._4_4_ = (float)local_660._4_4_ + (float)local_780._4_4_;
          auVar152._8_4_ = fStack_658 + fStack_778;
          auVar152._12_4_ = fStack_654 + fStack_774;
          auVar152._16_4_ = fStack_650 + fStack_770;
          auVar152._20_4_ = fStack_64c + fStack_76c;
          auVar152._24_4_ = fStack_648 + fStack_768;
          auVar152._28_4_ = fStack_644 + fStack_764;
          auVar116 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          fVar192 = (ray->super_RayK<1>).tfar;
          auVar179._4_4_ = fVar192;
          auVar179._0_4_ = fVar192;
          auVar179._8_4_ = fVar192;
          auVar179._12_4_ = fVar192;
          auVar179._16_4_ = fVar192;
          auVar179._20_4_ = fVar192;
          auVar179._24_4_ = fVar192;
          auVar179._28_4_ = fVar192;
          auVar147 = vcmpps_avx(auVar152,auVar179,2);
          _local_7a0 = vandps_avx(auVar147,local_7c0);
          auVar153._8_4_ = 3;
          auVar153._0_8_ = 0x300000003;
          auVar153._12_4_ = 3;
          auVar153._16_4_ = 3;
          auVar153._20_4_ = 3;
          auVar153._24_4_ = 3;
          auVar153._28_4_ = 3;
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar147 = vblendvps_avx(auVar180,auVar153,_local_6a0);
          auVar200 = vpcmpgtd_avx(auVar147._16_16_,local_620._0_16_);
          auVar280 = vpshufd_avx(local_600._0_16_,0);
          auVar280 = vpcmpgtd_avx(auVar147._0_16_,auVar280);
          auVar181._16_16_ = auVar200;
          auVar181._0_16_ = auVar116._0_16_;
          local_7c0 = vblendps_avx(ZEXT1632(auVar280),auVar181,0xf0);
          auVar147 = vandnps_avx(local_7c0,_local_7a0);
          local_680 = _local_580;
          local_780._4_4_ = (float)local_660._4_4_ + (float)local_580._4_4_;
          local_780._0_4_ = (float)local_660._0_4_ + (float)local_580._0_4_;
          fStack_778 = fStack_658 + fStack_578;
          fStack_774 = fStack_654 + fStack_574;
          fStack_770 = fStack_650 + fStack_570;
          fStack_76c = fStack_64c + fStack_56c;
          fStack_768 = fStack_648 + fStack_568;
          fStack_764 = fStack_644 + fStack_564;
          auVar352 = ZEXT3264(local_900);
          auVar368 = ZEXT3264(local_920);
          auVar382 = ZEXT3264(local_940);
          auVar309 = ZEXT3264(local_960);
          auVar324 = ZEXT3264(local_980);
          auVar290 = ZEXT3264(local_880);
          while( true ) {
            local_640 = auVar147;
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0x7f,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0xbf,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar147[0x1f]) break;
            auVar128._8_4_ = 0x7f800000;
            auVar128._0_8_ = 0x7f8000007f800000;
            auVar128._12_4_ = 0x7f800000;
            auVar128._16_4_ = 0x7f800000;
            auVar128._20_4_ = 0x7f800000;
            auVar128._24_4_ = 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar116 = vblendvps_avx(auVar128,local_680,auVar147);
            auVar27 = vshufps_avx(auVar116,auVar116,0xb1);
            auVar27 = vminps_avx(auVar116,auVar27);
            auVar28 = vshufpd_avx(auVar27,auVar27,5);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar28 = vperm2f128_avx(auVar27,auVar27,1);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar116 = vcmpps_avx(auVar116,auVar27,0);
            auVar27 = auVar147 & auVar116;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar116,auVar147);
            }
            uVar90 = vmovmskps_avx(auVar147);
            uVar96 = 0;
            if (uVar90 != 0) {
              for (; (uVar90 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
              }
            }
            uVar92 = (ulong)uVar96;
            *(undefined4 *)(local_640 + uVar92 * 4) = 0;
            aVar11 = (ray->super_RayK<1>).dir.field_0;
            _local_b00 = (undefined1  [16])aVar11;
            auVar200 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
            fVar192 = local_1c0[uVar92];
            uVar96 = *(uint *)(local_560 + uVar92 * 4);
            if (auVar200._0_4_ < 0.0) {
              fVar101 = sqrtf(auVar200._0_4_);
              auVar290 = ZEXT3264(local_880);
              auVar324 = ZEXT3264(local_980);
              auVar309 = ZEXT3264(local_960);
              auVar382 = ZEXT3264(local_940);
              auVar368 = ZEXT3264(local_920);
              auVar352 = ZEXT3264(local_900);
            }
            else {
              auVar200 = vsqrtss_avx(auVar200,auVar200);
              fVar101 = auVar200._0_4_;
            }
            auVar280 = vminps_avx(_local_9c0,_local_840);
            auVar200 = vmaxps_avx(_local_9c0,_local_840);
            auVar30 = vminps_avx(_local_9e0,_local_860);
            auVar108 = vminps_avx(auVar280,auVar30);
            auVar280 = vmaxps_avx(_local_9e0,_local_860);
            auVar30 = vmaxps_avx(auVar200,auVar280);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar200 = vandps_avx(auVar108,auVar203);
            auVar280 = vandps_avx(auVar30,auVar203);
            auVar200 = vmaxps_avx(auVar200,auVar280);
            auVar280 = vmovshdup_avx(auVar200);
            auVar280 = vmaxss_avx(auVar280,auVar200);
            auVar200 = vshufpd_avx(auVar200,auVar200,1);
            auVar200 = vmaxss_avx(auVar200,auVar280);
            local_aa0._0_4_ = auVar200._0_4_ * 1.9073486e-06;
            local_820._0_4_ = fVar101 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar30,auVar30,0xff);
            auVar200 = vinsertps_avx(ZEXT416(uVar96),ZEXT416((uint)fVar192),0x10);
            auVar403 = ZEXT1664(auVar200);
            lVar99 = 5;
            do {
              do {
                auVar200 = auVar403._0_16_;
                bVar100 = lVar99 == 0;
                lVar99 = lVar99 + -1;
                if (bVar100) goto LAB_00a997d3;
                local_ac0._0_16_ = vmovshdup_avx(auVar200);
                fVar218 = 1.0 - local_ac0._0_4_;
                auVar280 = vshufps_avx(auVar200,auVar200,0x55);
                fVar192 = auVar280._0_4_;
                fVar101 = auVar280._4_4_;
                fVar217 = auVar280._8_4_;
                fVar102 = auVar280._12_4_;
                auVar280 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                fVar129 = auVar280._0_4_;
                fVar219 = auVar280._4_4_;
                fVar103 = auVar280._8_4_;
                fVar220 = auVar280._12_4_;
                fVar221 = (float)local_9e0._0_4_ * fVar192 + (float)local_840._0_4_ * fVar129;
                fVar222 = (float)local_9e0._4_4_ * fVar101 + (float)local_840._4_4_ * fVar219;
                fVar223 = fStack_9d8 * fVar217 + fStack_838 * fVar103;
                fVar191 = fStack_9d4 * fVar102 + fStack_834 * fVar220;
                auVar254._0_4_ =
                     fVar129 * ((float)local_840._0_4_ * fVar192 + fVar129 * (float)local_9c0._0_4_)
                     + fVar192 * fVar221;
                auVar254._4_4_ =
                     fVar219 * ((float)local_840._4_4_ * fVar101 + fVar219 * (float)local_9c0._4_4_)
                     + fVar101 * fVar222;
                auVar254._8_4_ =
                     fVar103 * (fStack_838 * fVar217 + fVar103 * fStack_9b8) + fVar217 * fVar223;
                auVar254._12_4_ =
                     fVar220 * (fStack_834 * fVar102 + fVar220 * fStack_9b4) + fVar102 * fVar191;
                auVar204._0_4_ =
                     fVar129 * fVar221 +
                     fVar192 * (fVar192 * (float)local_860._0_4_ + (float)local_9e0._0_4_ * fVar129)
                ;
                auVar204._4_4_ =
                     fVar219 * fVar222 +
                     fVar101 * (fVar101 * (float)local_860._4_4_ + (float)local_9e0._4_4_ * fVar219)
                ;
                auVar204._8_4_ =
                     fVar103 * fVar223 + fVar217 * (fVar217 * fStack_858 + fStack_9d8 * fVar103);
                auVar204._12_4_ =
                     fVar220 * fVar191 + fVar102 * (fVar102 * fStack_854 + fStack_9d4 * fVar220);
                auVar280 = vshufps_avx(auVar200,auVar200,0);
                auVar137._0_4_ = auVar280._0_4_ * (float)local_b00._0_4_ + 0.0;
                auVar137._4_4_ = auVar280._4_4_ * (float)local_b00._4_4_ + 0.0;
                auVar137._8_4_ = auVar280._8_4_ * fStack_af8 + 0.0;
                auVar137._12_4_ = auVar280._12_4_ * fStack_af4 + 0.0;
                auVar111._0_4_ = fVar129 * auVar254._0_4_ + fVar192 * auVar204._0_4_;
                auVar111._4_4_ = fVar219 * auVar254._4_4_ + fVar101 * auVar204._4_4_;
                auVar111._8_4_ = fVar103 * auVar254._8_4_ + fVar217 * auVar204._8_4_;
                auVar111._12_4_ = fVar220 * auVar254._12_4_ + fVar102 * auVar204._12_4_;
                local_800._0_16_ = auVar111;
                auVar280 = vsubps_avx(auVar137,auVar111);
                _local_a00 = auVar280;
                auVar280 = vdpps_avx(auVar280,auVar280,0x7f);
                fVar192 = auVar280._0_4_;
                if (fVar192 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar218);
                  local_8e0._0_16_ = auVar254;
                  local_ae0._0_16_ = auVar204;
                  fVar101 = sqrtf(fVar192);
                  auVar204 = local_ae0._0_16_;
                  auVar254 = local_8e0._0_16_;
                  fVar218 = (float)local_a60._0_4_;
                }
                else {
                  auVar30 = vsqrtss_avx(auVar280,auVar280);
                  fVar101 = auVar30._0_4_;
                }
                auVar30 = vsubps_avx(auVar204,auVar254);
                auVar282._0_4_ = auVar30._0_4_ * 3.0;
                auVar282._4_4_ = auVar30._4_4_ * 3.0;
                auVar282._8_4_ = auVar30._8_4_ * 3.0;
                auVar282._12_4_ = auVar30._12_4_ * 3.0;
                fVar217 = local_ac0._0_4_;
                auVar30 = vshufps_avx(ZEXT416((uint)(fVar217 * 6.0)),ZEXT416((uint)(fVar217 * 6.0)),
                                      0);
                auVar108 = ZEXT416((uint)((fVar218 - (fVar217 + fVar217)) * 6.0));
                auVar167 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = ZEXT416((uint)((fVar217 - (fVar218 + fVar218)) * 6.0));
                auVar197 = vshufps_avx(auVar108,auVar108,0);
                auVar31 = vshufps_avx(ZEXT416((uint)(fVar218 * 6.0)),ZEXT416((uint)(fVar218 * 6.0)),
                                      0);
                auVar108 = vdpps_avx(auVar282,auVar282,0x7f);
                auVar138._0_4_ =
                     auVar31._0_4_ * (float)local_9c0._0_4_ +
                     auVar197._0_4_ * (float)local_840._0_4_ +
                     auVar30._0_4_ * (float)local_860._0_4_ +
                     auVar167._0_4_ * (float)local_9e0._0_4_;
                auVar138._4_4_ =
                     auVar31._4_4_ * (float)local_9c0._4_4_ +
                     auVar197._4_4_ * (float)local_840._4_4_ +
                     auVar30._4_4_ * (float)local_860._4_4_ +
                     auVar167._4_4_ * (float)local_9e0._4_4_;
                auVar138._8_4_ =
                     auVar31._8_4_ * fStack_9b8 +
                     auVar197._8_4_ * fStack_838 +
                     auVar30._8_4_ * fStack_858 + auVar167._8_4_ * fStack_9d8;
                auVar138._12_4_ =
                     auVar31._12_4_ * fStack_9b4 +
                     auVar197._12_4_ * fStack_834 +
                     auVar30._12_4_ * fStack_854 + auVar167._12_4_ * fStack_9d4;
                auVar30 = vblendps_avx(auVar108,_DAT_01f45a50,0xe);
                auVar167 = vrsqrtss_avx(auVar30,auVar30);
                fVar102 = auVar167._0_4_;
                fVar217 = auVar108._0_4_;
                auVar167 = vdpps_avx(auVar282,auVar138,0x7f);
                auVar197 = vshufps_avx(auVar108,auVar108,0);
                auVar139._0_4_ = auVar138._0_4_ * auVar197._0_4_;
                auVar139._4_4_ = auVar138._4_4_ * auVar197._4_4_;
                auVar139._8_4_ = auVar138._8_4_ * auVar197._8_4_;
                auVar139._12_4_ = auVar138._12_4_ * auVar197._12_4_;
                auVar167 = vshufps_avx(auVar167,auVar167,0);
                auVar230._0_4_ = auVar282._0_4_ * auVar167._0_4_;
                auVar230._4_4_ = auVar282._4_4_ * auVar167._4_4_;
                auVar230._8_4_ = auVar282._8_4_ * auVar167._8_4_;
                auVar230._12_4_ = auVar282._12_4_ * auVar167._12_4_;
                auVar31 = vsubps_avx(auVar139,auVar230);
                auVar167 = vrcpss_avx(auVar30,auVar30);
                auVar30 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar403._0_4_ * (float)local_820._0_4_)));
                auVar167 = ZEXT416((uint)(auVar167._0_4_ * (2.0 - fVar217 * auVar167._0_4_)));
                auVar167 = vshufps_avx(auVar167,auVar167,0);
                uVar92 = CONCAT44(auVar282._4_4_,auVar282._0_4_);
                auVar317._0_8_ = uVar92 ^ 0x8000000080000000;
                auVar317._8_4_ = -auVar282._8_4_;
                auVar317._12_4_ = -auVar282._12_4_;
                auVar197 = ZEXT416((uint)(fVar102 * 1.5 +
                                         fVar217 * -0.5 * fVar102 * fVar102 * fVar102));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar205._0_4_ = auVar197._0_4_ * auVar31._0_4_ * auVar167._0_4_;
                auVar205._4_4_ = auVar197._4_4_ * auVar31._4_4_ * auVar167._4_4_;
                auVar205._8_4_ = auVar197._8_4_ * auVar31._8_4_ * auVar167._8_4_;
                auVar205._12_4_ = auVar197._12_4_ * auVar31._12_4_ * auVar167._12_4_;
                local_a80._0_4_ = auVar282._0_4_ * auVar197._0_4_;
                local_a80._4_4_ = auVar282._4_4_ * auVar197._4_4_;
                local_a80._8_4_ = auVar282._8_4_ * auVar197._8_4_;
                local_a80._12_4_ = auVar282._12_4_ * auVar197._12_4_;
                local_ac0._0_16_ = auVar282;
                local_a60._0_4_ = auVar30._0_4_;
                if (fVar217 < 0.0) {
                  local_8e0._0_4_ = fVar101;
                  local_ae0._0_16_ = auVar317;
                  local_9a0._0_16_ = auVar205;
                  fVar217 = sqrtf(fVar217);
                  auVar205 = local_9a0._0_16_;
                  auVar317 = local_ae0._0_16_;
                  fVar101 = (float)local_a60._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar217 = auVar108._0_4_;
                  local_8e0._0_4_ = fVar101;
                  fVar101 = auVar30._0_4_;
                }
                auVar30 = vdpps_avx(_local_a00,local_a80._0_16_,0x7f);
                local_ae0._0_4_ =
                     ((float)local_aa0._0_4_ / fVar217) * ((float)local_8e0._0_4_ + 1.0) +
                     (float)local_8e0._0_4_ * (float)local_aa0._0_4_ + fVar101;
                auVar108 = vdpps_avx(auVar317,local_a80._0_16_,0x7f);
                auVar167 = vdpps_avx(_local_a00,auVar205,0x7f);
                auVar197 = vdpps_avx(_local_b00,local_a80._0_16_,0x7f);
                auVar31 = vdpps_avx(_local_a00,auVar317,0x7f);
                fVar101 = auVar108._0_4_ + auVar167._0_4_;
                fVar217 = auVar30._0_4_;
                auVar112._0_4_ = fVar217 * fVar217;
                auVar112._4_4_ = auVar30._4_4_ * auVar30._4_4_;
                auVar112._8_4_ = auVar30._8_4_ * auVar30._8_4_;
                auVar112._12_4_ = auVar30._12_4_ * auVar30._12_4_;
                auVar167 = vsubps_avx(auVar280,auVar112);
                local_a80._0_16_ = ZEXT416((uint)fVar101);
                auVar108 = vdpps_avx(_local_a00,_local_b00,0x7f);
                fVar102 = auVar31._0_4_ - fVar217 * fVar101;
                local_8e0._0_16_ = auVar30;
                fVar217 = auVar108._0_4_ - fVar217 * auVar197._0_4_;
                auVar30 = vrsqrtss_avx(auVar167,auVar167);
                fVar218 = auVar167._0_4_;
                fVar101 = auVar30._0_4_;
                fVar101 = fVar101 * 1.5 + fVar218 * -0.5 * fVar101 * fVar101 * fVar101;
                if (fVar218 < 0.0) {
                  local_9a0._0_16_ = auVar197;
                  local_8a0._0_4_ = fVar102;
                  local_6c0._0_4_ = fVar217;
                  local_6e0._0_4_ = fVar101;
                  fVar218 = sqrtf(fVar218);
                  fVar101 = (float)local_6e0._0_4_;
                  fVar102 = (float)local_8a0._0_4_;
                  fVar217 = (float)local_6c0._0_4_;
                  auVar197 = local_9a0._0_16_;
                }
                else {
                  auVar30 = vsqrtss_avx(auVar167,auVar167);
                  fVar218 = auVar30._0_4_;
                }
                auVar352 = ZEXT3264(local_900);
                auVar368 = ZEXT3264(local_920);
                auVar382 = ZEXT3264(local_940);
                auVar309 = ZEXT3264(local_960);
                auVar324 = ZEXT3264(local_980);
                auVar113 = vpermilps_avx(local_800._0_16_,0xff);
                auVar31 = vshufps_avx(local_ac0._0_16_,local_ac0._0_16_,0xff);
                fVar102 = fVar102 * fVar101 - auVar31._0_4_;
                auVar231._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = auVar197._8_4_ ^ 0x80000000;
                auVar231._12_4_ = auVar197._12_4_ ^ 0x80000000;
                auVar255._0_4_ = -fVar102;
                auVar255._4_4_ = 0x80000000;
                auVar255._8_4_ = 0x80000000;
                auVar255._12_4_ = 0x80000000;
                auVar30 = vinsertps_avx(auVar255,ZEXT416((uint)(fVar217 * fVar101)),0x1c);
                auVar167 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar217 * fVar101 -
                                                       auVar197._0_4_ * fVar102)));
                auVar30 = vdivps_avx(auVar30,auVar167);
                auVar108 = vinsertps_avx(local_a80._0_16_,auVar231,0x10);
                auVar108 = vdivps_avx(auVar108,auVar167);
                auVar167 = vmovsldup_avx(local_8e0._0_16_);
                auVar113 = ZEXT416((uint)(fVar218 - auVar113._0_4_));
                auVar197 = vmovsldup_avx(auVar113);
                auVar170._0_4_ = auVar167._0_4_ * auVar30._0_4_ + auVar197._0_4_ * auVar108._0_4_;
                auVar170._4_4_ = auVar167._4_4_ * auVar30._4_4_ + auVar197._4_4_ * auVar108._4_4_;
                auVar170._8_4_ = auVar167._8_4_ * auVar30._8_4_ + auVar197._8_4_ * auVar108._8_4_;
                auVar170._12_4_ =
                     auVar167._12_4_ * auVar30._12_4_ + auVar197._12_4_ * auVar108._12_4_;
                auVar30 = vsubps_avx(auVar200,auVar170);
                auVar403 = ZEXT1664(auVar30);
                auVar171._8_4_ = 0x7fffffff;
                auVar171._0_8_ = 0x7fffffff7fffffff;
                auVar171._12_4_ = 0x7fffffff;
                auVar200 = vandps_avx(local_8e0._0_16_,auVar171);
                auVar290 = ZEXT3264(local_880);
              } while ((float)local_ae0._0_4_ <= auVar200._0_4_);
              auVar206._8_4_ = 0x7fffffff;
              auVar206._0_8_ = 0x7fffffff7fffffff;
              auVar206._12_4_ = 0x7fffffff;
              auVar200 = vandps_avx(auVar113,auVar206);
            } while ((float)local_700._0_4_ * 1.9073486e-06 +
                     (float)local_ae0._0_4_ + (float)local_a60._0_4_ <= auVar200._0_4_);
            fVar101 = auVar30._0_4_ + (float)local_7e0._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar101) &&
               (fVar217 = (ray->super_RayK<1>).tfar, fVar101 <= fVar217)) {
              auVar200 = vmovshdup_avx(auVar30);
              fVar102 = auVar200._0_4_;
              if ((0.0 <= fVar102) && (fVar102 <= 1.0)) {
                auVar200 = vrsqrtss_avx(auVar280,auVar280);
                fVar218 = auVar200._0_4_;
                pGVar21 = (context->scene->geometries).items[uVar95].ptr;
                if ((pGVar21->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar200 = ZEXT416((uint)(fVar218 * 1.5 +
                                           fVar192 * -0.5 * fVar218 * fVar218 * fVar218));
                  auVar200 = vshufps_avx(auVar200,auVar200,0);
                  auVar207._0_4_ = auVar200._0_4_ * (float)local_a00._0_4_;
                  auVar207._4_4_ = auVar200._4_4_ * (float)local_a00._4_4_;
                  auVar207._8_4_ = auVar200._8_4_ * fStack_9f8;
                  auVar207._12_4_ = auVar200._12_4_ * fStack_9f4;
                  auVar140._0_4_ = local_ac0._0_4_ + auVar31._0_4_ * auVar207._0_4_;
                  auVar140._4_4_ = local_ac0._4_4_ + auVar31._4_4_ * auVar207._4_4_;
                  auVar140._8_4_ = local_ac0._8_4_ + auVar31._8_4_ * auVar207._8_4_;
                  auVar140._12_4_ = local_ac0._12_4_ + auVar31._12_4_ * auVar207._12_4_;
                  auVar200 = vshufps_avx(auVar207,auVar207,0xc9);
                  auVar280 = vshufps_avx(local_ac0._0_16_,local_ac0._0_16_,0xc9);
                  auVar208._0_4_ = auVar280._0_4_ * auVar207._0_4_;
                  auVar208._4_4_ = auVar280._4_4_ * auVar207._4_4_;
                  auVar208._8_4_ = auVar280._8_4_ * auVar207._8_4_;
                  auVar208._12_4_ = auVar280._12_4_ * auVar207._12_4_;
                  auVar232._0_4_ = local_ac0._0_4_ * auVar200._0_4_;
                  auVar232._4_4_ = local_ac0._4_4_ * auVar200._4_4_;
                  auVar232._8_4_ = local_ac0._8_4_ * auVar200._8_4_;
                  auVar232._12_4_ = local_ac0._12_4_ * auVar200._12_4_;
                  auVar30 = vsubps_avx(auVar232,auVar208);
                  auVar200 = vshufps_avx(auVar30,auVar30,0xc9);
                  auVar280 = vshufps_avx(auVar140,auVar140,0xc9);
                  auVar233._0_4_ = auVar280._0_4_ * auVar200._0_4_;
                  auVar233._4_4_ = auVar280._4_4_ * auVar200._4_4_;
                  auVar233._8_4_ = auVar280._8_4_ * auVar200._8_4_;
                  auVar233._12_4_ = auVar280._12_4_ * auVar200._12_4_;
                  auVar200 = vshufps_avx(auVar30,auVar30,0xd2);
                  auVar141._0_4_ = auVar140._0_4_ * auVar200._0_4_;
                  auVar141._4_4_ = auVar140._4_4_ * auVar200._4_4_;
                  auVar141._8_4_ = auVar140._8_4_ * auVar200._8_4_;
                  auVar141._12_4_ = auVar140._12_4_ * auVar200._12_4_;
                  auVar280 = vsubps_avx(auVar233,auVar141);
                  auVar200 = vshufps_avx(auVar280,auVar280,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar101;
                    uVar8 = vmovlps_avx(auVar200);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                    (ray->Ng).field_0.field_0.z = auVar280._0_4_;
                    ray->u = fVar102;
                    ray->v = 0.0;
                    ray->primID = local_8c0._0_4_;
                    ray->geomID = uVar95;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_a30 = vmovlps_avx(auVar200);
                    local_a28 = auVar280._0_4_;
                    local_a24 = fVar102;
                    local_a20 = 0;
                    local_a1c = local_8c0._0_4_;
                    local_a18 = uVar95;
                    local_a14 = context->user->instID[0];
                    local_a10 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar101;
                    local_b04 = -1;
                    local_b38.valid = &local_b04;
                    local_b38.geometryUserPtr = pGVar21->userPtr;
                    local_b38.context = context->user;
                    local_b38.hit = (RTCHitN *)&local_a30;
                    local_b38.N = 1;
                    local_b38.ray = (RTCRayN *)ray;
                    if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a998fe:
                      p_Var26 = context->args->filter;
                      if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var26)(&local_b38);
                        auVar290 = ZEXT3264(local_880);
                        auVar324 = ZEXT3264(local_980);
                        auVar309 = ZEXT3264(local_960);
                        auVar382 = ZEXT3264(local_940);
                        auVar368 = ZEXT3264(local_920);
                        auVar352 = ZEXT3264(local_900);
                        if (*local_b38.valid == 0) goto LAB_00a999c5;
                      }
                      (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).components[0] =
                           *(float *)local_b38.hit;
                      (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_b38.hit + 4);
                      (((Vec3f *)((long)local_b38.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_b38.hit + 8);
                      *(float *)((long)local_b38.ray + 0x3c) = *(float *)(local_b38.hit + 0xc);
                      *(float *)((long)local_b38.ray + 0x40) = *(float *)(local_b38.hit + 0x10);
                      *(float *)((long)local_b38.ray + 0x44) = *(float *)(local_b38.hit + 0x14);
                      *(float *)((long)local_b38.ray + 0x48) = *(float *)(local_b38.hit + 0x18);
                      *(float *)((long)local_b38.ray + 0x4c) = *(float *)(local_b38.hit + 0x1c);
                      *(float *)((long)local_b38.ray + 0x50) = *(float *)(local_b38.hit + 0x20);
                    }
                    else {
                      (*pGVar21->intersectionFilterN)(&local_b38);
                      auVar290 = ZEXT3264(local_880);
                      auVar324 = ZEXT3264(local_980);
                      auVar309 = ZEXT3264(local_960);
                      auVar382 = ZEXT3264(local_940);
                      auVar368 = ZEXT3264(local_920);
                      auVar352 = ZEXT3264(local_900);
                      if (*local_b38.valid != 0) goto LAB_00a998fe;
LAB_00a999c5:
                      (ray->super_RayK<1>).tfar = fVar217;
                    }
                  }
                }
              }
            }
LAB_00a997d3:
            fVar192 = (ray->super_RayK<1>).tfar;
            auVar154._4_4_ = fVar192;
            auVar154._0_4_ = fVar192;
            auVar154._8_4_ = fVar192;
            auVar154._12_4_ = fVar192;
            auVar154._16_4_ = fVar192;
            auVar154._20_4_ = fVar192;
            auVar154._24_4_ = fVar192;
            auVar154._28_4_ = fVar192;
            auVar116 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
            auVar147 = vcmpps_avx(_local_780,auVar154,2);
            auVar147 = vandps_avx(auVar147,local_640);
          }
          auVar147 = vandps_avx(_local_5e0,local_5c0);
          auVar27 = vandps_avx(local_7c0,_local_7a0);
          auVar241._0_4_ = (float)local_660._0_4_ + local_540._0_4_;
          auVar241._4_4_ = (float)local_660._4_4_ + local_540._4_4_;
          auVar241._8_4_ = fStack_658 + local_540._8_4_;
          auVar241._12_4_ = fStack_654 + local_540._12_4_;
          auVar241._16_4_ = fStack_650 + local_540._16_4_;
          auVar241._20_4_ = fStack_64c + local_540._20_4_;
          auVar241._24_4_ = fStack_648 + local_540._24_4_;
          auVar241._28_4_ = fStack_644 + local_540._28_4_;
          auVar200 = vshufps_avx(auVar116._0_16_,auVar116._0_16_,0);
          auVar263._16_16_ = auVar200;
          auVar263._0_16_ = auVar200;
          auVar116 = vcmpps_avx(auVar241,auVar263,2);
          auVar116 = vandps_avx(auVar116,auVar147);
          auVar242._0_4_ = (float)local_660._0_4_ + local_580._0_4_;
          auVar242._4_4_ = (float)local_660._4_4_ + local_580._4_4_;
          auVar242._8_4_ = fStack_658 + local_580._8_4_;
          auVar242._12_4_ = fStack_654 + local_580._12_4_;
          auVar242._16_4_ = fStack_650 + local_580._16_4_;
          auVar242._20_4_ = fStack_64c + local_580._20_4_;
          auVar242._24_4_ = fStack_648 + local_580._24_4_;
          auVar242._28_4_ = fStack_644 + local_580._28_4_;
          auVar147 = vcmpps_avx(auVar242,auVar263,2);
          auVar147 = vandps_avx(auVar147,auVar27);
          auVar147 = vorps_avx(auVar116,auVar147);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            uVar93 = (ulong)uVar94;
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar147;
            auVar116 = vblendvps_avx(_local_580,local_540,auVar116);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar116;
            uVar92 = vmovlps_avx(local_590);
            (&uStack_140)[uVar93 * 0xc] = uVar92;
            auStack_138[uVar93 * 0x18] = local_b8c + 1;
            uVar94 = uVar94 + 1;
          }
          auVar337 = auVar352._0_32_;
          auVar344 = auVar368._0_32_;
          auVar308 = auVar309._0_32_;
          auVar323 = auVar324._0_32_;
          goto LAB_00a983e2;
        }
      }
      auVar309 = ZEXT3264(auVar147);
      auVar382 = ZEXT3264(local_940);
      auVar290 = ZEXT3264(local_880);
    }
LAB_00a983e2:
    auVar285 = local_4a0;
    fVar192 = (ray->super_RayK<1>).tfar;
    auVar123._4_4_ = fVar192;
    auVar123._0_4_ = fVar192;
    auVar123._8_4_ = fVar192;
    auVar123._12_4_ = fVar192;
    auVar123._16_4_ = fVar192;
    auVar123._20_4_ = fVar192;
    auVar123._24_4_ = fVar192;
    auVar123._28_4_ = fVar192;
    do {
      uVar96 = uVar94;
      if (uVar96 == 0) {
        auVar116 = vcmpps_avx(local_380,auVar123,2);
        uVar95 = vmovmskps_avx(auVar116);
        uVar91 = (ulong)((uint)uVar91 - 1 & (uint)uVar91 & uVar95);
        goto LAB_00a972e5;
      }
      uVar92 = (ulong)(uVar96 - 1);
      lVar99 = uVar92 * 0x60;
      auVar116 = *(undefined1 (*) [32])(auStack_160 + lVar99);
      auVar146._0_4_ = auVar116._0_4_ + (float)local_660._0_4_;
      auVar146._4_4_ = auVar116._4_4_ + (float)local_660._4_4_;
      auVar146._8_4_ = auVar116._8_4_ + fStack_658;
      auVar146._12_4_ = auVar116._12_4_ + fStack_654;
      auVar146._16_4_ = auVar116._16_4_ + fStack_650;
      auVar146._20_4_ = auVar116._20_4_ + fStack_64c;
      auVar146._24_4_ = auVar116._24_4_ + fStack_648;
      auVar146._28_4_ = auVar116._28_4_ + fStack_644;
      auVar27 = vcmpps_avx(auVar146,auVar123,2);
      auVar147 = vandps_avx(auVar27,*(undefined1 (*) [32])(auStack_180 + lVar99));
      local_540 = auVar147;
      auVar27 = *(undefined1 (*) [32])(auStack_180 + lVar99) & auVar27;
      uVar94 = uVar96 - 1;
    } while ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar27 >> 0x7f,0) == '\0') &&
               (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar27 >> 0xbf,0) == '\0') &&
             (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar27[0x1f]);
    auVar124._8_4_ = 0x7f800000;
    auVar124._0_8_ = 0x7f8000007f800000;
    auVar124._12_4_ = 0x7f800000;
    auVar124._16_4_ = 0x7f800000;
    auVar124._20_4_ = 0x7f800000;
    auVar124._24_4_ = 0x7f800000;
    auVar124._28_4_ = 0x7f800000;
    auVar116 = vblendvps_avx(auVar124,auVar116,auVar147);
    auVar27 = vshufps_avx(auVar116,auVar116,0xb1);
    auVar27 = vminps_avx(auVar116,auVar27);
    auVar28 = vshufpd_avx(auVar27,auVar27,5);
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar28 = vperm2f128_avx(auVar27,auVar27,1);
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar116 = vcmpps_avx(auVar116,auVar27,0);
    auVar27 = auVar147 & auVar116;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar147 = vandps_avx(auVar116,auVar147);
    }
    auVar106._8_8_ = 0;
    auVar106._0_8_ = (&uStack_140)[uVar92 * 0xc];
    local_b8c = auStack_138[uVar92 * 0x18];
    uVar94 = vmovmskps_avx(auVar147);
    uVar90 = 0;
    if (uVar94 != 0) {
      for (; (uVar94 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
      }
    }
    *(undefined4 *)(local_540 + (ulong)uVar90 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar99) = local_540;
    uVar94 = uVar96 - 1;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar94 = uVar96;
    }
    auVar200 = vshufps_avx(auVar106,auVar106,0);
    auVar280 = vshufps_avx(auVar106,auVar106,0x55);
    auVar280 = vsubps_avx(auVar280,auVar200);
    local_580._4_4_ = auVar200._4_4_ + auVar280._4_4_ * 0.14285715;
    local_580._0_4_ = auVar200._0_4_ + auVar280._0_4_ * 0.0;
    fStack_578 = auVar200._8_4_ + auVar280._8_4_ * 0.2857143;
    fStack_574 = auVar200._12_4_ + auVar280._12_4_ * 0.42857146;
    fStack_570 = auVar200._0_4_ + auVar280._0_4_ * 0.5714286;
    fStack_56c = auVar200._4_4_ + auVar280._4_4_ * 0.71428573;
    fStack_568 = auVar200._8_4_ + auVar280._8_4_ * 0.8571429;
    fStack_564 = auVar200._12_4_ + auVar280._12_4_;
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_580 + (ulong)uVar90 * 4);
    uVar92 = local_8c0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }